

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::VolPathIntegrator::Li
          (VolPathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurf)

{
  Vector3f *pVVar1;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  Interval IVar8;
  uint uVar12;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  TVar13;
  pointer pLVar14;
  uintptr_t uVar15;
  size_t sVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  ushort uVar88;
  LightSampleContext LVar89;
  LightSampleContext LVar90;
  LightSampleContext LVar91;
  LightSampleContext LVar92;
  Point3f p;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [24];
  undefined1 auVar107 [40];
  undefined1 auVar108 [48];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  Vector3f wi;
  undefined1 auVar113 [16];
  undefined4 uVar114;
  undefined4 uVar115;
  undefined4 uVar116;
  undefined4 uVar117;
  undefined4 uVar118;
  undefined4 uVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  SampledWavelengths *pSVar124;
  undefined8 *puVar125;
  int i;
  uint uVar126;
  undefined4 extraout_var;
  ulong uVar127;
  NormalizedFresnelBxDF *bxdf;
  byte bVar128;
  float fVar129;
  uint uVar130;
  ulong uVar131;
  uint *puVar132;
  float *pfVar133;
  uint *puVar134;
  float fVar135;
  float *pfVar136;
  ExhaustiveLightSampler *pEVar137;
  float fVar138;
  float *pfVar139;
  long lVar140;
  uint *puVar141;
  undefined4 *puVar142;
  undefined8 *puVar143;
  SamplerHandle *pSVar144;
  uintptr_t iptr;
  undefined1 auVar152 [16];
  int iVar150;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  DenselySampledSpectrum *this_00;
  pointer pLVar145;
  HaltonSampler *pHVar146;
  DebugMLTSampler *pDVar147;
  long in_FS_OFFSET;
  bool bVar148;
  int iVar149;
  undefined1 auVar157 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar164 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  Float FVar168;
  undefined4 uVar170;
  undefined4 extraout_XMM0_Dc;
  SampledSpectrum ret;
  undefined1 auVar172 [16];
  float fVar169;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined8 uVar222;
  undefined1 auVar225 [56];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  undefined8 uVar223;
  undefined1 auVar204 [64];
  undefined1 auVar179 [16];
  undefined1 auVar205 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 extraout_var_00 [12];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar213 [64];
  ulong uVar224;
  undefined1 auVar214 [64];
  Tuple2<pbrt::Point2,_float> TVar171;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dd_05;
  undefined1 auVar215 [64];
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd_06;
  undefined1 auVar216 [64];
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dd_07;
  undefined1 auVar217 [64];
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dd_08;
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dd_09;
  undefined1 auVar220 [64];
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dd_10;
  undefined1 auVar221 [64];
  anon_struct_4_0_00000001_for___align aVar226;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined8 uVar268;
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  Float m_1;
  float fVar270;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  float fVar281;
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  float fVar293;
  undefined1 auVar295 [16];
  float fVar294;
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [64];
  float fVar300;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  float fVar308;
  float fVar309;
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 in_ZMM7 [64];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  Float t1;
  float fVar327;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [64];
  undefined1 auVar334 [64];
  Float t0;
  undefined1 auVar335 [64];
  undefined1 auVar338 [12];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 in_ZMM11 [64];
  undefined1 in_ZMM12 [64];
  undefined1 in_ZMM13 [64];
  undefined1 in_XMM15 [16];
  SampledSpectrum SVar339;
  Point3f p_00;
  Vector3f w;
  Vector3f woRender;
  Vector3f woRender_00;
  Vector3f woRender_01;
  Vector3f wiRender;
  bool specularBounce;
  bool anyNonSpecularBounces;
  bool terminated;
  bool scattered;
  int depth;
  BSSRDFHandle bssrdf;
  SampledSpectrum uniPathPDF;
  SampledSpectrum T_hat;
  int voxel [3];
  SampledSpectrum lightPathPDF;
  SampledSpectrum Le;
  SampledSpectrum albedo;
  LightSampleContext prevIntrContext;
  optional<pbrt::BSDFSample> bs;
  SampledSpectrum rrBeta;
  BSSRDFSample bssrdfSample;
  int voxelLimit [3];
  Float nextCrossingT [3];
  BSDF bsdf;
  RNG rng;
  optional<pbrt::ShapeIntersection> si;
  bool local_80c;
  bool local_80b;
  bool local_80a;
  bool local_809;
  undefined1 local_808 [8];
  undefined8 uStack_800;
  SampledWavelengths *local_7f8;
  float local_7ec;
  undefined8 local_7e8;
  float local_7e0;
  int local_7dc;
  undefined1 local_7d8 [16];
  undefined1 local_7c0 [28];
  float fStack_7a4;
  float fStack_7a0;
  float fStack_79c;
  SampledSpectrum local_798;
  float local_788;
  undefined4 uStack_784;
  undefined4 uStack_780;
  undefined4 uStack_77c;
  SamplerHandle *local_770;
  SampledSpectrum local_768;
  uint *local_758;
  uint *local_750;
  float local_744;
  RayDifferential *local_740;
  undefined1 local_738 [16];
  SampledSpectrum local_728;
  undefined1 local_718 [24];
  bool local_700;
  float local_6f8;
  undefined4 uStack_6f4;
  undefined1 auStack_6f0 [24];
  SampledSpectrum local_6d8;
  undefined1 local_6c8 [32];
  Float FStack_6a8;
  float fStack_6a4;
  Float FStack_6a0;
  Float FStack_69c;
  SampledSpectrum *pSStack_698;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  SamplerHandle *pSStack_680;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  undefined1 local_668 [8];
  float fStack_660;
  float fStack_65c;
  undefined1 auStack_658 [16];
  ulong local_640;
  anon_class_120_15_cd2b6fed local_638;
  undefined1 local_5b8 [32];
  Interval IStack_598;
  undefined1 auStack_590 [12];
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  undefined1 local_578 [8];
  undefined8 uStack_570;
  undefined1 local_568 [16];
  array<float,_4> local_558;
  aligned_storage_t<sizeof(pbrt::BSDFSample),_alignof(pbrt::BSDFSample)> local_548;
  bool local_51c;
  undefined1 local_518 [128];
  undefined8 local_498;
  undefined4 uStack_490;
  undefined8 uStack_48c;
  undefined8 auStack_480 [13];
  bool local_418;
  undefined1 local_408 [24];
  float afStack_3f0 [2];
  MediumHandle local_3e8;
  undefined8 local_3b8;
  float local_3b0;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined8 *local_390;
  ScratchBuffer *local_388;
  PrimitiveHandle *local_380;
  float local_374;
  float local_370;
  float local_36c;
  undefined1 local_368 [44];
  bool local_33c;
  undefined1 local_338 [8];
  float afStack_330 [2];
  Interval IStack_328;
  Float FStack_320;
  undefined1 auStack_31c [32];
  undefined4 uStack_2fc;
  undefined1 local_2f8 [16];
  undefined1 local_2e0 [8];
  float local_2d8 [12];
  undefined1 local_2a8 [16];
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined8 *local_288;
  undefined8 *local_280;
  bool *local_278;
  VisibleSurface *local_270;
  undefined1 local_268 [32];
  Float FStack_248;
  Float FStack_244;
  float fStack_240;
  float fStack_23c;
  undefined8 uStack_238;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 auStack_220 [20];
  undefined1 local_208 [16];
  uchar *local_1f8;
  SamplerHandle local_1f0;
  undefined1 local_1e8 [8];
  SamplerHandle local_1e0;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_1d8;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_1d0;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_1c8;
  undefined8 local_c8;
  float local_b8 [4];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [32];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar340 [28];
  undefined1 auVar163 [64];
  undefined1 auVar165 [64];
  undefined1 auVar151 [16];
  undefined1 auVar206 [64];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  undefined1 extraout_var_06 [60];
  undefined1 auVar258 [64];
  undefined1 auVar262 [64];
  undefined1 auVar269 [56];
  
  local_388 = scratchBuffer;
  local_270 = visibleSurf;
  local_728.values.values = (array<float,_4>)ZEXT816(0);
  local_768.values.values[2] = 1.0;
  local_768.values.values[0] = 1.0;
  local_768.values.values[1] = 1.0;
  local_768.values.values[3] = 1.0;
  local_788 = 1.0;
  uStack_784 = 0x3f800000;
  uStack_780 = 0x3f800000;
  uStack_77c = 0x3f800000;
  local_798.values.values[2] = 1.0;
  local_798.values.values[0] = 1.0;
  local_798.values.values[1] = 1.0;
  local_798.values.values[3] = 1.0;
  local_6d8.values.values[0] = 1.0;
  local_6d8.values.values[1] = 1.0;
  local_6d8.values.values[2] = 1.0;
  local_6d8.values.values[3] = 1.0;
  local_80c = false;
  local_80b = false;
  local_7dc = 0;
  local_5b8._0_4_ = 0.0;
  local_5b8._4_4_ = 0.0;
  IStack_598.low = 0.0;
  IStack_598.high = 0.0;
  auStack_590._0_4_ = 0.0;
  auStack_590._4_4_ = 0.0;
  local_5b8._8_8_ = SUB328(ZEXT432(0),0);
  local_5b8._8_4_ = 0.0;
  local_5b8._12_4_ = 0.0;
  local_1f8 = local_1c8.__data + 0x80;
  local_208 = SUB6416(ZEXT464(0x3f800000),0);
  local_390 = &local_498;
  local_380 = &(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate;
  local_278 = &ray->hasDifferentials;
  local_280 = &uStack_48c;
  local_288 = auStack_480;
  local_36c = 0.5;
  local_370 = 0.33333334;
  local_374 = 0.2;
  local_78 = ZEXT432(0x3e4ccccd);
  local_7f8 = lambda;
  local_7c0._16_8_ = this;
  local_770 = sampler;
  local_740 = ray;
  local_5b8._16_8_ = IStack_598;
  local_5b8._24_8_ = auStack_590._0_8_;
LAB_003e77c8:
  pSVar144 = local_770;
  *(long *)(in_FS_OFFSET + -0x2b0) = *(long *)(in_FS_OFFSET + -0x2b0) + 1;
  if (((local_380->
       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
       ).bits & 0xffffffffffff) == 0) {
    in_ZmmResult = ZEXT1664(ZEXT816(0) << 0x40);
    local_c8._0_1_ = 0;
    local_c8 = 0;
    local_1c8._192_64_ = in_ZmmResult;
    local_1c8._128_64_ = in_ZmmResult;
    local_1c8._64_64_ = in_ZmmResult;
    local_1c8._0_64_ = in_ZmmResult;
  }
  else {
    in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
    in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
    in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
    in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
    PrimitiveHandle::Intersect
              ((optional<pbrt::ShapeIntersection> *)&local_1c8.__align,local_380,&ray->super_Ray,
               INFINITY);
    lambda = local_7f8;
  }
  bVar128 = (byte)local_c8;
  if (((ray->super_Ray).medium.
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
       .bits & 0xffffffffffff) != 0) {
    local_809 = false;
    local_80a = false;
    uVar127 = (pSVar144->
              super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
              ).bits;
    local_518._0_4_ = (undefined4)uVar127;
    local_518._4_4_ = (undefined4)(uVar127 >> 0x20);
    local_7d8 = ZEXT416((uint)((byte)local_c8 & 1) * local_1c8._248_4_ +
                        (uint)!(bool)((byte)local_c8 & 1) * 0x7f800000);
    in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
    in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
    in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
    in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
    FVar168 = DispatchSplit<9>::operator()((DispatchSplit<9> *)&local_638,local_518,uVar127 >> 0x30)
    ;
    local_808._0_4_ = FVar168;
    uVar127 = (pSVar144->
              super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
              ).bits;
    local_518._0_4_ = (undefined4)uVar127;
    local_518._4_4_ = (undefined4)(uVar127 >> 0x20);
    FVar168 = DispatchSplit<9>::operator()((DispatchSplit<9> *)&local_638,local_518,uVar127 >> 0x30)
    ;
    ray = local_740;
    auVar269 = (undefined1  [56])0x0;
    uVar127 = (CONCAT44(extraout_var,local_808._0_4_) ^ 0x1a929e4d6f47a654) * -0x395b586ca42e166b;
    uVar131 = (uVar127 >> 0x2f ^ uVar127) * -0x395b586ca42e166b;
    uVar127 = uVar131 >> 0x2f ^ uVar131;
    uVar131 = (CONCAT44((int)(uVar131 >> 0x20),FVar168) ^ 0x1a929e4d6f47a654) * -0x395b586ca42e166b;
    uVar131 = (uVar131 >> 0x2f ^ uVar131) * -0x395b586ca42e166b;
    local_268._8_8_ = uVar127 * 2 + 1;
    local_268._0_8_ =
         ((uVar131 >> 0x2f ^ uVar131) + 1) * 0x5851f42d4c957f2d + uVar127 * -0x4f5c17a566d501a4 + 1;
    uVar127 = (pSVar144->
              super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
              ).bits;
    uVar5 = (local_740->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
    uVar9 = (local_740->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
    TVar13.bits = (local_740->super_Ray).medium.
                  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                  .bits;
    auStack_6f0._0_4_ = 0.0;
    auStack_6f0._4_4_ = 0.0;
    local_738._0_4_ = (local_740->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
    uVar6 = (local_740->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
    uVar10 = (local_740->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
    fStack_7a4 = (float)uVar10;
    local_7c0._24_4_ = uVar6;
    _fStack_7a0 = 0;
    local_518._0_4_ = (undefined4)uVar127;
    local_518._4_4_ = (undefined4)(uVar127 >> 0x20);
    uStack_800 = 0;
    local_808 = (undefined1  [8])
                *(ulong *)&(local_740->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
    local_6f8 = (float)uVar5;
    uStack_6f4 = uVar9;
    FVar168 = DispatchSplit<9>::operator()((DispatchSplit<9> *)&local_638,local_518,uVar127 >> 0x30)
    ;
    uVar222 = local_518._72_8_;
    local_668._0_4_ = FVar168;
    uVar127 = (ray->super_Ray).medium.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              .bits;
    local_518._72_4_ = (undefined4)uVar127;
    uVar170 = local_518._72_4_;
    local_518._76_4_ = (undefined4)(uVar127 >> 0x20);
    uVar4 = local_518._76_4_;
    local_518._72_8_ = uVar222;
    if (0x2ffffffffffff < uVar127) {
      unique0x00106900 = vunpcklpd_avx(stack0xfffffffffffff858,_local_808);
      if ((uVar127 & 0xfffe000000000000) == 0x2000000000000) {
        local_638.T_hat = &local_768;
        auVar103._4_4_ = uStack_6f4;
        auVar103._0_4_ = local_6f8;
        auVar103._8_8_ = auStack_6f0._0_8_;
        local_638.terminated = &local_80a;
        local_638.uniPathPDF = &local_798;
        local_638.lightPathPDF = &local_6d8;
        local_638.depth = &local_7dc;
        local_408._0_8_ = vmovlps_avx(auVar103);
        local_408._8_4_ = local_738._0_4_;
        local_638.this = (VolPathIntegrator *)local_7c0._16_8_;
        local_638.L = &local_728;
        local_638.lambda = local_7f8;
        local_638.rng = (RNG *)local_268;
        local_7e8._0_4_ = (float)local_7d8._0_4_;
        local_638.sampler = local_770;
        local_638.prevIntrContext = (LightSampleContext *)local_5b8;
        local_638.ray = ray;
        local_638.scattered = &local_809;
        local_638.specularBounce = &local_80c;
        local_638.anyNonSpecularBounces = &local_80b;
        puVar143 = (undefined8 *)(uVar127 & 0xffffffffffff);
        local_3e8.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   )TVar13.bits;
        Transform::ApplyInverse
                  ((Ray *)local_6c8,(Transform *)(puVar143 + 0xf),(Ray *)local_408,
                   (Float *)&local_7e8);
        auVar173._4_4_ = local_6c8._16_4_;
        auVar173._0_4_ = local_6c8._12_4_;
        auVar173._8_8_ = 0;
        auVar179 = ZEXT816(0) << 0x40;
        bVar148 = false;
        uVar126 = 0;
        auVar228._0_4_ = (float)local_6c8._12_4_ * (float)local_6c8._12_4_;
        auVar228._4_4_ = (float)local_6c8._16_4_ * (float)local_6c8._16_4_;
        auVar228._8_8_ = 0;
        auVar156 = vhaddps_avx(auVar228,auVar228);
        auVar156 = ZEXT416((uint)(auVar156._0_4_ + (float)local_6c8._20_4_ * (float)local_6c8._20_4_
                                 ));
        auVar156 = vsqrtss_avx(auVar156,auVar156);
        fVar169 = auVar156._0_4_;
        auVar333 = ZEXT464((uint)(fVar169 * (float)local_7e8));
        auVar283._4_4_ = fVar169;
        auVar283._0_4_ = fVar169;
        auVar283._8_4_ = fVar169;
        auVar283._12_4_ = fVar169;
        local_6c8._20_4_ = (float)local_6c8._20_4_ / fVar169;
        auVar156 = vdivps_avx(auVar173,auVar283);
        local_7e8 = CONCAT44(local_7e8._4_4_,fVar169 * (float)local_7e8);
        uVar222 = vmovlps_avx(auVar156);
        local_6c8._12_4_ = (undefined4)uVar222;
        local_6c8._16_4_ = (undefined4)((ulong)uVar222 >> 0x20);
        auVar151 = vmovshdup_avx(auVar156);
        fVar270 = 1.0 / auVar156._0_4_;
        fVar293 = 1.0 / (float)local_6c8._20_4_;
        fVar169 = 1.0 / auVar151._0_4_;
        auVar269 = (undefined1  [56])0x0;
        do {
          pfVar136 = (float *)local_6c8;
          in_ZMM7 = ZEXT464((uint)(fVar270 * (*(float *)(puVar143 + 1) - (float)local_6c8._0_4_)));
          pfVar139 = (float *)((long)puVar143 + 0x14);
          fVar138 = fVar270;
          if (uVar126 != 0) {
            pfVar136 = (float *)(local_6c8 + 4);
            in_ZMM7 = ZEXT464((uint)(fVar169 *
                                    (*(float *)((long)puVar143 + 0xc) - (float)local_6c8._4_4_)));
            pfVar139 = (float *)(puVar143 + 3);
            fVar138 = fVar169;
            if (uVar126 != 1) {
              pfVar136 = (float *)(local_6c8 + 8);
              in_ZMM7 = ZEXT464((uint)(fVar293 * (*(float *)(puVar143 + 2) - (float)local_6c8._8_4_)
                                      ));
              pfVar139 = (float *)((long)puVar143 + 0x1c);
              fVar138 = fVar293;
            }
          }
          auVar156 = ZEXT416((uint)((*pfVar139 - *pfVar136) * fVar138));
          auVar151 = vminss_avx(auVar156,in_ZMM7._0_16_);
          auVar156 = vmaxss_avx(in_ZMM7._0_16_,auVar156);
          auVar179 = vmaxss_avx(auVar151,auVar179);
          auVar156 = vminss_avx(ZEXT416((uint)(auVar156._0_4_ * 1.0000004)),auVar333._0_16_);
          auVar333 = ZEXT1664(auVar156);
          if (auVar156._0_4_ < auVar179._0_4_) {
            auVar157._4_4_ = (float)uStack_784;
            auVar157._0_4_ = local_788;
            auVar157._8_4_ = (float)uStack_780;
            auVar157._12_4_ = (float)uStack_77c;
            if (!bVar148) goto LAB_003ea501;
            break;
          }
          bVar148 = 1 < uVar126;
          uVar126 = uVar126 + 1;
        } while (uVar126 != 3);
        uVar222 = 0;
        _local_808 = ZEXT416(*(uint *)(puVar143 + 0xe));
        unique0x1000b4af = auVar179;
        local_6f8 = auVar156._0_4_;
        SVar339 = DenselySampledSpectrum::Sample((DenselySampledSpectrum *)(puVar143 + 4),local_7f8)
        ;
        auVar256._0_8_ = SVar339.values.values._8_8_;
        auVar256._8_56_ = auVar269;
        local_7d8._8_8_ = uVar222;
        local_7d8._0_8_ = SVar339.values.values._0_8_;
        local_738 = auVar256._0_16_;
        auVar225 = (undefined1  [56])0x0;
        auStack_6f0._8_16_ = ZEXT416(*(uint *)(puVar143 + 0xe));
        SVar339 = DenselySampledSpectrum::Sample((DenselySampledSpectrum *)(puVar143 + 9),local_7f8)
        ;
        uVar268 = local_518._72_8_;
        auVar257._0_8_ = SVar339.values.values._8_8_;
        auVar257._8_56_ = auVar269;
        auVar205._0_8_ = SVar339.values.values._0_8_;
        auVar205._8_56_ = auVar225;
        auVar156 = vmovlhps_avx(auVar205._0_16_,auVar257._0_16_);
        auVar304._4_4_ = local_6c8._4_4_;
        auVar304._0_4_ = local_6c8._0_4_;
        auVar304._8_8_ = 0;
        local_750 = (uint *)(puVar143 + 0x23);
        auVar154 = ZEXT816(0) << 0x40;
        local_758 = (uint *)((long)puVar143 + 0x11c);
        lVar140 = 0;
        auVar179 = vunpcklpd_avx(local_7d8,local_738);
        local_7d8._0_8_ = puVar143 + 0x24;
        local_3a8._0_4_ = (float)local_808._0_4_ * auVar179._0_4_;
        local_3a8._4_4_ = (float)local_808._0_4_ * auVar179._4_4_;
        fStack_3a0 = (float)local_808._0_4_ * auVar179._8_4_;
        fStack_39c = (float)local_808._0_4_ * auVar179._12_4_;
        local_298 = (float)auStack_6f0._8_4_ * auVar156._0_4_;
        fStack_294 = (float)auStack_6f0._8_4_ * auVar156._4_4_;
        fStack_290 = (float)auStack_6f0._8_4_ * auVar156._8_4_;
        fStack_28c = (float)auStack_6f0._8_4_ * auVar156._12_4_;
        local_2a8._0_4_ = local_298 + (float)local_3a8._0_4_;
        local_2a8._4_4_ = fStack_294 + (float)local_3a8._4_4_;
        local_2a8._8_4_ = fStack_290 + fStack_3a0;
        local_2a8._12_4_ = fStack_28c + fStack_39c;
        auVar335 = ZEXT1664(local_2a8);
        fVar169 = *(float *)(puVar143 + 2);
        fVar138 = *(float *)((long)puVar143 + 0x1c) - fVar169;
        uVar222 = vcmpss_avx512f(ZEXT416((uint)fVar169),
                                 ZEXT416((uint)*(float *)((long)puVar143 + 0x1c)),1);
        bVar20 = (bool)((byte)uVar222 & 1);
        auVar234._8_8_ = 0;
        auVar234._0_8_ = *(ulong *)((long)puVar143 + 0x14);
        auVar180._8_8_ = 0;
        auVar180._0_8_ = puVar143[1];
        auVar156 = vsubps_avx(auVar234,auVar180);
        auVar179 = vsubps_avx(auVar304,auVar180);
        uVar127 = vcmpps_avx512vl(auVar180,auVar234,1);
        auVar181._4_4_ = local_6c8._16_4_;
        auVar181._0_4_ = local_6c8._12_4_;
        auVar181._8_8_ = 0;
        auVar151 = vdivps_avx512vl(auVar179,auVar156);
        bVar148 = (bool)((byte)uVar127 & 1);
        auVar155._0_4_ = (float)((uint)bVar148 * auVar151._0_4_ | (uint)!bVar148 * auVar179._0_4_);
        bVar148 = (bool)((byte)(uVar127 >> 1) & 1);
        auVar155._4_4_ = (uint)bVar148 * auVar151._4_4_ | (uint)!bVar148 * auVar179._4_4_;
        bVar148 = (bool)((byte)(uVar127 >> 2) & 1);
        auVar155._8_4_ = (uint)bVar148 * auVar151._8_4_ | (uint)!bVar148 * auVar179._8_4_;
        bVar148 = (bool)((byte)(uVar127 >> 3) & 1);
        auVar155._12_4_ = (uint)bVar148 * auVar151._12_4_ | (uint)!bVar148 * auVar179._12_4_;
        auVar156 = vdivps_avx(auVar181,auVar156);
        auVar179 = vmovshdup_avx(auVar155);
        local_7ec = (float)local_6c8._20_4_ / fVar138;
        uVar222 = vmovlps_avx(auVar156);
        local_7c0._0_4_ = (undefined4)uVar222;
        local_7c0._4_4_ = (undefined4)((ulong)uVar222 >> 0x20);
        fVar327 = local_7c0._24_4_;
        auVar151 = vmovshdup_avx(auVar156);
        fVar270 = fVar327 * auVar156._0_4_ + auVar155._0_4_;
        fVar293 = fVar327 * auVar151._0_4_ + auVar179._0_4_;
        uVar126 = *(uint *)((long)puVar143 + 0x11c);
        uVar130 = *(uint *)(puVar143 + 0x23);
        uVar127 = CONCAT44(0,uVar130);
        fVar169 = (float)((uint)bVar20 * (int)(((float)local_6c8._8_4_ - fVar169) / fVar138) +
                         (uint)!bVar20 * (int)((float)local_6c8._8_4_ - fVar169)) +
                  fVar327 * local_7ec;
        fVar281 = (float)(int)uVar126;
        auVar338 = in_ZMM11._4_12_;
        local_738._0_8_ = uVar127;
        auVar305._0_4_ = (float)(int)(uVar126 - 1);
        auVar305._4_12_ = auVar338;
        auVar312._0_4_ = (float)(int)(uVar130 - 1);
        auVar312._4_12_ = auVar338;
        auVar156 = vminss_avx(auVar305,ZEXT416((uint)(fVar293 * fVar281)));
        uVar222 = vcmpss_avx512f(ZEXT416((uint)(fVar293 * fVar281)),auVar154,1);
        fVar294 = (float)(int)uVar130;
        fVar129 = (float)(int)(float)((uint)!(bool)((byte)uVar222 & 1) * auVar156._0_4_);
        auVar156 = vminss_avx(auVar312,ZEXT416((uint)(fVar270 * fVar294)));
        uVar222 = vcmpss_avx512f(ZEXT416((uint)(fVar270 * fVar294)),auVar154,1);
        fVar300 = (float)*(int *)(puVar143 + 0x24);
        auVar319._0_4_ = (float)(*(int *)(puVar143 + 0x24) + -1);
        auVar319._4_12_ = auVar338;
        local_808._0_4_ = fVar129;
        fVar135 = (float)(int)(float)((uint)!(bool)((byte)uVar222 & 1) * auVar156._0_4_);
        auVar156 = vminss_avx(auVar319,ZEXT416((uint)(fVar169 * fVar300)));
        uVar222 = vcmpss_avx512f(ZEXT416((uint)(fVar169 * fVar300)),auVar154,1);
        auVar160._16_48_ = in_ZmmResult._16_48_;
        auVar160._0_16_ = auVar156;
        fVar138 = (float)((uint)!(bool)((byte)uVar222 & 1) * auVar156._0_4_);
        in_ZmmResult._4_60_ = auVar160._4_60_;
        in_ZmmResult._0_4_ = fVar138;
        auVar333 = ZEXT464((uint)local_6f8);
        fVar138 = (float)(int)fVar138;
        do {
          iVar149 = (int)lVar140;
          if (iVar149 == 1) {
            puVar141 = (uint *)(local_368 + 4);
            puVar142 = (undefined4 *)(local_548.__data + 4);
            pfVar139 = (float *)(local_2e0 + 4);
            pfVar133 = (float *)(local_338 + 4);
            pfVar136 = (float *)(local_7c0 + 4);
            local_718._4_4_ = fVar129;
            fVar308 = fVar129;
          }
          else if (iVar149 == 0) {
            *(float *)(local_718 + lVar140 * 4) = fVar135;
            puVar141 = (uint *)local_368;
            puVar142 = (undefined4 *)&local_548;
            pfVar139 = (float *)local_2e0;
            pfVar133 = (float *)local_338;
            pfVar136 = (float *)local_7c0;
            fVar308 = fVar135;
          }
          else {
            puVar141 = (uint *)(local_368 + 8);
            puVar142 = (undefined4 *)(local_548.__data + 8);
            pfVar139 = local_2d8;
            pfVar133 = afStack_330;
            pfVar136 = &local_7ec;
            *(float *)(local_718 + lVar140 * 4) = fVar138;
            fVar308 = fVar138;
          }
          if ((*pfVar136 == 0.0) && (!NAN(*pfVar136))) {
            pfVar136 = (float *)local_7c0;
            if ((iVar149 != 0) && (pfVar136 = (float *)(local_7c0 + 4), iVar149 != 1)) {
              pfVar136 = &local_7ec;
            }
            *pfVar136 = 0.0;
          }
          pfVar136 = (float *)local_7c0;
          if ((iVar149 != 0) && (pfVar136 = (float *)(local_7c0 + 4), iVar149 != 1)) {
            pfVar136 = &local_7ec;
          }
          if (0.0 <= *pfVar136) {
            fVar308 = (float)((int)fVar308 + 1);
            if (iVar149 == 1) {
              *pfVar133 = fVar327 + (fVar308 / fVar281 - fVar293) / (float)local_7c0._4_4_;
              fVar308 = (float)local_7c0._4_4_ * fVar281;
              puVar134 = local_758;
            }
            else if (iVar149 == 0) {
              *pfVar133 = fVar327 + (fVar308 / fVar294 - fVar270) / (float)local_7c0._0_4_;
              fVar308 = (float)local_7c0._0_4_ * fVar294;
              puVar134 = local_750;
            }
            else {
              *pfVar133 = fVar327 + (fVar308 / fVar300 - fVar169) / local_7ec;
              fVar308 = local_7ec * fVar300;
              puVar134 = (uint *)local_7d8._0_8_;
            }
            *puVar142 = 1;
            *pfVar139 = 1.0 / fVar308;
            uVar130 = *puVar134;
          }
          else {
            fVar308 = (float)(int)fVar308;
            if (iVar149 == 1) {
              fVar308 = fVar308 / fVar281 - fVar293;
              puVar134 = local_758;
              fVar309 = (float)local_7c0._4_4_;
            }
            else if (iVar149 == 0) {
              fVar308 = fVar308 / fVar294 - fVar270;
              puVar134 = local_750;
              fVar309 = (float)local_7c0._0_4_;
            }
            else {
              fVar308 = fVar308 / fVar300 - fVar169;
              puVar134 = (uint *)local_7d8._0_8_;
              fVar309 = local_7ec;
            }
            in_ZMM11 = ZEXT464(0xbf800000);
            *pfVar133 = fVar327 + fVar308 / fVar309;
            uVar130 = 0xffffffff;
            uVar12 = *puVar134;
            *puVar142 = 0xffffffff;
            *pfVar139 = -1.0 / (fVar309 * (float)(int)uVar12);
          }
          lVar140 = lVar140 + 1;
          *puVar141 = uVar130;
        } while (lVar140 != 3);
        auVar157._4_4_ = (float)uStack_784;
        auVar157._0_4_ = local_788;
        auVar157._8_4_ = (float)uStack_780;
        auVar157._12_4_ = (float)uStack_77c;
        auVar299 = ZEXT464((uint)local_668._0_4_);
        local_518._76_4_ = uVar4 | 0x30000;
        uVar4 = local_518._76_4_;
        local_640 = (long)puVar143 + 0x74U | 0x1000000000000;
        auVar156 = stack0xfffffffffffff858;
        local_518._72_8_ = uVar268;
        while( true ) {
          auVar334 = ZEXT1664(auVar156);
          lVar140 = (long)*(int *)(&DAT_0056d940 +
                                  (ulong)((uint)((float)local_338._4_4_ < afStack_330[0]) |
                                         (uint)((float)local_338._0_4_ < (float)local_338._4_4_) * 4
                                         + (uint)((float)local_338._0_4_ < afStack_330[0]) * 2) * 4)
          ;
          fVar169 = afStack_330[lVar140 + -2];
          uVar3 = *(undefined4 *)
                   (puVar143[0x20] +
                   ((long)(int)((uVar126 * local_718._8_4_ + local_718._4_4_) * (int)uVar127) +
                   (long)(int)local_718._0_4_) * 4);
          auVar59._4_4_ = uVar3;
          auVar59._0_4_ = uVar3;
          auVar59._8_4_ = uVar3;
          auVar59._12_4_ = uVar3;
          auVar151 = vmulps_avx512vl(auVar335._0_16_,auVar59);
          auVar179 = vminss_avx(ZEXT416((uint)fVar169),auVar333._0_16_);
          in_ZMM7 = ZEXT1664(auVar179);
          if ((auVar151._0_4_ != 0.0) || (NAN(auVar151._0_4_))) {
            auVar67._8_4_ = 0x80000000;
            auVar67._0_8_ = 0x8000000080000000;
            auVar67._12_4_ = 0x80000000;
            in_ZmmResult._0_16_ = vxorps_avx512vl(auVar151,auVar67);
            local_738._0_4_ = auVar179._0_4_;
            _local_808 = auVar157;
            local_7d8 = auVar151;
            local_744 = fVar169;
            unique0x1000b597 = in_ZmmResult._0_16_;
            while( true ) {
              local_7c0._24_4_ = auVar334._0_4_;
              fVar169 = logf(1.0 - auVar299._0_4_);
              uVar222 = local_268._0_8_;
              in_ZMM7 = ZEXT464((uint)local_738._0_4_);
              uVar127 = (ulong)local_268._0_8_ >> 0x1b;
              local_268._0_8_ = local_268._0_8_ * 0x5851f42d4c957f2d + local_268._8_8_;
              uVar126 = SUB84(uVar222,4) >> 0xd ^ (uint)uVar127;
              bVar128 = SUB81(uVar222,7) >> 3;
              fVar169 = (float)local_7c0._24_4_ - fVar169 / (float)local_7d8._0_4_;
              auVar334 = ZEXT464((uint)fVar169);
              auVar156 = vcvtusi2ss_avx512f(in_ZMM12._0_16_,
                                            uVar126 >> bVar128 | uVar126 << 0x20 - bVar128);
              auVar156 = vminss_avx(ZEXT416((uint)(auVar156._0_4_ * 2.3283064e-10)),
                                    ZEXT416(0x3f7fffff));
              auVar299 = ZEXT1664(auVar156);
              if ((float)local_738._0_4_ <= fVar169) break;
              if (fVar169 < local_6f8) {
                fVar270 = fVar169 - (float)local_7c0._24_4_;
                local_668._0_4_ = auVar156._0_4_;
                register0x00001440 = ZEXT416((uint)fVar169);
                auVar183._0_4_ = fVar270 * (float)auStack_590._8_4_;
                auVar183._4_4_ = fVar270 * fStack_584;
                auVar183._8_4_ = fVar270 * fStack_580;
                auVar183._12_4_ = fVar270 * fStack_57c;
                auVar68._8_4_ = 0x3fb8aa3b;
                auVar68._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar68._12_4_ = 0x3fb8aa3b;
                auVar156 = vmulps_avx512vl(auVar183,auVar68);
                _local_578 = vroundps_avx(auVar156,9);
                auVar156 = vsubps_avx(auVar156,_local_578);
                auVar235._8_4_ = 0x3da00ac9;
                auVar235._0_8_ = 0x3da00ac93da00ac9;
                auVar235._12_4_ = 0x3da00ac9;
                auVar69._8_4_ = 0x3e679a0b;
                auVar69._0_8_ = 0x3e679a0b3e679a0b;
                auVar69._12_4_ = 0x3e679a0b;
                auVar179 = vfmadd213ps_avx512vl(auVar235,auVar156,auVar69);
                auVar70._8_4_ = 0x3f321004;
                auVar70._0_8_ = 0x3f3210043f321004;
                auVar70._12_4_ = 0x3f321004;
                auVar179 = vfmadd213ps_avx512vl(auVar179,auVar156,auVar70);
                auVar96._4_4_ = uStack_784;
                auVar96._0_4_ = local_788;
                auVar96._8_4_ = uStack_780;
                auVar96._12_4_ = uStack_77c;
                local_568 = vfmadd213ps_fma(auVar179,auVar156,auVar96);
                fVar270 = fVar169 * (float)local_6c8._12_4_ + (float)local_6c8._0_4_;
                fVar293 = fVar169 * (float)local_6c8._16_4_ + (float)local_6c8._4_4_;
                local_558.values =
                     (float  [4])
                     CONCAT412(fVar169 * 0.0 + 0.0,
                               CONCAT48(fVar169 * 0.0 + 0.0,CONCAT44(fVar293,fVar270)));
                fVar169 = fVar169 * (float)local_6c8._20_4_ + (float)local_6c8._8_4_;
                auStack_6f0._8_4_ = fVar169;
                p_00.super_Tuple3<pbrt::Point3,_float>.z = fVar169;
                p_00.super_Tuple3<pbrt::Point3,_float>.x = fVar270;
                p_00.super_Tuple3<pbrt::Point3,_float>.y = fVar293;
                auVar225 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                auVar269 = ZEXT856(local_558.values._8_8_);
                SVar339 = CloudMediumProvider::Density
                                    ((CloudMediumProvider *)*puVar143,p_00,local_7f8);
                auVar258._0_8_ = SVar339.values.values._8_8_;
                auVar258._8_56_ = auVar225;
                auVar206._0_8_ = SVar339.values.values._0_8_;
                auVar206._8_56_ = auVar269;
                auVar276._0_4_ = (int)(float)local_578._0_4_;
                auVar276._4_4_ = (int)(float)local_578._4_4_;
                auVar276._8_4_ = (int)(float)uStack_570;
                auVar276._12_4_ = (int)uStack_570._4_4_;
                auVar297._8_4_ = 0xffffff81;
                auVar297._0_8_ = 0xffffff81ffffff81;
                auVar297._12_4_ = 0xffffff81;
                auVar156 = vmovlhps_avx(auVar206._0_16_,auVar258._0_16_);
                local_518._88_4_ = auVar156._0_4_ * (float)local_3a8._0_4_;
                local_518._92_4_ = auVar156._4_4_ * (float)local_3a8._4_4_;
                local_518._96_4_ = auVar156._8_4_ * fStack_3a0;
                local_518._100_4_ = auVar156._12_4_ * fStack_39c;
                auVar151 = vpsrld_avx(local_568,0x17);
                auVar179 = vpaddd_avx(auVar276,auVar297);
                auVar179 = vpaddd_avx(auVar179,auVar151);
                auVar71._8_4_ = 0x7f;
                auVar71._0_8_ = 0x7f0000007f;
                auVar71._12_4_ = 0x7f;
                uVar127 = vpcmpgtd_avx512vl(auVar179,auVar71);
                uVar127 = uVar127 & 0xf;
                auVar72._8_4_ = 0x807fffff;
                auVar72._0_8_ = 0x807fffff807fffff;
                auVar72._12_4_ = 0x807fffff;
                auVar151 = vpandd_avx512vl(local_568,auVar72);
                uVar131 = vpcmpgtd_avx512vl(auVar179,auVar297);
                uVar131 = uVar131 & 0xf;
                auVar179 = vpslld_avx(auVar179,0x17);
                auVar73._8_4_ = 0x3f800000;
                auVar73._0_8_ = 0x3f8000003f800000;
                auVar73._12_4_ = 0x3f800000;
                auVar179 = vpaddd_avx512vl(auVar179,auVar73);
                auVar179 = vpord_avx512vl(auVar179,auVar151);
                local_518._104_4_ = auVar156._0_4_ * local_298;
                local_518._108_4_ = auVar156._4_4_ * fStack_294;
                local_518._112_4_ = auVar156._8_4_ * fStack_290;
                local_518._116_4_ = auVar156._12_4_ * fStack_28c;
                auVar156 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                bVar148 = (bool)((byte)uVar127 & 1);
                bVar20 = (bool)((byte)(uVar127 >> 1) & 1);
                bVar17 = (bool)((byte)(uVar127 >> 2) & 1);
                bVar18 = SUB81(uVar127 >> 3,0);
                auStack_480[0]._0_4_ =
                     (float)((uint)bVar148 * auVar156._0_4_ |
                            (uint)!bVar148 * (uint)((byte)uVar131 & 1) * auVar179._0_4_) *
                     (float)local_808._0_4_;
                auStack_480[0]._4_4_ =
                     (float)((uint)bVar20 * auVar156._4_4_ |
                            (uint)!bVar20 * (uint)((byte)(uVar131 >> 1) & 1) * auVar179._4_4_) *
                     (float)local_808._4_4_;
                auStack_480[1]._0_4_ =
                     (float)((uint)bVar17 * auVar156._8_4_ |
                            (uint)!bVar17 * (uint)((byte)(uVar131 >> 2) & 1) * auVar179._8_4_) *
                     (float)uStack_800;
                auStack_480[1]._4_4_ =
                     (float)((uint)bVar18 * auVar156._12_4_ |
                            (uint)!bVar18 * (uint)(byte)(uVar131 >> 3) * auVar179._12_4_) *
                     uStack_800._4_4_;
                auVar156 = vmovshdup_avx((undefined1  [16])local_558.values);
                fVar169 = auVar156._0_4_;
                auVar156 = vfmadd231ss_fma(ZEXT416((uint)(fVar169 *
                                                         *(float *)((long)puVar143 + 0x7c))),
                                           (undefined1  [16])local_558.values,
                                           ZEXT416(*(uint *)(puVar143 + 0xf)));
                auVar179 = vfmadd231ss_fma(ZEXT416((uint)(fVar169 *
                                                         *(float *)((long)puVar143 + 0x8c))),
                                           (undefined1  [16])local_558.values,
                                           ZEXT416(*(uint *)(puVar143 + 0x11)));
                auVar151 = vfmadd231ss_fma(ZEXT416((uint)(fVar169 *
                                                         *(float *)((long)puVar143 + 0x9c))),
                                           (undefined1  [16])local_558.values,
                                           ZEXT416(*(uint *)(puVar143 + 0x13)));
                auVar154 = vfmadd231ss_fma(ZEXT416((uint)(fVar169 *
                                                         *(float *)((long)puVar143 + 0xac))),
                                           (undefined1  [16])local_558.values,
                                           ZEXT416(*(uint *)(puVar143 + 0x15)));
                auVar156 = vfmadd231ss_fma(auVar156,ZEXT416((uint)auStack_6f0._8_4_),
                                           ZEXT416(*(uint *)(puVar143 + 0x10)));
                auVar179 = vfmadd231ss_fma(auVar179,ZEXT416((uint)auStack_6f0._8_4_),
                                           ZEXT416(*(uint *)(puVar143 + 0x12)));
                auVar151 = vfmadd231ss_fma(auVar151,ZEXT416((uint)auStack_6f0._8_4_),
                                           ZEXT416(*(uint *)(puVar143 + 0x14)));
                auVar154 = vfmadd231ss_fma(auVar154,ZEXT416((uint)auStack_6f0._8_4_),
                                           ZEXT416(*(uint *)(puVar143 + 0x16)));
                fVar169 = auVar154._0_4_ + *(float *)((long)puVar143 + 0xb4);
                fVar270 = auVar156._0_4_ + *(float *)((long)puVar143 + 0x84);
                fVar293 = auVar179._0_4_ + *(float *)((long)puVar143 + 0x94);
                fVar138 = auVar151._0_4_ + *(float *)((long)puVar143 + 0xa4);
                bVar148 = fVar169 == 1.0;
                fVar129 = fVar293 / fVar169;
                iVar149 = (uint)bVar148 * (int)fVar138 + (uint)!bVar148 * (int)(fVar138 / fVar169);
                iVar150 = (uint)bVar148 * (int)fVar270 + (uint)!bVar148 * (int)(fVar270 / fVar169);
                auVar161._16_48_ = in_ZmmResult._16_48_;
                auVar161._0_16_ = ZEXT416((uint)fVar129);
                in_ZmmResult._4_60_ = auVar161._4_60_;
                in_ZmmResult._0_4_ =
                     (float)((uint)bVar148 * (int)fVar293 + (uint)!bVar148 * (int)fVar129);
                auVar320._4_4_ = iVar150;
                auVar320._0_4_ = iVar150;
                auVar320._8_4_ = iVar150;
                auVar320._12_4_ = iVar150;
                auVar324._4_4_ = in_ZmmResult._0_4_;
                auVar324._0_4_ = in_ZmmResult._0_4_;
                auVar324._8_4_ = in_ZmmResult._0_4_;
                auVar324._12_4_ = in_ZmmResult._0_4_;
                auVar288._4_4_ = iVar149;
                auVar288._0_4_ = iVar149;
                auVar288._8_4_ = iVar149;
                auVar288._12_4_ = iVar149;
                auVar179 = vmovlhps_avx(auVar320,auVar324);
                in_ZMM7 = ZEXT1664(auVar179);
                local_518._40_4_ = 0.0;
                auVar329._0_4_ = local_408._12_4_ * local_408._12_4_;
                auVar329._4_4_ = local_408._16_4_ * local_408._16_4_;
                auVar329._8_8_ = 0;
                auVar313._0_8_ = local_408._12_8_ ^ 0x8000000080000000;
                auVar313._8_4_ = 0x80000000;
                auVar313._12_4_ = 0x80000000;
                auVar156 = vhaddps_avx(auVar329,auVar329);
                auVar156 = ZEXT416((uint)(auVar156._0_4_ +
                                         (float)local_408._20_4_ * (float)local_408._20_4_));
                auVar156 = vsqrtss_avx(auVar156,auVar156);
                local_518._36_4_ = auVar156._0_4_;
                auVar330._4_4_ = local_518._36_4_;
                auVar330._0_4_ = local_518._36_4_;
                auVar330._8_4_ = local_518._36_4_;
                auVar330._12_4_ = local_518._36_4_;
                local_518._36_4_ = -(float)local_408._20_4_ / (float)local_518._36_4_;
                auVar156 = vdivps_avx(auVar313,auVar330);
                local_518._120_8_ = local_7d8._0_8_;
                local_498._0_4_ = local_7d8._8_4_;
                local_498._4_4_ = local_7d8._12_4_;
                local_518._44_4_ = 0.0;
                local_518._48_4_ = 0.0;
                local_518._52_4_ = 0.0;
                local_518._56_4_ = 0.0;
                local_518._0_4_ = auVar179._0_4_;
                local_518._4_4_ = auVar179._4_4_;
                local_518._8_4_ = auVar179._8_4_;
                local_518._12_4_ = auVar179._12_4_;
                uVar222 = vmovlps_avx(auVar288);
                local_518._16_4_ = (undefined4)uVar222;
                local_518._20_4_ = (undefined4)((ulong)uVar222 >> 0x20);
                local_518._24_4_ = afStack_3f0[0];
                uVar222 = vmovlps_avx(auVar156);
                local_518._28_4_ = (undefined4)uVar222;
                local_518._32_4_ = (undefined4)((ulong)uVar222 >> 0x20);
                local_518._64_4_ = 0.0;
                local_518._68_4_ = 0.0;
                local_518._80_4_ = (undefined4)local_640;
                local_518._84_4_ = (undefined4)(local_640 >> 0x20);
                _uStack_48c = SUB1612(ZEXT416(0),0);
                local_518._72_4_ = uVar170;
                local_518._76_4_ = uVar4;
                uStack_490 = local_518._40_4_;
                bVar148 = Li::anon_class_120_15_cd2b6fed::operator()
                                    (&local_638,(MediumSample *)local_518);
                local_808._4_4_ = uStack_784;
                local_808._0_4_ = local_788;
                uStack_800._4_4_ = (float)uStack_77c;
                uStack_800._0_4_ = (float)uStack_780;
                auVar299 = ZEXT464((uint)local_668._0_4_);
                auVar334 = ZEXT1664(stack0xfffffffffffff858);
                if (!bVar148) goto LAB_003ea4f0;
              }
            }
            fVar169 = (float)local_738._0_4_ - (float)local_7c0._24_4_;
            auVar333 = ZEXT464((uint)local_6f8);
            auVar335 = ZEXT1664(local_2a8);
            auVar182._0_4_ = fVar169 * (float)auStack_590._8_4_;
            auVar182._4_4_ = fVar169 * fStack_584;
            auVar182._8_4_ = fVar169 * fStack_580;
            auVar182._12_4_ = fVar169 * fStack_57c;
            fVar169 = local_744;
            auVar156 = _local_808;
          }
          else {
            auVar60._8_4_ = 0x80000000;
            auVar60._0_8_ = 0x8000000080000000;
            auVar60._12_4_ = 0x80000000;
            auVar151 = vxorps_avx512vl(auVar151,auVar60);
            fVar270 = auVar179._0_4_ - auVar156._0_4_;
            auVar182._0_4_ = fVar270 * auVar151._0_4_;
            auVar182._4_4_ = fVar270 * auVar151._4_4_;
            auVar182._8_4_ = fVar270 * auVar151._8_4_;
            auVar182._12_4_ = fVar270 * auVar151._12_4_;
            auVar156 = auVar157;
          }
          auVar287._8_4_ = 0xffffff81;
          auVar287._0_8_ = 0xffffff81ffffff81;
          auVar275._8_4_ = 0x3da00ac9;
          auVar275._0_8_ = 0x3da00ac93da00ac9;
          auVar287._12_4_ = 0xffffff81;
          auVar275._12_4_ = 0x3da00ac9;
          auVar61._8_4_ = 0x3fb8aa3b;
          auVar61._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar61._12_4_ = 0x3fb8aa3b;
          auVar151 = vmulps_avx512vl(auVar182,auVar61);
          auVar179 = vroundps_avx(auVar151,9);
          auVar151 = vsubps_avx(auVar151,auVar179);
          auVar62._8_4_ = 0x3e679a0b;
          auVar62._0_8_ = 0x3e679a0b3e679a0b;
          auVar62._12_4_ = 0x3e679a0b;
          auVar154 = vfmadd213ps_avx512vl(auVar275,auVar151,auVar62);
          auVar236._0_4_ = (int)auVar179._0_4_;
          auVar236._4_4_ = (int)auVar179._4_4_;
          auVar236._8_4_ = (int)auVar179._8_4_;
          auVar236._12_4_ = (int)auVar179._12_4_;
          auVar179 = vpaddd_avx(auVar236,auVar287);
          auVar63._8_4_ = 0x3f321004;
          auVar63._0_8_ = 0x3f3210043f321004;
          auVar63._12_4_ = 0x3f321004;
          auVar154 = vfmadd213ps_avx512vl(auVar154,auVar151,auVar63);
          auVar97._4_4_ = uStack_784;
          auVar97._0_4_ = local_788;
          auVar97._8_4_ = uStack_780;
          auVar97._12_4_ = uStack_77c;
          auVar151 = vfmadd213ps_fma(auVar154,auVar151,auVar97);
          auVar154 = vpsrld_avx(auVar151,0x17);
          auVar179 = vpaddd_avx(auVar179,auVar154);
          auVar64._8_4_ = 0x7f;
          auVar64._0_8_ = 0x7f0000007f;
          auVar64._12_4_ = 0x7f;
          uVar127 = vpcmpgtd_avx512vl(auVar179,auVar64);
          uVar127 = uVar127 & 0xf;
          auVar65._8_4_ = 0x807fffff;
          auVar65._0_8_ = 0x807fffff807fffff;
          auVar65._12_4_ = 0x807fffff;
          auVar151 = vpandd_avx512vl(auVar151,auVar65);
          uVar131 = vpcmpgtd_avx512vl(auVar179,auVar287);
          uVar131 = uVar131 & 0xf;
          auVar179 = vpslld_avx(auVar179,0x17);
          auVar66._8_4_ = 0x3f800000;
          auVar66._0_8_ = 0x3f8000003f800000;
          auVar66._12_4_ = 0x3f800000;
          auVar179 = vpaddd_avx512vl(auVar179,auVar66);
          auVar179 = vpord_avx512vl(auVar179,auVar151);
          auVar151 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          bVar148 = (bool)((byte)uVar127 & 1);
          in_ZmmResult._0_4_ =
               (float)((uint)bVar148 * auVar151._0_4_ |
                      (uint)!bVar148 * (uint)((byte)uVar131 & 1) * auVar179._0_4_);
          bVar148 = (bool)((byte)(uVar127 >> 1) & 1);
          in_ZmmResult._4_4_ =
               (float)((uint)bVar148 * auVar151._4_4_ |
                      (uint)!bVar148 * (uint)((byte)(uVar131 >> 1) & 1) * auVar179._4_4_);
          bVar148 = (bool)((byte)(uVar127 >> 2) & 1);
          in_ZmmResult._8_4_ =
               (float)((uint)bVar148 * auVar151._8_4_ |
                      (uint)!bVar148 * (uint)((byte)(uVar131 >> 2) & 1) * auVar179._8_4_);
          bVar148 = SUB81(uVar127 >> 3,0);
          in_ZmmResult._12_4_ =
               (float)((uint)bVar148 * auVar151._12_4_ |
                      (uint)!bVar148 * (uint)(byte)(uVar131 >> 3) * auVar179._12_4_);
          auVar157._0_4_ = in_ZmmResult._0_4_ * auVar156._0_4_;
          auVar157._4_4_ = in_ZmmResult._4_4_ * auVar156._4_4_;
          auVar157._8_4_ = in_ZmmResult._8_4_ * auVar156._8_4_;
          auVar157._12_4_ = in_ZmmResult._12_4_ * auVar156._12_4_;
          ray = local_740;
          if ((auVar333._0_4_ < fVar169) ||
             (iVar149 = *(int *)(local_718 + lVar140 * 4),
             *(int *)(local_718 + lVar140 * 4) = iVar149 + *(int *)((long)&local_548 + lVar140 * 4),
             iVar149 + *(int *)((long)&local_548 + lVar140 * 4) == *(int *)(local_368 + lVar140 * 4)
             )) break;
          auVar156 = in_ZMM7._0_16_;
          afStack_330[lVar140 + -2] = fVar169 + local_2d8[lVar140 + -2];
          uVar127 = (ulong)*local_750;
          uVar126 = *local_758;
        }
      }
      else {
        local_638.T_hat = &local_768;
        auVar156._4_4_ = uStack_6f4;
        auVar156._0_4_ = local_6f8;
        auVar156._8_8_ = auStack_6f0._0_8_;
        local_638.terminated = &local_80a;
        local_638.uniPathPDF = &local_798;
        local_638.lightPathPDF = &local_6d8;
        local_638.depth = &local_7dc;
        local_408._0_8_ = vmovlps_avx(auVar156);
        local_408._8_4_ = local_738._0_4_;
        local_638.this = (VolPathIntegrator *)local_7c0._16_8_;
        local_638.L = &local_728;
        local_638.lambda = local_7f8;
        local_638.rng = (RNG *)local_268;
        local_7ec = (float)local_7d8._0_4_;
        local_638.sampler = local_770;
        local_638.prevIntrContext = (LightSampleContext *)local_5b8;
        local_638.ray = ray;
        local_638.scattered = &local_809;
        local_638.specularBounce = &local_80c;
        local_638.anyNonSpecularBounces = &local_80b;
        puVar143 = (undefined8 *)(uVar127 & 0xffffffffffff);
        local_3e8.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   )TVar13.bits;
        Transform::ApplyInverse
                  ((Ray *)local_6c8,(Transform *)(puVar143 + 0xf),(Ray *)local_408,&local_7ec);
        auVar338 = in_ZMM11._4_12_;
        auVar151._4_4_ = local_6c8._16_4_;
        auVar151._0_4_ = local_6c8._12_4_;
        auVar151._8_8_ = 0;
        auVar179 = ZEXT816(0) << 0x40;
        bVar148 = false;
        uVar126 = 0;
        auVar154._0_4_ = (float)local_6c8._12_4_ * (float)local_6c8._12_4_;
        auVar154._4_4_ = (float)local_6c8._16_4_ * (float)local_6c8._16_4_;
        auVar154._8_8_ = 0;
        auVar156 = vhaddps_avx(auVar154,auVar154);
        auVar156 = ZEXT416((uint)(auVar156._0_4_ + (float)local_6c8._20_4_ * (float)local_6c8._20_4_
                                 ));
        auVar156 = vsqrtss_avx(auVar156,auVar156);
        fVar169 = auVar156._0_4_;
        auVar333 = ZEXT464((uint)(fVar169 * local_7ec));
        auVar285._4_4_ = fVar169;
        auVar285._0_4_ = fVar169;
        auVar285._8_4_ = fVar169;
        auVar285._12_4_ = fVar169;
        local_6c8._20_4_ = (float)local_6c8._20_4_ / fVar169;
        auVar156 = vdivps_avx(auVar151,auVar285);
        local_7ec = fVar169 * local_7ec;
        uVar222 = vmovlps_avx(auVar156);
        local_6c8._12_4_ = (undefined4)uVar222;
        local_6c8._16_4_ = (undefined4)((ulong)uVar222 >> 0x20);
        auVar151 = vmovshdup_avx(auVar156);
        fVar270 = 1.0 / auVar156._0_4_;
        fVar293 = 1.0 / (float)local_6c8._20_4_;
        fVar169 = 1.0 / auVar151._0_4_;
        auVar269 = (undefined1  [56])0x0;
        do {
          in_ZMM7 = ZEXT464((uint)(fVar270 * (*(float *)(puVar143 + 1) - (float)local_6c8._0_4_)));
          pfVar136 = (float *)((long)puVar143 + 0x14);
          pfVar139 = (float *)local_6c8;
          fVar138 = fVar270;
          if ((uVar126 != 0) &&
             (in_ZMM7 = ZEXT464((uint)(fVar169 *
                                      (*(float *)((long)puVar143 + 0xc) - (float)local_6c8._4_4_))),
             pfVar136 = (float *)(puVar143 + 3), pfVar139 = (float *)(local_6c8 + 4),
             fVar138 = fVar169, uVar126 != 1)) {
            in_ZMM7 = ZEXT464((uint)(fVar293 * (*(float *)(puVar143 + 2) - (float)local_6c8._8_4_)))
            ;
            pfVar136 = (float *)((long)puVar143 + 0x1c);
            pfVar139 = (float *)(local_6c8 + 8);
            fVar138 = fVar293;
          }
          auVar156 = ZEXT416((uint)((*pfVar136 - *pfVar139) * fVar138));
          auVar151 = vminss_avx(auVar156,in_ZMM7._0_16_);
          auVar156 = vmaxss_avx(in_ZMM7._0_16_,auVar156);
          auVar179 = vmaxss_avx(auVar151,auVar179);
          auVar156 = vminss_avx(ZEXT416((uint)(auVar156._0_4_ * 1.0000004)),auVar333._0_16_);
          auVar333 = ZEXT1664(auVar156);
          if (auVar156._0_4_ < auVar179._0_4_) {
            auVar157._4_4_ = (float)uStack_784;
            auVar157._0_4_ = local_788;
            auVar157._8_4_ = (float)uStack_780;
            auVar157._12_4_ = (float)uStack_77c;
            if (!bVar148) goto LAB_003ea501;
            break;
          }
          bVar148 = 1 < uVar126;
          uVar126 = uVar126 + 1;
        } while (uVar126 != 3);
        uVar222 = 0;
        _local_808 = ZEXT416(*(uint *)(puVar143 + 0xe));
        unique0x1000b49f = auVar179;
        local_6f8 = auVar156._0_4_;
        SVar339 = DenselySampledSpectrum::Sample((DenselySampledSpectrum *)(puVar143 + 4),local_7f8)
        ;
        auVar299._0_8_ = SVar339.values.values._8_8_;
        auVar299._8_56_ = auVar269;
        local_7d8._8_8_ = uVar222;
        local_7d8._0_8_ = SVar339.values.values._0_8_;
        local_738 = auVar299._0_16_;
        auVar225 = (undefined1  [56])0x0;
        auStack_6f0._8_16_ = ZEXT416(*(uint *)(puVar143 + 0xe));
        SVar339 = DenselySampledSpectrum::Sample((DenselySampledSpectrum *)(puVar143 + 9),local_7f8)
        ;
        uVar268 = local_518._72_8_;
        auVar334._0_8_ = SVar339.values.values._8_8_;
        auVar334._8_56_ = auVar269;
        auVar335._0_8_ = SVar339.values.values._0_8_;
        auVar335._8_56_ = auVar225;
        auVar156 = vmovlhps_avx(auVar335._0_16_,auVar334._0_16_);
        auVar306._4_4_ = local_6c8._4_4_;
        auVar306._0_4_ = local_6c8._0_4_;
        auVar306._8_8_ = 0;
        local_750 = (uint *)(puVar143 + 0x23);
        local_758 = (uint *)((long)puVar143 + 0x11c);
        auVar154 = ZEXT816(0) << 0x40;
        lVar140 = 0;
        auVar179 = vunpcklpd_avx(local_7d8,local_738);
        local_3a8._0_4_ = (float)local_808._0_4_ * auVar179._0_4_;
        local_3a8._4_4_ = (float)local_808._0_4_ * auVar179._4_4_;
        fStack_3a0 = (float)local_808._0_4_ * auVar179._8_4_;
        fStack_39c = (float)local_808._0_4_ * auVar179._12_4_;
        local_298 = (float)auStack_6f0._8_4_ * auVar156._0_4_;
        fStack_294 = (float)auStack_6f0._8_4_ * auVar156._4_4_;
        fStack_290 = (float)auStack_6f0._8_4_ * auVar156._8_4_;
        fStack_28c = (float)auStack_6f0._8_4_ * auVar156._12_4_;
        local_2a8._0_4_ = local_298 + (float)local_3a8._0_4_;
        local_2a8._4_4_ = fStack_294 + (float)local_3a8._4_4_;
        local_2a8._8_4_ = fStack_290 + fStack_3a0;
        local_2a8._12_4_ = fStack_28c + fStack_39c;
        auVar335 = ZEXT1664(local_2a8);
        fVar169 = *(float *)(puVar143 + 2);
        fVar138 = *(float *)((long)puVar143 + 0x1c) - fVar169;
        uVar222 = vcmpss_avx512f(ZEXT416((uint)fVar169),
                                 ZEXT416((uint)*(float *)((long)puVar143 + 0x1c)),1);
        bVar20 = (bool)((byte)uVar222 & 1);
        auVar237._8_8_ = 0;
        auVar237._0_8_ = *(ulong *)((long)puVar143 + 0x14);
        auVar184._8_8_ = 0;
        auVar184._0_8_ = puVar143[1];
        auVar156 = vsubps_avx(auVar237,auVar184);
        auVar179 = vsubps_avx(auVar306,auVar184);
        uVar127 = vcmpps_avx512vl(auVar184,auVar237,1);
        auVar185._4_4_ = local_6c8._16_4_;
        auVar185._0_4_ = local_6c8._12_4_;
        auVar185._8_8_ = 0;
        auVar151 = vdivps_avx512vl(auVar179,auVar156);
        bVar148 = (bool)((byte)uVar127 & 1);
        auVar153._0_4_ = (float)((uint)bVar148 * auVar151._0_4_ | (uint)!bVar148 * auVar179._0_4_);
        bVar148 = (bool)((byte)(uVar127 >> 1) & 1);
        auVar153._4_4_ = (uint)bVar148 * auVar151._4_4_ | (uint)!bVar148 * auVar179._4_4_;
        bVar148 = (bool)((byte)(uVar127 >> 2) & 1);
        auVar153._8_4_ = (uint)bVar148 * auVar151._8_4_ | (uint)!bVar148 * auVar179._8_4_;
        bVar148 = (bool)((byte)(uVar127 >> 3) & 1);
        auVar153._12_4_ = (uint)bVar148 * auVar151._12_4_ | (uint)!bVar148 * auVar179._12_4_;
        auVar156 = vdivps_avx(auVar185,auVar156);
        auVar179 = vmovshdup_avx(auVar153);
        local_7e0 = (float)local_6c8._20_4_ / fVar138;
        local_7e8 = vmovlps_avx(auVar156);
        fVar327 = local_7c0._24_4_;
        auVar151 = vmovshdup_avx(auVar156);
        fVar270 = fVar327 * auVar156._0_4_ + auVar153._0_4_;
        fVar293 = fVar327 * auVar151._0_4_ + auVar179._0_4_;
        uVar126 = *(uint *)((long)puVar143 + 0x11c);
        uVar130 = *(uint *)(puVar143 + 0x23);
        uVar127 = CONCAT44(0,uVar130);
        fVar169 = (float)((uint)bVar20 * (int)(((float)local_6c8._8_4_ - fVar169) / fVar138) +
                         (uint)!bVar20 * (int)((float)local_6c8._8_4_ - fVar169)) +
                  fVar327 * local_7e0;
        fVar281 = (float)(int)uVar126;
        local_7d8._0_8_ = uVar127;
        auVar179._0_4_ = (float)(int)(uVar126 - 1);
        auVar179._4_12_ = auVar338;
        auVar314._0_4_ = (float)(int)(uVar130 - 1);
        auVar314._4_12_ = auVar338;
        puVar141 = (uint *)(puVar143 + 0x24);
        local_808 = (undefined1  [8])puVar141;
        auVar156 = vminss_avx(auVar179,ZEXT416((uint)(fVar293 * fVar281)));
        uVar222 = vcmpss_avx512f(ZEXT416((uint)(fVar293 * fVar281)),auVar154,1);
        fVar294 = (float)(int)uVar130;
        fVar129 = (float)(int)(float)((uint)!(bool)((byte)uVar222 & 1) * auVar156._0_4_);
        auVar156 = vminss_avx(auVar314,ZEXT416((uint)(fVar270 * fVar294)));
        uVar222 = vcmpss_avx512f(ZEXT416((uint)(fVar270 * fVar294)),auVar154,1);
        fVar300 = (float)*(int *)(puVar143 + 0x24);
        auVar321._0_4_ = (float)(*(int *)(puVar143 + 0x24) + -1);
        auVar321._4_12_ = auVar338;
        fVar138 = fVar169 * fVar300;
        in_ZMM11 = ZEXT464((uint)fVar138);
        fVar135 = (float)(int)(float)((uint)!(bool)((byte)uVar222 & 1) * auVar156._0_4_);
        auVar156 = vminss_avx(auVar321,ZEXT416((uint)fVar138));
        uVar222 = vcmpss_avx512f(ZEXT416((uint)fVar138),auVar154,1);
        auVar333._16_48_ = in_ZmmResult._16_48_;
        auVar333._0_16_ = auVar156;
        fVar138 = (float)((uint)!(bool)((byte)uVar222 & 1) * auVar156._0_4_);
        in_ZmmResult._4_60_ = auVar333._4_60_;
        in_ZmmResult._0_4_ = fVar138;
        auVar333 = ZEXT464((uint)local_6f8);
        fVar138 = (float)(int)fVar138;
        do {
          iVar149 = (int)lVar140;
          if (iVar149 == 1) {
            local_718._4_4_ = fVar129;
            puVar134 = (uint *)(local_368 + 4);
            puVar142 = (undefined4 *)(local_548.__data + 4);
            pfVar139 = (float *)(local_2e0 + 4);
            pfVar133 = (float *)(local_338 + 4);
            pfVar136 = (float *)((long)&local_7e8 + 4);
            fVar308 = fVar129;
          }
          else if (iVar149 == 0) {
            *(float *)(local_718 + lVar140 * 4) = fVar135;
            puVar134 = (uint *)local_368;
            puVar142 = (undefined4 *)&local_548;
            pfVar139 = (float *)local_2e0;
            pfVar133 = (float *)local_338;
            pfVar136 = (float *)&local_7e8;
            fVar308 = fVar135;
          }
          else {
            puVar134 = (uint *)(local_368 + 8);
            puVar142 = (undefined4 *)(local_548.__data + 8);
            pfVar139 = local_2d8;
            pfVar133 = afStack_330;
            pfVar136 = &local_7e0;
            *(float *)(local_718 + lVar140 * 4) = fVar138;
            fVar308 = fVar138;
          }
          if ((*pfVar136 == 0.0) && (!NAN(*pfVar136))) {
            pfVar136 = (float *)&local_7e8;
            if ((iVar149 != 0) && (pfVar136 = (float *)((long)&local_7e8 + 4), iVar149 != 1)) {
              pfVar136 = &local_7e0;
            }
            *pfVar136 = 0.0;
          }
          pfVar136 = (float *)&local_7e8;
          if ((iVar149 != 0) && (pfVar136 = (float *)((long)&local_7e8 + 4), iVar149 != 1)) {
            pfVar136 = &local_7e0;
          }
          if (0.0 <= *pfVar136) {
            fVar308 = (float)((int)fVar308 + 1);
            if (iVar149 == 1) {
              *pfVar133 = fVar327 + (fVar308 / fVar281 - fVar293) / local_7e8._4_4_;
              fVar308 = local_7e8._4_4_ * fVar281;
              puVar132 = local_758;
            }
            else if (iVar149 == 0) {
              *pfVar133 = fVar327 + (fVar308 / fVar294 - fVar270) / (float)local_7e8;
              fVar308 = (float)local_7e8 * fVar294;
              puVar132 = local_750;
            }
            else {
              *pfVar133 = fVar327 + (fVar308 / fVar300 - fVar169) / local_7e0;
              fVar308 = local_7e0 * fVar300;
              puVar132 = puVar141;
            }
            *puVar142 = 1;
            *pfVar139 = 1.0 / fVar308;
            uVar130 = *puVar132;
          }
          else {
            fVar308 = (float)(int)fVar308;
            if (iVar149 == 1) {
              fVar308 = fVar308 / fVar281 - fVar293;
              puVar132 = local_758;
              fVar309 = local_7e8._4_4_;
            }
            else if (iVar149 == 0) {
              fVar308 = fVar308 / fVar294 - fVar270;
              puVar132 = local_750;
              fVar309 = (float)local_7e8;
            }
            else {
              fVar308 = fVar308 / fVar300 - fVar169;
              puVar132 = puVar141;
              fVar309 = local_7e0;
            }
            in_ZMM11 = ZEXT464(0xbf800000);
            *pfVar133 = fVar327 + fVar308 / fVar309;
            uVar12 = *puVar132;
            uVar130 = 0xffffffff;
            *puVar142 = 0xffffffff;
            *pfVar139 = -1.0 / (fVar309 * (float)(int)uVar12);
          }
          lVar140 = lVar140 + 1;
          *puVar134 = uVar130;
        } while (lVar140 != 3);
        auVar157._4_4_ = (float)uStack_784;
        auVar157._0_4_ = local_788;
        auVar157._8_4_ = (float)uStack_780;
        auVar157._12_4_ = (float)uStack_77c;
        auVar299 = ZEXT464((uint)local_668._0_4_);
        local_518._76_4_ = (uint)((ulong)puVar143 >> 0x20) | 0x40000;
        uVar170 = local_518._76_4_;
        local_640 = (long)puVar143 + 0x74U | 0x1000000000000;
        auVar156 = stack0xfffffffffffff858;
        local_518._72_8_ = uVar268;
        while( true ) {
          auVar334 = ZEXT1664(auVar156);
          lVar140 = (long)*(int *)(&DAT_0056d940 +
                                  (ulong)((uint)((float)local_338._4_4_ < afStack_330[0]) |
                                         (uint)((float)local_338._0_4_ < (float)local_338._4_4_) * 4
                                         + (uint)((float)local_338._0_4_ < afStack_330[0]) * 2) * 4)
          ;
          fVar169 = afStack_330[lVar140 + -2];
          uVar4 = *(undefined4 *)
                   (puVar143[0x20] +
                   ((long)(int)((uVar126 * local_718._8_4_ + local_718._4_4_) * (int)uVar127) +
                   (long)(int)local_718._0_4_) * 4);
          auVar74._4_4_ = uVar4;
          auVar74._0_4_ = uVar4;
          auVar74._8_4_ = uVar4;
          auVar74._12_4_ = uVar4;
          auVar151 = vmulps_avx512vl(auVar335._0_16_,auVar74);
          auVar179 = vminss_avx(ZEXT416((uint)fVar169),auVar333._0_16_);
          in_ZMM7 = ZEXT1664(auVar179);
          auVar75._8_4_ = 0x80000000;
          auVar75._0_8_ = 0x8000000080000000;
          auVar75._12_4_ = 0x80000000;
          in_ZmmResult._0_16_ = vxorps_avx512vl(auVar151,auVar75);
          if ((auVar151._0_4_ != 0.0) || (NAN(auVar151._0_4_))) {
            local_738._0_4_ = auVar179._0_4_;
            _local_808 = auVar157;
            local_7d8 = auVar151;
            local_744 = fVar169;
            unique0x1000b5a7 = in_ZmmResult._0_16_;
            while( true ) {
              local_7c0._24_4_ = auVar334._0_4_;
              fVar169 = logf(1.0 - auVar299._0_4_);
              uVar222 = local_268._0_8_;
              in_ZMM7 = ZEXT464((uint)local_738._0_4_);
              uVar127 = (ulong)local_268._0_8_ >> 0x1b;
              local_268._0_8_ = local_268._0_8_ * 0x5851f42d4c957f2d + local_268._8_8_;
              uVar126 = SUB84(uVar222,4) >> 0xd ^ (uint)uVar127;
              bVar128 = SUB81(uVar222,7) >> 3;
              fVar169 = (float)local_7c0._24_4_ - fVar169 / (float)local_7d8._0_4_;
              auVar334 = ZEXT464((uint)fVar169);
              auVar156 = vcvtusi2ss_avx512f(in_ZMM13._0_16_,
                                            uVar126 >> bVar128 | uVar126 << 0x20 - bVar128);
              auVar156 = vminss_avx(ZEXT416((uint)(auVar156._0_4_ * 2.3283064e-10)),
                                    ZEXT416(0x3f7fffff));
              auVar299 = ZEXT1664(auVar156);
              if ((float)local_738._0_4_ <= fVar169) break;
              if (fVar169 < local_6f8) {
                fVar270 = fVar169 - (float)local_7c0._24_4_;
                local_668._0_4_ = auVar156._0_4_;
                register0x00001440 = ZEXT416((uint)fVar169);
                auVar187._0_4_ = fVar270 * (float)auStack_590._8_4_;
                auVar187._4_4_ = fVar270 * fStack_584;
                auVar187._8_4_ = fVar270 * fStack_580;
                auVar187._12_4_ = fVar270 * fStack_57c;
                auVar82._8_4_ = 0x3fb8aa3b;
                auVar82._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar82._12_4_ = 0x3fb8aa3b;
                auVar156 = vmulps_avx512vl(auVar187,auVar82);
                local_558.values = (float  [4])vroundps_avx(auVar156,9);
                auVar156 = vsubps_avx(auVar156,(undefined1  [16])local_558.values);
                auVar238._8_4_ = 0x3da00ac9;
                auVar238._0_8_ = 0x3da00ac93da00ac9;
                auVar238._12_4_ = 0x3da00ac9;
                auVar83._8_4_ = 0x3e679a0b;
                auVar83._0_8_ = 0x3e679a0b3e679a0b;
                auVar83._12_4_ = 0x3e679a0b;
                auVar179 = vfmadd213ps_avx512vl(auVar238,auVar156,auVar83);
                auVar84._8_4_ = 0x3f321004;
                auVar84._0_8_ = 0x3f3210043f321004;
                auVar84._12_4_ = 0x3f321004;
                auVar179 = vfmadd213ps_avx512vl(auVar179,auVar156,auVar84);
                auVar98._4_4_ = uStack_784;
                auVar98._0_4_ = local_788;
                auVar98._8_4_ = uStack_780;
                auVar98._12_4_ = uStack_77c;
                auStack_6f0._8_16_ = vfmadd213ps_fma(auVar179,auVar156,auVar98);
                local_7c0._8_4_ = fVar169 * (float)local_6c8._20_4_ + (float)local_6c8._8_4_;
                auVar269 = (undefined1  [56])0x0;
                auVar239._0_4_ = fVar169 * (float)local_6c8._12_4_ + (float)local_6c8._0_4_;
                auVar239._4_4_ = fVar169 * (float)local_6c8._16_4_ + (float)local_6c8._4_4_;
                auVar239._8_4_ = fVar169 * 0.0 + 0.0;
                auVar239._12_4_ = fVar169 * 0.0 + 0.0;
                auVar225 = ZEXT856(auVar239._8_8_);
                uVar222 = vmovlps_avx(auVar239);
                local_7c0._0_4_ = (undefined4)uVar222;
                local_7c0._4_4_ = (undefined4)((ulong)uVar222 >> 0x20);
                SVar339 = NanoVDBMediumProvider::Density
                                    ((NanoVDBMediumProvider *)*puVar143,(Point3f *)local_7c0,
                                     local_7f8);
                auVar259._0_8_ = SVar339.values.values._8_8_;
                auVar259._8_56_ = auVar225;
                auVar207._0_8_ = SVar339.values.values._0_8_;
                auVar207._8_56_ = auVar269;
                local_568 = auVar207._0_16_;
                _local_578 = auVar259._0_16_;
                SVar339 = NanoVDBMediumProvider::Le
                                    ((NanoVDBMediumProvider *)*puVar143,(Point3f *)local_7c0,
                                     local_7f8);
                auVar260._0_8_ = SVar339.values.values._8_8_;
                auVar260._8_56_ = auVar225;
                auVar208._0_8_ = SVar339.values.values._0_8_;
                auVar208._8_56_ = auVar269;
                auVar278._0_4_ = (int)local_558.values[0];
                auVar278._4_4_ = (int)local_558.values[1];
                auVar278._8_4_ = (int)local_558.values[2];
                auVar278._12_4_ = (int)local_558.values[3];
                auVar298._8_4_ = 0xffffff81;
                auVar298._0_8_ = 0xffffff81ffffff81;
                auVar298._12_4_ = 0xffffff81;
                auVar179 = vpsrld_avx(auStack_6f0._8_16_,0x17);
                auVar156 = vpaddd_avx(auVar278,auVar298);
                auVar156 = vpaddd_avx(auVar156,auVar179);
                auVar85._8_4_ = 0x807fffff;
                auVar85._0_8_ = 0x807fffff807fffff;
                auVar85._12_4_ = 0x807fffff;
                auVar157 = vpandd_avx512vl(auStack_6f0._8_16_,auVar85);
                auVar86._8_4_ = 0x7f;
                auVar86._0_8_ = 0x7f0000007f;
                auVar86._12_4_ = 0x7f;
                uVar127 = vpcmpgtd_avx512vl(auVar156,auVar86);
                uVar127 = uVar127 & 0xf;
                auVar179 = vfmadd231ss_fma(ZEXT416((uint)((float)local_7c0._4_4_ *
                                                         *(float *)((long)puVar143 + 0x7c))),
                                           ZEXT416((uint)local_7c0._0_4_),
                                           ZEXT416(*(uint *)(puVar143 + 0xf)));
                auVar151 = vfmadd231ss_fma(ZEXT416((uint)((float)local_7c0._4_4_ *
                                                         *(float *)((long)puVar143 + 0xac))),
                                           ZEXT416((uint)local_7c0._0_4_),
                                           ZEXT416(*(uint *)(puVar143 + 0x15)));
                auVar154 = vfmadd231ss_fma(ZEXT416((uint)((float)local_7c0._4_4_ *
                                                         *(float *)((long)puVar143 + 0x8c))),
                                           ZEXT416((uint)local_7c0._0_4_),
                                           ZEXT416(*(uint *)(puVar143 + 0x11)));
                auVar285 = vfmadd231ss_fma(ZEXT416((uint)((float)local_7c0._4_4_ *
                                                         *(float *)((long)puVar143 + 0x9c))),
                                           ZEXT416((uint)local_7c0._0_4_),
                                           ZEXT416(*(uint *)(puVar143 + 0x13)));
                uVar131 = vpcmpgtd_avx512vl(auVar156,auVar298);
                uVar131 = uVar131 & 0xf;
                auVar156 = vpslld_avx(auVar156,0x17);
                auVar87._8_4_ = 0x3f800000;
                auVar87._0_8_ = 0x3f8000003f800000;
                auVar87._12_4_ = 0x3f800000;
                auVar153 = vpaddd_avx512vl(auVar156,auVar87);
                auVar156 = vfmadd231ss_fma(auVar179,ZEXT416((uint)local_7c0._8_4_),
                                           ZEXT416(*(uint *)(puVar143 + 0x10)));
                auVar179 = vfmadd231ss_fma(auVar151,ZEXT416((uint)local_7c0._8_4_),
                                           ZEXT416(*(uint *)(puVar143 + 0x16)));
                auVar151 = vfmadd231ss_fma(auVar154,ZEXT416((uint)local_7c0._8_4_),
                                           ZEXT416(*(uint *)(puVar143 + 0x12)));
                auVar154 = vfmadd231ss_fma(auVar285,ZEXT416((uint)local_7c0._8_4_),
                                           ZEXT416(*(uint *)(puVar143 + 0x14)));
                fVar169 = auVar179._0_4_ + *(float *)((long)puVar143 + 0xb4);
                fVar270 = auVar156._0_4_ + *(float *)((long)puVar143 + 0x84);
                fVar293 = auVar151._0_4_ + *(float *)((long)puVar143 + 0x94);
                fVar138 = auVar154._0_4_ + *(float *)((long)puVar143 + 0xa4);
                auVar179 = vpord_avx512vl(auVar153,auVar157);
                auVar151 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                bVar148 = (bool)((byte)uVar127 & 1);
                bVar20 = (bool)((byte)(uVar127 >> 1) & 1);
                bVar17 = (bool)((byte)(uVar127 >> 2) & 1);
                bVar18 = SUB81(uVar127 >> 3,0);
                auVar156 = vunpcklpd_avx(local_568,_local_578);
                local_518._88_4_ = auVar156._0_4_ * (float)local_3a8._0_4_;
                local_518._92_4_ = auVar156._4_4_ * (float)local_3a8._4_4_;
                local_518._96_4_ = auVar156._8_4_ * fStack_3a0;
                local_518._100_4_ = auVar156._12_4_ * fStack_39c;
                local_518._104_4_ = auVar156._0_4_ * local_298;
                local_518._108_4_ = auVar156._4_4_ * fStack_294;
                local_518._112_4_ = auVar156._8_4_ * fStack_290;
                local_518._116_4_ = auVar156._12_4_ * fStack_28c;
                bVar19 = fVar169 == 1.0;
                auStack_480[0]._0_4_ =
                     (float)((uint)bVar148 * auVar151._0_4_ |
                            (uint)!bVar148 * (uint)((byte)uVar131 & 1) * auVar179._0_4_) *
                     (float)local_808._0_4_;
                auStack_480[0]._4_4_ =
                     (float)((uint)bVar20 * auVar151._4_4_ |
                            (uint)!bVar20 * (uint)((byte)(uVar131 >> 1) & 1) * auVar179._4_4_) *
                     (float)local_808._4_4_;
                auStack_480[1]._0_4_ =
                     (float)((uint)bVar17 * auVar151._8_4_ |
                            (uint)!bVar17 * (uint)((byte)(uVar131 >> 2) & 1) * auVar179._8_4_) *
                     (float)uStack_800;
                auStack_480[1]._4_4_ =
                     (float)((uint)bVar18 * auVar151._12_4_ |
                            (uint)!bVar18 * (uint)(byte)(uVar131 >> 3) * auVar179._12_4_) *
                     uStack_800._4_4_;
                fVar129 = fVar293 / fVar169;
                iVar149 = (uint)bVar19 * (int)fVar270 + (uint)!bVar19 * (int)(fVar270 / fVar169);
                iVar150 = (uint)bVar19 * (int)fVar138 + (uint)!bVar19 * (int)(fVar138 / fVar169);
                auVar162._16_48_ = in_ZmmResult._16_48_;
                auVar162._0_16_ = ZEXT416((uint)fVar129);
                in_ZmmResult._4_60_ = auVar162._4_60_;
                in_ZmmResult._0_4_ =
                     (float)((uint)bVar19 * (int)fVar293 + (uint)!bVar19 * (int)fVar129);
                auVar315._4_4_ = iVar149;
                auVar315._0_4_ = iVar149;
                auVar315._8_4_ = iVar149;
                auVar315._12_4_ = iVar149;
                auVar322._4_4_ = in_ZmmResult._0_4_;
                auVar322._0_4_ = in_ZmmResult._0_4_;
                auVar322._8_4_ = in_ZmmResult._0_4_;
                auVar322._12_4_ = in_ZmmResult._0_4_;
                auVar307._4_4_ = iVar150;
                auVar307._0_4_ = iVar150;
                auVar307._8_4_ = iVar150;
                auVar307._12_4_ = iVar150;
                auVar179 = vmovlhps_avx(auVar315,auVar322);
                local_518._40_4_ = 0.0;
                in_ZMM7 = ZEXT464(0) << 0x20;
                auVar331._0_4_ = local_408._12_4_ * local_408._12_4_;
                auVar331._4_4_ = local_408._16_4_ * local_408._16_4_;
                auVar331._8_8_ = 0;
                auVar325._0_8_ = local_408._12_8_ ^ 0x8000000080000000;
                auVar325._8_4_ = 0x80000000;
                auVar325._12_4_ = 0x80000000;
                in_ZMM12 = ZEXT1664(local_7d8);
                auVar156 = vhaddps_avx(auVar331,auVar331);
                local_518._120_8_ = local_7d8._0_8_;
                local_498._0_4_ = local_7d8._8_4_;
                local_498._4_4_ = local_7d8._12_4_;
                local_518._44_4_ = 0.0;
                local_518._48_4_ = 0.0;
                local_518._52_4_ = 0.0;
                local_518._56_4_ = 0.0;
                local_518._0_4_ = auVar179._0_4_;
                local_518._4_4_ = auVar179._4_4_;
                local_518._8_4_ = auVar179._8_4_;
                local_518._12_4_ = auVar179._12_4_;
                uVar222 = vmovlps_avx(auVar307);
                local_518._16_4_ = (undefined4)uVar222;
                local_518._20_4_ = (undefined4)((ulong)uVar222 >> 0x20);
                auVar156 = ZEXT416((uint)(auVar156._0_4_ +
                                         (float)local_408._20_4_ * (float)local_408._20_4_));
                auVar156 = vsqrtss_avx(auVar156,auVar156);
                auVar179 = vmovlhps_avx(auVar208._0_16_,auVar260._0_16_);
                local_518._36_4_ = auVar156._0_4_;
                auVar337._4_4_ = local_518._36_4_;
                auVar337._0_4_ = local_518._36_4_;
                auVar337._8_4_ = local_518._36_4_;
                auVar337._12_4_ = local_518._36_4_;
                in_ZMM11 = ZEXT1664(auVar337);
                local_518._36_4_ = -(float)local_408._20_4_ / (float)local_518._36_4_;
                auVar156 = vdivps_avx(auVar325,auVar337);
                local_518._24_4_ = afStack_3f0[0];
                uVar222 = vmovlps_avx(auVar156);
                local_518._28_4_ = (undefined4)uVar222;
                local_518._32_4_ = (undefined4)((ulong)uVar222 >> 0x20);
                local_518._64_4_ = 0.0;
                local_518._68_4_ = 0.0;
                local_518._72_4_ = SUB84(puVar143,0);
                local_518._80_4_ = (undefined4)local_640;
                local_518._84_4_ = (undefined4)(local_640 >> 0x20);
                uStack_490 = auVar179._0_4_;
                _uStack_48c = auVar179._4_12_;
                local_518._76_4_ = uVar170;
                bVar148 = Li::anon_class_120_15_cd2b6fed::operator()
                                    (&local_638,(MediumSample *)local_518);
                if (!bVar148) goto LAB_003ea4f0;
                local_808._4_4_ = uStack_784;
                local_808._0_4_ = local_788;
                uStack_800._4_4_ = (float)uStack_77c;
                uStack_800._0_4_ = (float)uStack_780;
                auVar299 = ZEXT464((uint)local_668._0_4_);
                auVar334 = ZEXT1664(stack0xfffffffffffff858);
              }
            }
            fVar169 = (float)local_738._0_4_ - (float)local_7c0._24_4_;
            auVar333 = ZEXT464((uint)local_6f8);
            auVar335 = ZEXT1664(local_2a8);
            auVar186._0_4_ = fVar169 * (float)auStack_590._8_4_;
            auVar186._4_4_ = fVar169 * fStack_584;
            auVar186._8_4_ = fVar169 * fStack_580;
            auVar186._12_4_ = fVar169 * fStack_57c;
            fVar169 = local_744;
            auVar156 = _local_808;
          }
          else {
            fVar270 = auVar179._0_4_ - auVar156._0_4_;
            auVar186._0_4_ = fVar270 * in_ZmmResult._0_4_;
            auVar186._4_4_ = fVar270 * in_ZmmResult._4_4_;
            auVar186._8_4_ = fVar270 * in_ZmmResult._8_4_;
            auVar186._12_4_ = fVar270 * in_ZmmResult._12_4_;
            auVar156 = auVar157;
          }
          auVar289._8_4_ = 0xffffff81;
          auVar289._0_8_ = 0xffffff81ffffff81;
          auVar277._8_4_ = 0x3da00ac9;
          auVar277._0_8_ = 0x3da00ac93da00ac9;
          auVar289._12_4_ = 0xffffff81;
          auVar277._12_4_ = 0x3da00ac9;
          auVar76._8_4_ = 0x3fb8aa3b;
          auVar76._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar76._12_4_ = 0x3fb8aa3b;
          auVar151 = vmulps_avx512vl(auVar186,auVar76);
          auVar179 = vroundps_avx(auVar151,9);
          auVar151 = vsubps_avx(auVar151,auVar179);
          auVar77._8_4_ = 0x3e679a0b;
          auVar77._0_8_ = 0x3e679a0b3e679a0b;
          auVar77._12_4_ = 0x3e679a0b;
          auVar154 = vfmadd213ps_avx512vl(auVar277,auVar151,auVar77);
          auVar240._0_4_ = (int)auVar179._0_4_;
          auVar240._4_4_ = (int)auVar179._4_4_;
          auVar240._8_4_ = (int)auVar179._8_4_;
          auVar240._12_4_ = (int)auVar179._12_4_;
          auVar179 = vpaddd_avx(auVar240,auVar289);
          auVar78._8_4_ = 0x3f321004;
          auVar78._0_8_ = 0x3f3210043f321004;
          auVar78._12_4_ = 0x3f321004;
          auVar154 = vfmadd213ps_avx512vl(auVar154,auVar151,auVar78);
          auVar99._4_4_ = uStack_784;
          auVar99._0_4_ = local_788;
          auVar99._8_4_ = uStack_780;
          auVar99._12_4_ = uStack_77c;
          auVar151 = vfmadd213ps_fma(auVar154,auVar151,auVar99);
          auVar154 = vpsrld_avx(auVar151,0x17);
          auVar179 = vpaddd_avx(auVar179,auVar154);
          auVar79._8_4_ = 0x7f;
          auVar79._0_8_ = 0x7f0000007f;
          auVar79._12_4_ = 0x7f;
          uVar127 = vpcmpgtd_avx512vl(auVar179,auVar79);
          uVar127 = uVar127 & 0xf;
          auVar80._8_4_ = 0x807fffff;
          auVar80._0_8_ = 0x807fffff807fffff;
          auVar80._12_4_ = 0x807fffff;
          auVar151 = vpandd_avx512vl(auVar151,auVar80);
          uVar131 = vpcmpgtd_avx512vl(auVar179,auVar289);
          uVar131 = uVar131 & 0xf;
          auVar179 = vpslld_avx(auVar179,0x17);
          auVar81._8_4_ = 0x3f800000;
          auVar81._0_8_ = 0x3f8000003f800000;
          auVar81._12_4_ = 0x3f800000;
          auVar179 = vpaddd_avx512vl(auVar179,auVar81);
          auVar179 = vpord_avx512vl(auVar179,auVar151);
          auVar151 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          bVar148 = (bool)((byte)uVar127 & 1);
          in_ZmmResult._0_4_ =
               (float)((uint)bVar148 * auVar151._0_4_ |
                      (uint)!bVar148 * (uint)((byte)uVar131 & 1) * auVar179._0_4_);
          bVar148 = (bool)((byte)(uVar127 >> 1) & 1);
          in_ZmmResult._4_4_ =
               (float)((uint)bVar148 * auVar151._4_4_ |
                      (uint)!bVar148 * (uint)((byte)(uVar131 >> 1) & 1) * auVar179._4_4_);
          bVar148 = (bool)((byte)(uVar127 >> 2) & 1);
          in_ZmmResult._8_4_ =
               (float)((uint)bVar148 * auVar151._8_4_ |
                      (uint)!bVar148 * (uint)((byte)(uVar131 >> 2) & 1) * auVar179._8_4_);
          bVar148 = SUB81(uVar127 >> 3,0);
          in_ZmmResult._12_4_ =
               (float)((uint)bVar148 * auVar151._12_4_ |
                      (uint)!bVar148 * (uint)(byte)(uVar131 >> 3) * auVar179._12_4_);
          auVar157._0_4_ = in_ZmmResult._0_4_ * auVar156._0_4_;
          auVar157._4_4_ = in_ZmmResult._4_4_ * auVar156._4_4_;
          auVar157._8_4_ = in_ZmmResult._8_4_ * auVar156._8_4_;
          auVar157._12_4_ = in_ZmmResult._12_4_ * auVar156._12_4_;
          ray = local_740;
          if ((auVar333._0_4_ < fVar169) ||
             (iVar149 = *(int *)(local_718 + lVar140 * 4),
             *(int *)(local_718 + lVar140 * 4) = iVar149 + *(int *)((long)&local_548 + lVar140 * 4),
             iVar149 + *(int *)((long)&local_548 + lVar140 * 4) == *(int *)(local_368 + lVar140 * 4)
             )) break;
          auVar156 = in_ZMM7._0_16_;
          afStack_330[lVar140 + -2] = fVar169 + local_2d8[lVar140 + -2];
          uVar127 = (ulong)*local_750;
          uVar126 = *local_758;
        }
      }
      goto LAB_003ea501;
    }
    if ((uVar127 & 0x3000000000000) == 0x2000000000000) {
      auVar102._4_4_ = uStack_6f4;
      auVar102._0_4_ = local_6f8;
      auVar102._8_8_ = auStack_6f0._0_8_;
      local_638.T_hat = &local_768;
      local_638.terminated = &local_80a;
      local_638.uniPathPDF = &local_798;
      local_638.lightPathPDF = &local_6d8;
      local_638.depth = &local_7dc;
      local_408._0_8_ = vmovlps_avx(auVar102);
      local_638.this = (VolPathIntegrator *)local_7c0._16_8_;
      local_638.L = &local_728;
      local_638.rng = (RNG *)local_268;
      local_638.lambda = local_7f8;
      local_408._8_4_ = local_738._0_4_;
      unique0x00106900 = vunpcklpd_avx(stack0xfffffffffffff858,_local_808);
      local_638.sampler = local_770;
      local_638.prevIntrContext = (LightSampleContext *)local_5b8;
      local_638.ray = ray;
      local_638.scattered = &local_809;
      local_638.specularBounce = &local_80c;
      local_638.anyNonSpecularBounces = &local_80b;
      puVar143 = (undefined8 *)(uVar127 & 0xffffffffffff);
      local_7ec = (float)local_7d8._0_4_;
      local_3e8.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
               )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 )TVar13.bits;
      Transform::ApplyInverse
                ((Ray *)local_6c8,(Transform *)(puVar143 + 0xf),(Ray *)local_408,&local_7ec);
      auVar172._4_4_ = local_6c8._16_4_;
      auVar172._0_4_ = local_6c8._12_4_;
      auVar172._8_8_ = 0;
      auVar179 = ZEXT816(0) << 0x40;
      bVar148 = false;
      uVar126 = 0;
      auVar227._0_4_ = (float)local_6c8._12_4_ * (float)local_6c8._12_4_;
      auVar227._4_4_ = (float)local_6c8._16_4_ * (float)local_6c8._16_4_;
      auVar227._8_8_ = 0;
      auVar156 = vhaddps_avx(auVar227,auVar227);
      auVar156 = ZEXT416((uint)(auVar156._0_4_ + (float)local_6c8._20_4_ * (float)local_6c8._20_4_))
      ;
      auVar156 = vsqrtss_avx(auVar156,auVar156);
      fVar169 = auVar156._0_4_;
      auVar333 = ZEXT464((uint)(fVar169 * local_7ec));
      auVar282._4_4_ = fVar169;
      auVar282._0_4_ = fVar169;
      auVar282._8_4_ = fVar169;
      auVar282._12_4_ = fVar169;
      local_6c8._20_4_ = (float)local_6c8._20_4_ / fVar169;
      auVar156 = vdivps_avx(auVar172,auVar282);
      local_7ec = fVar169 * local_7ec;
      uVar222 = vmovlps_avx(auVar156);
      local_6c8._12_4_ = (undefined4)uVar222;
      local_6c8._16_4_ = (undefined4)((ulong)uVar222 >> 0x20);
      auVar151 = vmovshdup_avx(auVar156);
      fVar270 = 1.0 / auVar156._0_4_;
      fVar293 = 1.0 / (float)local_6c8._20_4_;
      fVar169 = 1.0 / auVar151._0_4_;
      auVar269 = (undefined1  [56])0x0;
      do {
        pfVar136 = (float *)local_6c8;
        in_ZMM7 = ZEXT464((uint)(fVar270 * (*(float *)(puVar143 + 1) - (float)local_6c8._0_4_)));
        pfVar139 = (float *)((long)puVar143 + 0x14);
        fVar138 = fVar270;
        if (uVar126 != 0) {
          pfVar136 = (float *)(local_6c8 + 4);
          in_ZMM7 = ZEXT464((uint)(fVar169 *
                                  (*(float *)((long)puVar143 + 0xc) - (float)local_6c8._4_4_)));
          pfVar139 = (float *)(puVar143 + 3);
          fVar138 = fVar169;
          if (uVar126 != 1) {
            pfVar136 = (float *)(local_6c8 + 8);
            in_ZMM7 = ZEXT464((uint)(fVar293 * (*(float *)(puVar143 + 2) - (float)local_6c8._8_4_)))
            ;
            pfVar139 = (float *)((long)puVar143 + 0x1c);
            fVar138 = fVar293;
          }
        }
        auVar156 = ZEXT416((uint)((*pfVar139 - *pfVar136) * fVar138));
        auVar151 = vminss_avx(auVar156,in_ZMM7._0_16_);
        auVar156 = vmaxss_avx(in_ZMM7._0_16_,auVar156);
        auVar179 = vmaxss_avx(auVar151,auVar179);
        auVar156 = vminss_avx(ZEXT416((uint)(auVar156._0_4_ * 1.0000004)),auVar333._0_16_);
        auVar333 = ZEXT1664(auVar156);
        if (auVar156._0_4_ < auVar179._0_4_) {
          auVar157._4_4_ = (float)uStack_784;
          auVar157._0_4_ = local_788;
          auVar157._8_4_ = (float)uStack_780;
          auVar157._12_4_ = (float)uStack_77c;
          if (!bVar148) goto LAB_003ea501;
          break;
        }
        bVar148 = 1 < uVar126;
        uVar126 = uVar126 + 1;
      } while (uVar126 != 3);
      uVar222 = 0;
      _local_808 = ZEXT416(*(uint *)(puVar143 + 0xe));
      unique0x1000b4bf = auVar179;
      local_6f8 = auVar156._0_4_;
      SVar339 = DenselySampledSpectrum::Sample((DenselySampledSpectrum *)(puVar143 + 4),local_7f8);
      auVar253._0_8_ = SVar339.values.values._8_8_;
      auVar253._8_56_ = auVar269;
      local_7d8._8_8_ = uVar222;
      local_7d8._0_8_ = SVar339.values.values._0_8_;
      local_738 = auVar253._0_16_;
      auVar225 = (undefined1  [56])0x0;
      auStack_6f0._8_16_ = ZEXT416(*(uint *)(puVar143 + 0xe));
      SVar339 = DenselySampledSpectrum::Sample((DenselySampledSpectrum *)(puVar143 + 9),local_7f8);
      auVar254._0_8_ = SVar339.values.values._8_8_;
      auVar254._8_56_ = auVar269;
      auVar203._0_8_ = SVar339.values.values._0_8_;
      auVar203._8_56_ = auVar225;
      auVar156 = vmovlhps_avx(auVar203._0_16_,auVar254._0_16_);
      auVar301._4_4_ = local_6c8._4_4_;
      auVar301._0_4_ = local_6c8._0_4_;
      auVar301._8_8_ = 0;
      local_750 = (uint *)(puVar143 + 0x23);
      auVar154 = ZEXT816(0) << 0x40;
      local_758 = (uint *)((long)puVar143 + 0x11c);
      puVar141 = (uint *)(puVar143 + 0x24);
      lVar140 = 0;
      auVar179 = vunpcklpd_avx(local_7d8,local_738);
      local_7d8._0_8_ = puVar141;
      local_3a8._0_4_ = (float)local_808._0_4_ * auVar179._0_4_;
      local_3a8._4_4_ = (float)local_808._0_4_ * auVar179._4_4_;
      fStack_3a0 = (float)local_808._0_4_ * auVar179._8_4_;
      fStack_39c = (float)local_808._0_4_ * auVar179._12_4_;
      local_298 = (float)auStack_6f0._8_4_ * auVar156._0_4_;
      fStack_294 = (float)auStack_6f0._8_4_ * auVar156._4_4_;
      fStack_290 = (float)auStack_6f0._8_4_ * auVar156._8_4_;
      fStack_28c = (float)auStack_6f0._8_4_ * auVar156._12_4_;
      local_2a8._0_4_ = local_298 + (float)local_3a8._0_4_;
      local_2a8._4_4_ = fStack_294 + (float)local_3a8._4_4_;
      local_2a8._8_4_ = fStack_290 + fStack_3a0;
      local_2a8._12_4_ = fStack_28c + fStack_39c;
      auVar335 = ZEXT1664(local_2a8);
      fVar169 = *(float *)(puVar143 + 2);
      fVar138 = *(float *)((long)puVar143 + 0x1c) - fVar169;
      uVar222 = vcmpss_avx512f(ZEXT416((uint)fVar169),
                               ZEXT416((uint)*(float *)((long)puVar143 + 0x1c)),1);
      bVar20 = (bool)((byte)uVar222 & 1);
      auVar230._8_8_ = 0;
      auVar230._0_8_ = *(ulong *)((long)puVar143 + 0x14);
      auVar175._8_8_ = 0;
      auVar175._0_8_ = puVar143[1];
      auVar156 = vsubps_avx(auVar230,auVar175);
      auVar179 = vsubps_avx(auVar301,auVar175);
      uVar127 = vcmpps_avx512vl(auVar175,auVar230,1);
      auVar176._4_4_ = local_6c8._16_4_;
      auVar176._0_4_ = local_6c8._12_4_;
      auVar176._8_8_ = 0;
      auVar151 = vdivps_avx512vl(auVar179,auVar156);
      bVar148 = (bool)((byte)uVar127 & 1);
      auVar152._0_4_ = (float)((uint)bVar148 * auVar151._0_4_ | (uint)!bVar148 * auVar179._0_4_);
      bVar148 = (bool)((byte)(uVar127 >> 1) & 1);
      auVar152._4_4_ = (uint)bVar148 * auVar151._4_4_ | (uint)!bVar148 * auVar179._4_4_;
      bVar148 = (bool)((byte)(uVar127 >> 2) & 1);
      auVar152._8_4_ = (uint)bVar148 * auVar151._8_4_ | (uint)!bVar148 * auVar179._8_4_;
      bVar148 = (bool)((byte)(uVar127 >> 3) & 1);
      auVar152._12_4_ = (uint)bVar148 * auVar151._12_4_ | (uint)!bVar148 * auVar179._12_4_;
      auVar156 = vdivps_avx(auVar176,auVar156);
      auVar179 = vmovshdup_avx(auVar152);
      local_7e0 = (float)local_6c8._20_4_ / fVar138;
      local_7e8 = vmovlps_avx(auVar156);
      fVar327 = local_7c0._24_4_;
      auVar151 = vmovshdup_avx(auVar156);
      fVar270 = fVar327 * auVar156._0_4_ + auVar152._0_4_;
      fVar293 = fVar327 * auVar151._0_4_ + auVar179._0_4_;
      uVar126 = *(uint *)((long)puVar143 + 0x11c);
      uVar130 = *(uint *)(puVar143 + 0x23);
      uVar127 = CONCAT44(0,uVar130);
      fVar169 = (float)((uint)bVar20 * (int)(((float)local_6c8._8_4_ - fVar169) / fVar138) +
                       (uint)!bVar20 * (int)((float)local_6c8._8_4_ - fVar169)) +
                fVar327 * local_7e0;
      fVar281 = (float)(int)uVar126;
      auVar338 = in_ZMM11._4_12_;
      local_738._0_8_ = uVar127;
      auVar302._0_4_ = (float)(int)(uVar126 - 1);
      auVar302._4_12_ = auVar338;
      auVar310._0_4_ = (float)(int)(uVar130 - 1);
      auVar310._4_12_ = auVar338;
      auVar156 = vminss_avx(auVar302,ZEXT416((uint)(fVar293 * fVar281)));
      uVar222 = vcmpss_avx512f(ZEXT416((uint)(fVar293 * fVar281)),auVar154,1);
      fVar294 = (float)(int)uVar130;
      fVar129 = (float)(int)(float)((uint)!(bool)((byte)uVar222 & 1) * auVar156._0_4_);
      auVar156 = vminss_avx(auVar310,ZEXT416((uint)(fVar270 * fVar294)));
      uVar222 = vcmpss_avx512f(ZEXT416((uint)(fVar270 * fVar294)),auVar154,1);
      fVar300 = (float)*(int *)(puVar143 + 0x24);
      auVar317._0_4_ = (float)(*(int *)(puVar143 + 0x24) + -1);
      auVar317._4_12_ = auVar338;
      local_808._0_4_ = fVar129;
      fVar135 = (float)(int)(float)((uint)!(bool)((byte)uVar222 & 1) * auVar156._0_4_);
      auVar156 = vminss_avx(auVar317,ZEXT416((uint)(fVar169 * fVar300)));
      uVar222 = vcmpss_avx512f(ZEXT416((uint)(fVar169 * fVar300)),auVar154,1);
      auVar158._16_48_ = in_ZmmResult._16_48_;
      auVar158._0_16_ = auVar156;
      fVar138 = (float)((uint)!(bool)((byte)uVar222 & 1) * auVar156._0_4_);
      in_ZmmResult._4_60_ = auVar158._4_60_;
      in_ZmmResult._0_4_ = fVar138;
      auVar333 = ZEXT464((uint)local_6f8);
      fVar138 = (float)(int)fVar138;
      do {
        iVar149 = (int)lVar140;
        if (iVar149 == 1) {
          puVar134 = (uint *)(local_368 + 4);
          puVar142 = (undefined4 *)(local_548.__data + 4);
          pfVar139 = (float *)(local_2e0 + 4);
          pfVar133 = (float *)(local_338 + 4);
          pfVar136 = (float *)((long)&local_7e8 + 4);
          local_718._4_4_ = fVar129;
          fVar308 = fVar129;
        }
        else if (iVar149 == 0) {
          *(float *)(local_718 + lVar140 * 4) = fVar135;
          puVar134 = (uint *)local_368;
          puVar142 = (undefined4 *)&local_548;
          pfVar139 = (float *)local_2e0;
          pfVar133 = (float *)local_338;
          pfVar136 = (float *)&local_7e8;
          fVar308 = fVar135;
        }
        else {
          puVar134 = (uint *)(local_368 + 8);
          puVar142 = (undefined4 *)(local_548.__data + 8);
          pfVar139 = local_2d8;
          pfVar133 = afStack_330;
          pfVar136 = &local_7e0;
          *(float *)(local_718 + lVar140 * 4) = fVar138;
          fVar308 = fVar138;
        }
        if ((*pfVar136 == 0.0) && (!NAN(*pfVar136))) {
          pfVar136 = (float *)&local_7e8;
          if ((iVar149 != 0) && (pfVar136 = (float *)((long)&local_7e8 + 4), iVar149 != 1)) {
            pfVar136 = &local_7e0;
          }
          *pfVar136 = 0.0;
        }
        pfVar136 = (float *)&local_7e8;
        if ((iVar149 != 0) && (pfVar136 = (float *)((long)&local_7e8 + 4), iVar149 != 1)) {
          pfVar136 = &local_7e0;
        }
        if (0.0 <= *pfVar136) {
          fVar308 = (float)((int)fVar308 + 1);
          if (iVar149 == 1) {
            *pfVar133 = fVar327 + (fVar308 / fVar281 - fVar293) / local_7e8._4_4_;
            fVar308 = local_7e8._4_4_ * fVar281;
            puVar132 = local_758;
          }
          else if (iVar149 == 0) {
            *pfVar133 = fVar327 + (fVar308 / fVar294 - fVar270) / (float)local_7e8;
            fVar308 = (float)local_7e8 * fVar294;
            puVar132 = local_750;
          }
          else {
            *pfVar133 = fVar327 + (fVar308 / fVar300 - fVar169) / local_7e0;
            fVar308 = local_7e0 * fVar300;
            puVar132 = puVar141;
          }
          *puVar142 = 1;
          *pfVar139 = 1.0 / fVar308;
          uVar130 = *puVar132;
        }
        else {
          fVar308 = (float)(int)fVar308;
          if (iVar149 == 1) {
            fVar308 = fVar308 / fVar281 - fVar293;
            puVar132 = local_758;
            fVar309 = local_7e8._4_4_;
          }
          else if (iVar149 == 0) {
            fVar308 = fVar308 / fVar294 - fVar270;
            puVar132 = local_750;
            fVar309 = (float)local_7e8;
          }
          else {
            fVar308 = fVar308 / fVar300 - fVar169;
            puVar132 = puVar141;
            fVar309 = local_7e0;
          }
          in_ZMM11 = ZEXT464(0xbf800000);
          *pfVar133 = fVar327 + fVar308 / fVar309;
          uVar130 = 0xffffffff;
          uVar12 = *puVar132;
          *puVar142 = 0xffffffff;
          *pfVar139 = -1.0 / (fVar309 * (float)(int)uVar12);
        }
        lVar140 = lVar140 + 1;
        *puVar134 = uVar130;
      } while (lVar140 != 3);
      auVar157._4_4_ = (float)uStack_784;
      auVar157._0_4_ = local_788;
      auVar157._8_4_ = (float)uStack_780;
      auVar157._12_4_ = (float)uStack_77c;
      auVar299 = ZEXT464((uint)local_668._0_4_);
      local_640 = (long)puVar143 + 0x74U | 0x1000000000000;
      auVar156 = stack0xfffffffffffff858;
      while( true ) {
        auVar334 = ZEXT1664(auVar156);
        lVar140 = (long)*(int *)(&DAT_0056d940 +
                                (ulong)((uint)((float)local_338._4_4_ < afStack_330[0]) |
                                       (uint)((float)local_338._0_4_ < (float)local_338._4_4_) * 4 +
                                       (uint)((float)local_338._0_4_ < afStack_330[0]) * 2) * 4);
        fVar169 = afStack_330[lVar140 + -2];
        uVar3 = *(undefined4 *)
                 (puVar143[0x20] +
                 ((long)(int)((uVar126 * local_718._8_4_ + local_718._4_4_) * (int)uVar127) +
                 (long)(int)local_718._0_4_) * 4);
        auVar21._4_4_ = uVar3;
        auVar21._0_4_ = uVar3;
        auVar21._8_4_ = uVar3;
        auVar21._12_4_ = uVar3;
        auVar151 = vmulps_avx512vl(auVar335._0_16_,auVar21);
        auVar179 = vminss_avx(ZEXT416((uint)fVar169),auVar333._0_16_);
        in_ZMM7 = ZEXT1664(auVar179);
        auVar22._8_4_ = 0x80000000;
        auVar22._0_8_ = 0x8000000080000000;
        auVar22._12_4_ = 0x80000000;
        in_ZmmResult._0_16_ = vxorps_avx512vl(auVar151,auVar22);
        if ((auVar151._0_4_ != 0.0) || (NAN(auVar151._0_4_))) {
          local_738._0_4_ = auVar179._0_4_;
          _local_808 = auVar157;
          local_7d8 = auVar151;
          local_744 = fVar169;
          unique0x1000b587 = in_ZmmResult._0_16_;
          while( true ) {
            local_7c0._24_4_ = auVar334._0_4_;
            fVar169 = logf(1.0 - auVar299._0_4_);
            uVar222 = local_268._0_8_;
            in_ZMM7 = ZEXT464((uint)local_738._0_4_);
            uVar127 = (ulong)local_268._0_8_ >> 0x1b;
            local_268._0_8_ = local_268._0_8_ * 0x5851f42d4c957f2d + local_268._8_8_;
            uVar126 = SUB84(uVar222,4) >> 0xd ^ (uint)uVar127;
            bVar128 = SUB81(uVar222,7) >> 3;
            fVar169 = (float)local_7c0._24_4_ - fVar169 / (float)local_7d8._0_4_;
            auVar334 = ZEXT464((uint)fVar169);
            auVar156 = vcvtusi2ss_avx512f(in_ZMM13._0_16_,
                                          uVar126 >> bVar128 | uVar126 << 0x20 - bVar128);
            auVar156 = vminss_avx(ZEXT416((uint)(auVar156._0_4_ * 2.3283064e-10)),
                                  ZEXT416(0x3f7fffff));
            auVar299 = ZEXT1664(auVar156);
            if ((float)local_738._0_4_ <= fVar169) break;
            if (fVar169 < local_6f8) {
              fVar270 = fVar169 - (float)local_7c0._24_4_;
              local_668._0_4_ = auVar156._0_4_;
              register0x00001440 = ZEXT416((uint)fVar169);
              auVar178._0_4_ = fVar270 * (float)auStack_590._8_4_;
              auVar178._4_4_ = fVar270 * fStack_584;
              auVar178._8_4_ = fVar270 * fStack_580;
              auVar178._12_4_ = fVar270 * fStack_57c;
              auVar34._8_4_ = 0x3fb8aa3b;
              auVar34._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar34._12_4_ = 0x3fb8aa3b;
              auVar156 = vmulps_avx512vl(auVar178,auVar34);
              local_558.values = (float  [4])vroundps_avx(auVar156,9);
              auVar156 = vsubps_avx(auVar156,(undefined1  [16])local_558.values);
              auVar231._8_4_ = 0x3da00ac9;
              auVar231._0_8_ = 0x3da00ac93da00ac9;
              auVar231._12_4_ = 0x3da00ac9;
              auVar35._8_4_ = 0x3e679a0b;
              auVar35._0_8_ = 0x3e679a0b3e679a0b;
              auVar35._12_4_ = 0x3e679a0b;
              auVar179 = vfmadd213ps_avx512vl(auVar231,auVar156,auVar35);
              auVar36._8_4_ = 0x3f321004;
              auVar36._0_8_ = 0x3f3210043f321004;
              auVar36._12_4_ = 0x3f321004;
              auVar179 = vfmadd213ps_avx512vl(auVar179,auVar156,auVar36);
              auVar94._4_4_ = uStack_784;
              auVar94._0_4_ = local_788;
              auVar94._8_4_ = uStack_780;
              auVar94._12_4_ = uStack_77c;
              auStack_6f0._8_16_ = vfmadd213ps_fma(auVar179,auVar156,auVar94);
              local_7c0._8_4_ = fVar169 * (float)local_6c8._20_4_ + (float)local_6c8._8_4_;
              uVar223 = 0;
              auVar232._0_4_ = fVar169 * (float)local_6c8._12_4_ + (float)local_6c8._0_4_;
              auVar232._4_4_ = fVar169 * (float)local_6c8._16_4_ + (float)local_6c8._4_4_;
              auVar232._8_4_ = fVar169 * 0.0 + 0.0;
              auVar232._12_4_ = fVar169 * 0.0 + 0.0;
              uVar268 = auVar232._8_8_;
              uVar222 = vmovlps_avx(auVar232);
              local_7c0._0_4_ = (undefined4)uVar222;
              local_7c0._4_4_ = (undefined4)((ulong)uVar222 >> 0x20);
              SVar339 = UniformGridMediumProvider::Density
                                  ((UniformGridMediumProvider *)*puVar143,(Point3f *)local_7c0,
                                   local_7f8);
              local_568._8_8_ = uVar223;
              local_568._0_8_ = SVar339.values.values._0_8_;
              uStack_570 = uVar268;
              local_578 = (undefined1  [8])SVar339.values.values._8_8_;
              p.super_Tuple3<pbrt::Point3,_float>.y = (float)local_7c0._4_4_;
              p.super_Tuple3<pbrt::Point3,_float>.x = (float)local_7c0._0_4_;
              p.super_Tuple3<pbrt::Point3,_float>.z = (float)local_7c0._8_4_;
              auVar225 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
              auVar269 = ZEXT856(0);
              SVar339 = UniformGridMediumProvider::Le
                                  ((UniformGridMediumProvider *)*puVar143,p,local_7f8);
              auVar255._0_8_ = SVar339.values.values._8_8_;
              auVar255._8_56_ = auVar225;
              auVar204._0_8_ = SVar339.values.values._0_8_;
              auVar204._8_56_ = auVar269;
              auVar274._0_4_ = (int)local_558.values[0];
              auVar274._4_4_ = (int)local_558.values[1];
              auVar274._8_4_ = (int)local_558.values[2];
              auVar274._12_4_ = (int)local_558.values[3];
              auVar296._8_4_ = 0xffffff81;
              auVar296._0_8_ = 0xffffff81ffffff81;
              auVar296._12_4_ = 0xffffff81;
              auVar179 = vpsrld_avx(auStack_6f0._8_16_,0x17);
              auVar156 = vpaddd_avx(auVar274,auVar296);
              auVar156 = vpaddd_avx(auVar156,auVar179);
              auVar37._8_4_ = 0x807fffff;
              auVar37._0_8_ = 0x807fffff807fffff;
              auVar37._12_4_ = 0x807fffff;
              auVar157 = vpandd_avx512vl(auStack_6f0._8_16_,auVar37);
              auVar38._8_4_ = 0x7f;
              auVar38._0_8_ = 0x7f0000007f;
              auVar38._12_4_ = 0x7f;
              uVar127 = vpcmpgtd_avx512vl(auVar156,auVar38);
              uVar127 = uVar127 & 0xf;
              auVar179 = vfmadd231ss_fma(ZEXT416((uint)((float)local_7c0._4_4_ *
                                                       *(float *)((long)puVar143 + 0x7c))),
                                         ZEXT416((uint)local_7c0._0_4_),
                                         ZEXT416(*(uint *)(puVar143 + 0xf)));
              auVar151 = vfmadd231ss_fma(ZEXT416((uint)((float)local_7c0._4_4_ *
                                                       *(float *)((long)puVar143 + 0xac))),
                                         ZEXT416((uint)local_7c0._0_4_),
                                         ZEXT416(*(uint *)(puVar143 + 0x15)));
              auVar154 = vfmadd231ss_fma(ZEXT416((uint)((float)local_7c0._4_4_ *
                                                       *(float *)((long)puVar143 + 0x8c))),
                                         ZEXT416((uint)local_7c0._0_4_),
                                         ZEXT416(*(uint *)(puVar143 + 0x11)));
              auVar285 = vfmadd231ss_fma(ZEXT416((uint)((float)local_7c0._4_4_ *
                                                       *(float *)((long)puVar143 + 0x9c))),
                                         ZEXT416((uint)local_7c0._0_4_),
                                         ZEXT416(*(uint *)(puVar143 + 0x13)));
              uVar131 = vpcmpgtd_avx512vl(auVar156,auVar296);
              uVar131 = uVar131 & 0xf;
              auVar156 = vpslld_avx(auVar156,0x17);
              auVar39._8_4_ = 0x3f800000;
              auVar39._0_8_ = 0x3f8000003f800000;
              auVar39._12_4_ = 0x3f800000;
              auVar153 = vpaddd_avx512vl(auVar156,auVar39);
              auVar156 = vfmadd231ss_fma(auVar179,ZEXT416((uint)local_7c0._8_4_),
                                         ZEXT416(*(uint *)(puVar143 + 0x10)));
              auVar179 = vfmadd231ss_fma(auVar151,ZEXT416((uint)local_7c0._8_4_),
                                         ZEXT416(*(uint *)(puVar143 + 0x16)));
              auVar151 = vfmadd231ss_fma(auVar154,ZEXT416((uint)local_7c0._8_4_),
                                         ZEXT416(*(uint *)(puVar143 + 0x12)));
              auVar154 = vfmadd231ss_fma(auVar285,ZEXT416((uint)local_7c0._8_4_),
                                         ZEXT416(*(uint *)(puVar143 + 0x14)));
              fVar169 = auVar179._0_4_ + *(float *)((long)puVar143 + 0xb4);
              fVar270 = auVar156._0_4_ + *(float *)((long)puVar143 + 0x84);
              fVar293 = auVar151._0_4_ + *(float *)((long)puVar143 + 0x94);
              fVar138 = auVar154._0_4_ + *(float *)((long)puVar143 + 0xa4);
              auVar179 = vpord_avx512vl(auVar153,auVar157);
              auVar151 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              bVar148 = (bool)((byte)uVar127 & 1);
              bVar20 = (bool)((byte)(uVar127 >> 1) & 1);
              bVar17 = (bool)((byte)(uVar127 >> 2) & 1);
              bVar18 = SUB81(uVar127 >> 3,0);
              auVar156 = vunpcklpd_avx(local_568,_local_578);
              local_518._88_4_ = auVar156._0_4_ * (float)local_3a8._0_4_;
              local_518._92_4_ = auVar156._4_4_ * (float)local_3a8._4_4_;
              local_518._96_4_ = auVar156._8_4_ * fStack_3a0;
              local_518._100_4_ = auVar156._12_4_ * fStack_39c;
              local_518._104_4_ = auVar156._0_4_ * local_298;
              local_518._108_4_ = auVar156._4_4_ * fStack_294;
              local_518._112_4_ = auVar156._8_4_ * fStack_290;
              local_518._116_4_ = auVar156._12_4_ * fStack_28c;
              bVar19 = fVar169 == 1.0;
              auStack_480[0]._0_4_ =
                   (float)((uint)bVar148 * auVar151._0_4_ |
                          (uint)!bVar148 * (uint)((byte)uVar131 & 1) * auVar179._0_4_) *
                   (float)local_808._0_4_;
              auStack_480[0]._4_4_ =
                   (float)((uint)bVar20 * auVar151._4_4_ |
                          (uint)!bVar20 * (uint)((byte)(uVar131 >> 1) & 1) * auVar179._4_4_) *
                   (float)local_808._4_4_;
              auStack_480[1]._0_4_ =
                   (float)((uint)bVar17 * auVar151._8_4_ |
                          (uint)!bVar17 * (uint)((byte)(uVar131 >> 2) & 1) * auVar179._8_4_) *
                   (float)uStack_800;
              auStack_480[1]._4_4_ =
                   (float)((uint)bVar18 * auVar151._12_4_ |
                          (uint)!bVar18 * (uint)(byte)(uVar131 >> 3) * auVar179._12_4_) *
                   uStack_800._4_4_;
              fVar129 = fVar293 / fVar169;
              iVar149 = (uint)bVar19 * (int)fVar270 + (uint)!bVar19 * (int)(fVar270 / fVar169);
              iVar150 = (uint)bVar19 * (int)fVar138 + (uint)!bVar19 * (int)(fVar138 / fVar169);
              auVar159._16_48_ = in_ZmmResult._16_48_;
              auVar159._0_16_ = ZEXT416((uint)fVar129);
              in_ZmmResult._4_60_ = auVar159._4_60_;
              in_ZmmResult._0_4_ =
                   (float)((uint)bVar19 * (int)fVar293 + (uint)!bVar19 * (int)fVar129);
              auVar311._4_4_ = iVar149;
              auVar311._0_4_ = iVar149;
              auVar311._8_4_ = iVar149;
              auVar311._12_4_ = iVar149;
              auVar318._4_4_ = in_ZmmResult._0_4_;
              auVar318._0_4_ = in_ZmmResult._0_4_;
              auVar318._8_4_ = in_ZmmResult._0_4_;
              auVar318._12_4_ = in_ZmmResult._0_4_;
              auVar303._4_4_ = iVar150;
              auVar303._0_4_ = iVar150;
              auVar303._8_4_ = iVar150;
              auVar303._12_4_ = iVar150;
              auVar179 = vmovlhps_avx(auVar311,auVar318);
              local_518._40_4_ = 0.0;
              in_ZMM7 = ZEXT464(0) << 0x20;
              auVar328._0_4_ = local_408._12_4_ * local_408._12_4_;
              auVar328._4_4_ = local_408._16_4_ * local_408._16_4_;
              auVar328._8_8_ = 0;
              auVar323._0_8_ = local_408._12_8_ ^ 0x8000000080000000;
              auVar323._8_4_ = 0x80000000;
              auVar323._12_4_ = 0x80000000;
              in_ZMM12 = ZEXT1664(local_7d8);
              auVar156 = vhaddps_avx(auVar328,auVar328);
              local_518._120_8_ = local_7d8._0_8_;
              local_498._0_4_ = local_7d8._8_4_;
              local_498._4_4_ = local_7d8._12_4_;
              local_518._44_4_ = 0.0;
              local_518._48_4_ = 0.0;
              local_518._52_4_ = 0.0;
              local_518._56_4_ = 0.0;
              local_518._0_4_ = auVar179._0_4_;
              local_518._4_4_ = auVar179._4_4_;
              local_518._8_4_ = auVar179._8_4_;
              local_518._12_4_ = auVar179._12_4_;
              uVar222 = vmovlps_avx(auVar303);
              local_518._16_4_ = (undefined4)uVar222;
              local_518._20_4_ = (undefined4)((ulong)uVar222 >> 0x20);
              auVar156 = ZEXT416((uint)(auVar156._0_4_ +
                                       (float)local_408._20_4_ * (float)local_408._20_4_));
              auVar156 = vsqrtss_avx(auVar156,auVar156);
              auVar179 = vmovlhps_avx(auVar204._0_16_,auVar255._0_16_);
              local_518._36_4_ = auVar156._0_4_;
              auVar336._4_4_ = local_518._36_4_;
              auVar336._0_4_ = local_518._36_4_;
              auVar336._8_4_ = local_518._36_4_;
              auVar336._12_4_ = local_518._36_4_;
              in_ZMM11 = ZEXT1664(auVar336);
              local_518._36_4_ = -(float)local_408._20_4_ / (float)local_518._36_4_;
              auVar156 = vdivps_avx(auVar323,auVar336);
              local_518._24_4_ = afStack_3f0[0];
              uVar222 = vmovlps_avx(auVar156);
              local_518._28_4_ = (undefined4)uVar222;
              local_518._32_4_ = (undefined4)((ulong)uVar222 >> 0x20);
              local_518._64_4_ = 0.0;
              local_518._68_4_ = 0.0;
              local_518._80_4_ = (undefined4)local_640;
              local_518._84_4_ = (undefined4)(local_640 >> 0x20);
              uStack_490 = auVar179._0_4_;
              _uStack_48c = auVar179._4_12_;
              local_518._72_4_ = uVar170;
              local_518._76_4_ = uVar4;
              bVar148 = Li::anon_class_120_15_cd2b6fed::operator()
                                  (&local_638,(MediumSample *)local_518);
              if (!bVar148) goto LAB_003ea4f0;
              local_808._4_4_ = uStack_784;
              local_808._0_4_ = local_788;
              uStack_800._4_4_ = (float)uStack_77c;
              uStack_800._0_4_ = (float)uStack_780;
              auVar299 = ZEXT464((uint)local_668._0_4_);
              auVar334 = ZEXT1664(stack0xfffffffffffff858);
            }
          }
          fVar169 = (float)local_738._0_4_ - (float)local_7c0._24_4_;
          auVar333 = ZEXT464((uint)local_6f8);
          auVar335 = ZEXT1664(local_2a8);
          auVar177._0_4_ = fVar169 * (float)auStack_590._8_4_;
          auVar177._4_4_ = fVar169 * fStack_584;
          auVar177._8_4_ = fVar169 * fStack_580;
          auVar177._12_4_ = fVar169 * fStack_57c;
          fVar169 = local_744;
          auVar156 = _local_808;
        }
        else {
          fVar270 = auVar179._0_4_ - auVar156._0_4_;
          auVar177._0_4_ = fVar270 * in_ZmmResult._0_4_;
          auVar177._4_4_ = fVar270 * in_ZmmResult._4_4_;
          auVar177._8_4_ = fVar270 * in_ZmmResult._8_4_;
          auVar177._12_4_ = fVar270 * in_ZmmResult._12_4_;
          auVar156 = auVar157;
        }
        auVar286._8_4_ = 0xffffff81;
        auVar286._0_8_ = 0xffffff81ffffff81;
        auVar273._8_4_ = 0x3da00ac9;
        auVar273._0_8_ = 0x3da00ac93da00ac9;
        auVar286._12_4_ = 0xffffff81;
        auVar273._12_4_ = 0x3da00ac9;
        auVar23._8_4_ = 0x3fb8aa3b;
        auVar23._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar23._12_4_ = 0x3fb8aa3b;
        auVar151 = vmulps_avx512vl(auVar177,auVar23);
        auVar179 = vroundps_avx(auVar151,9);
        auVar151 = vsubps_avx(auVar151,auVar179);
        auVar24._8_4_ = 0x3e679a0b;
        auVar24._0_8_ = 0x3e679a0b3e679a0b;
        auVar24._12_4_ = 0x3e679a0b;
        auVar154 = vfmadd213ps_avx512vl(auVar273,auVar151,auVar24);
        auVar233._0_4_ = (int)auVar179._0_4_;
        auVar233._4_4_ = (int)auVar179._4_4_;
        auVar233._8_4_ = (int)auVar179._8_4_;
        auVar233._12_4_ = (int)auVar179._12_4_;
        auVar179 = vpaddd_avx(auVar233,auVar286);
        auVar25._8_4_ = 0x3f321004;
        auVar25._0_8_ = 0x3f3210043f321004;
        auVar25._12_4_ = 0x3f321004;
        auVar154 = vfmadd213ps_avx512vl(auVar154,auVar151,auVar25);
        auVar95._4_4_ = uStack_784;
        auVar95._0_4_ = local_788;
        auVar95._8_4_ = uStack_780;
        auVar95._12_4_ = uStack_77c;
        auVar151 = vfmadd213ps_fma(auVar154,auVar151,auVar95);
        auVar154 = vpsrld_avx(auVar151,0x17);
        auVar179 = vpaddd_avx(auVar179,auVar154);
        auVar26._8_4_ = 0x7f;
        auVar26._0_8_ = 0x7f0000007f;
        auVar26._12_4_ = 0x7f;
        uVar127 = vpcmpgtd_avx512vl(auVar179,auVar26);
        uVar127 = uVar127 & 0xf;
        auVar27._8_4_ = 0x807fffff;
        auVar27._0_8_ = 0x807fffff807fffff;
        auVar27._12_4_ = 0x807fffff;
        auVar151 = vpandd_avx512vl(auVar151,auVar27);
        uVar131 = vpcmpgtd_avx512vl(auVar179,auVar286);
        uVar131 = uVar131 & 0xf;
        auVar179 = vpslld_avx(auVar179,0x17);
        auVar28._8_4_ = 0x3f800000;
        auVar28._0_8_ = 0x3f8000003f800000;
        auVar28._12_4_ = 0x3f800000;
        auVar179 = vpaddd_avx512vl(auVar179,auVar28);
        auVar179 = vpord_avx512vl(auVar179,auVar151);
        auVar151 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        bVar148 = (bool)((byte)uVar127 & 1);
        in_ZmmResult._0_4_ =
             (float)((uint)bVar148 * auVar151._0_4_ |
                    (uint)!bVar148 * (uint)((byte)uVar131 & 1) * auVar179._0_4_);
        bVar148 = (bool)((byte)(uVar127 >> 1) & 1);
        in_ZmmResult._4_4_ =
             (float)((uint)bVar148 * auVar151._4_4_ |
                    (uint)!bVar148 * (uint)((byte)(uVar131 >> 1) & 1) * auVar179._4_4_);
        bVar148 = (bool)((byte)(uVar127 >> 2) & 1);
        in_ZmmResult._8_4_ =
             (float)((uint)bVar148 * auVar151._8_4_ |
                    (uint)!bVar148 * (uint)((byte)(uVar131 >> 2) & 1) * auVar179._8_4_);
        bVar148 = SUB81(uVar127 >> 3,0);
        in_ZmmResult._12_4_ =
             (float)((uint)bVar148 * auVar151._12_4_ |
                    (uint)!bVar148 * (uint)(byte)(uVar131 >> 3) * auVar179._12_4_);
        auVar157._0_4_ = in_ZmmResult._0_4_ * auVar156._0_4_;
        auVar157._4_4_ = in_ZmmResult._4_4_ * auVar156._4_4_;
        auVar157._8_4_ = in_ZmmResult._8_4_ * auVar156._8_4_;
        auVar157._12_4_ = in_ZmmResult._12_4_ * auVar156._12_4_;
        ray = local_740;
        if ((auVar333._0_4_ < fVar169) ||
           (iVar149 = *(int *)(local_718 + lVar140 * 4),
           *(int *)(local_718 + lVar140 * 4) = iVar149 + *(int *)((long)&local_548 + lVar140 * 4),
           iVar149 + *(int *)((long)&local_548 + lVar140 * 4) == *(int *)(local_368 + lVar140 * 4)))
        break;
        auVar156 = in_ZMM7._0_16_;
        afStack_330[lVar140 + -2] = fVar169 + local_2d8[lVar140 + -2];
        uVar127 = (ulong)*local_750;
        uVar126 = *local_758;
      }
      goto LAB_003ea501;
    }
    local_638.T_hat = &local_768;
    local_638.terminated = &local_80a;
    local_638.uniPathPDF = &local_798;
    local_638.lightPathPDF = &local_6d8;
    this_00 = (DenselySampledSpectrum *)(uVar127 & 0xffffffffffff);
    local_638.depth = &local_7dc;
    local_638.L = &local_728;
    local_638.this = (VolPathIntegrator *)local_7c0._16_8_;
    local_638.rng = (RNG *)local_268;
    local_638.lambda = local_7f8;
    local_638.prevIntrContext = (LightSampleContext *)local_5b8;
    local_638.sampler = local_770;
    local_638.scattered = &local_809;
    local_638.ray = ray;
    local_638.specularBounce = &local_80c;
    local_638.anyNonSpecularBounces = &local_80b;
    uVar222 = 0;
    auStack_6f0._8_16_ = ZEXT416((uint)this_00[3].lambda_min);
    SVar339 = DenselySampledSpectrum::Sample(this_00,local_7f8);
    auVar251._0_8_ = SVar339.values.values._8_8_;
    auVar251._8_56_ = auVar269;
    local_558.values[2] = (float)(int)uVar222;
    local_558.values[3] = (float)(int)((ulong)uVar222 >> 0x20);
    local_558.values[0] = (float)(int)SVar339.values.values._0_8_;
    local_558.values[1] = (float)(int)((ulong)SVar339.values.values._0_8_ >> 0x20);
    local_568 = auVar251._0_16_;
    auVar225 = (undefined1  [56])0x0;
    _local_578 = ZEXT416((uint)this_00[3].lambda_min);
    SVar339 = DenselySampledSpectrum::Sample(this_00 + 1,local_7f8);
    auVar252._0_8_ = SVar339.values.values._8_8_;
    auVar252._8_56_ = auVar269;
    auVar202._0_8_ = SVar339.values.values._0_8_;
    auVar202._8_56_ = auVar225;
    auVar156 = vunpcklpd_avx((undefined1  [16])local_558.values,local_568);
    auVar295._0_4_ = (float)auStack_6f0._8_4_ * auVar156._0_4_;
    auVar295._4_4_ = (float)auStack_6f0._8_4_ * auVar156._4_4_;
    auVar295._8_4_ = (float)auStack_6f0._8_4_ * auVar156._8_4_;
    auVar295._12_4_ = (float)auStack_6f0._8_4_ * auVar156._12_4_;
    auVar271._0_4_ = (float)local_7c0._24_4_ * (float)local_7c0._24_4_;
    auVar271._4_4_ = fStack_7a4 * fStack_7a4;
    auVar271._8_4_ = fStack_7a0 * fStack_7a0;
    auVar271._12_4_ = fStack_79c * fStack_79c;
    auVar156 = vhaddps_avx(auVar271,auVar271);
    auVar156 = ZEXT416((uint)((float)local_808._0_4_ * (float)local_808._0_4_ + auVar156._0_4_));
    auVar179 = vsqrtss_avx(auVar156,auVar156);
    auVar156 = vmovlhps_avx(auVar202._0_16_,auVar252._0_16_);
    fVar169 = auVar179._0_4_ * (float)local_7d8._0_4_;
    fVar270 = (float)local_578._0_4_ * auVar156._0_4_;
    fVar293 = (float)local_578._0_4_ * auVar156._4_4_;
    fVar138 = (float)local_578._0_4_ * auVar156._8_4_;
    fVar129 = (float)local_578._0_4_ * auVar156._12_4_;
    fVar135 = fVar270 + auVar295._0_4_;
    fVar281 = fVar293 + auVar295._4_4_;
    fVar294 = fVar138 + auVar295._8_4_;
    fVar300 = fVar129 + auVar295._12_4_;
    bVar148 = ABS(fVar169) == INFINITY;
    uVar126 = (uint)bVar148 * 0x7f7fffff + (uint)!bVar148 * (int)fVar169;
    if ((fVar135 != 0.0) || (NAN(fVar135))) {
      local_558.values[1] = fVar293;
      local_558.values[0] = fVar270;
      local_558.values[2] = fVar138;
      local_558.values[3] = fVar129;
      local_7d8 = ZEXT416(uVar126);
      fVar169 = 1.0 - (float)local_668._0_4_;
      _local_668 = ZEXT1632(CONCAT412(fVar300,CONCAT48(fVar294,CONCAT44(fVar281,fVar135))));
      in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
      in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
      in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
      in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
      auStack_6f0._8_16_ = auVar295;
      local_568 = auVar179;
      fVar169 = logf(fVar169);
      fVar169 = -fVar169 / (float)local_668._0_4_;
      if ((float)local_7d8._0_4_ <= fVar169) {
        auVar292._8_4_ = 0xffffff81;
        auVar292._0_8_ = 0xffffff81ffffff81;
        auVar292._12_4_ = 0xffffff81;
        local_88._0_4_ = (float)local_668._0_4_ * -(float)local_7d8._0_4_;
        local_88._4_4_ = (float)local_668._4_4_ * -(float)local_7d8._0_4_;
        local_88._8_4_ = fStack_660 * -(float)local_7d8._0_4_;
        local_88._12_4_ = fStack_65c * -(float)local_7d8._0_4_;
        auVar279._8_4_ = 0x3da00ac9;
        auVar279._0_8_ = 0x3da00ac93da00ac9;
        auVar279._12_4_ = 0x3da00ac9;
        auVar53._8_4_ = 0x3fb8aa3b;
        auVar53._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar53._12_4_ = 0x3fb8aa3b;
        auVar179 = vmulps_avx512vl(local_88,auVar53);
        auVar156 = vroundps_avx(auVar179,9);
        auVar179 = vsubps_avx(auVar179,auVar156);
        auVar54._8_4_ = 0x3e679a0b;
        auVar54._0_8_ = 0x3e679a0b3e679a0b;
        auVar54._12_4_ = 0x3e679a0b;
        auVar151 = vfmadd213ps_avx512vl(auVar279,auVar179,auVar54);
        auVar244._0_4_ = (int)auVar156._0_4_;
        auVar244._4_4_ = (int)auVar156._4_4_;
        auVar244._8_4_ = (int)auVar156._8_4_;
        auVar244._12_4_ = (int)auVar156._12_4_;
        auVar156 = vpaddd_avx(auVar244,auVar292);
        auVar55._8_4_ = 0x3f321004;
        auVar55._0_8_ = 0x3f3210043f321004;
        auVar55._12_4_ = 0x3f321004;
        auVar151 = vfmadd213ps_avx512vl(auVar151,auVar179,auVar55);
        auVar101._4_4_ = uStack_784;
        auVar101._0_4_ = local_788;
        auVar101._8_4_ = uStack_780;
        auVar101._12_4_ = uStack_77c;
        auVar179 = vfmadd213ps_fma(auVar151,auVar179,auVar101);
        auVar151 = vpsrld_avx(auVar179,0x17);
        auVar156 = vpaddd_avx(auVar156,auVar151);
        auVar56._8_4_ = 0x7f;
        auVar56._0_8_ = 0x7f0000007f;
        auVar56._12_4_ = 0x7f;
        uVar127 = vpcmpgtd_avx512vl(auVar156,auVar56);
        uVar127 = uVar127 & 0xf;
        auVar57._8_4_ = 0x807fffff;
        auVar57._0_8_ = 0x807fffff807fffff;
        auVar57._12_4_ = 0x807fffff;
        auVar179 = vpandd_avx512vl(auVar179,auVar57);
        uVar131 = vpcmpgtd_avx512vl(auVar156,auVar292);
        uVar131 = uVar131 & 0xf;
        auVar156 = vpslld_avx(auVar156,0x17);
        auVar58._8_4_ = 0x3f800000;
        auVar58._0_8_ = 0x3f8000003f800000;
        auVar58._12_4_ = 0x3f800000;
        auVar156 = vpaddd_avx512vl(auVar156,auVar58);
        auVar156 = vpord_avx512vl(auVar156,auVar179);
        auVar179 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        bVar148 = (bool)((byte)uVar127 & 1);
        auVar157._0_4_ =
             (float)((uint)bVar148 * auVar179._0_4_ |
                    (uint)!bVar148 * (uint)((byte)uVar131 & 1) * auVar156._0_4_);
        bVar148 = (bool)((byte)(uVar127 >> 1) & 1);
        auVar157._4_4_ =
             (float)((uint)bVar148 * auVar179._4_4_ |
                    (uint)!bVar148 * (uint)((byte)(uVar131 >> 1) & 1) * auVar156._4_4_);
        bVar148 = (bool)((byte)(uVar127 >> 2) & 1);
        auVar157._8_4_ =
             (float)((uint)bVar148 * auVar179._8_4_ |
                    (uint)!bVar148 * (uint)((byte)(uVar131 >> 2) & 1) * auVar156._8_4_);
        bVar148 = SUB81(uVar127 >> 3,0);
        auVar157._12_4_ =
             (float)((uint)bVar148 * auVar179._12_4_ |
                    (uint)!bVar148 * (uint)(byte)(uVar131 >> 3) * auVar156._12_4_);
        in_ZmmResult._0_16_ = auVar157;
        auVar189 = vshufpd_avx(auVar157,auVar157,1);
        local_a8 = auVar157;
      }
      else {
        local_7d8._0_8_ = CONCAT44(extraout_var_00._0_4_,fVar169) ^ 0x8000000000000000;
        local_7d8._8_4_ = extraout_var_00._4_4_ ^ 0x80000000;
        local_7d8._12_4_ = extraout_var_00._8_4_ ^ 0x80000000;
        local_98._0_4_ = (float)local_668._0_4_ * -fVar169;
        local_98._4_4_ = (float)local_668._4_4_ * -fVar169;
        local_98._8_4_ = fStack_660 * -fVar169;
        local_98._12_4_ = fStack_65c * -fVar169;
        auVar47._8_4_ = 0x3fb8aa3b;
        auVar47._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar47._12_4_ = 0x3fb8aa3b;
        auVar156 = vmulps_avx512vl(local_98,auVar47);
        _local_3a8 = vroundps_avx(auVar156,9);
        auVar156 = vsubps_avx(auVar156,_local_3a8);
        auVar241._8_4_ = 0x3da00ac9;
        auVar241._0_8_ = 0x3da00ac93da00ac9;
        auVar241._12_4_ = 0x3da00ac9;
        auVar48._8_4_ = 0x3e679a0b;
        auVar48._0_8_ = 0x3e679a0b3e679a0b;
        auVar48._12_4_ = 0x3e679a0b;
        auVar179 = vfmadd213ps_avx512vl(auVar241,auVar156,auVar48);
        auVar49._8_4_ = 0x3f321004;
        auVar49._0_8_ = 0x3f3210043f321004;
        auVar49._12_4_ = 0x3f321004;
        auVar179 = vfmadd213ps_avx512vl(auVar179,auVar156,auVar49);
        auVar100._4_4_ = uStack_784;
        auVar100._0_4_ = local_788;
        auVar100._8_4_ = uStack_780;
        auVar100._12_4_ = uStack_77c;
        unique0x001c1e00 = vfmadd213ps_fma(auVar179,auVar156,auVar100);
        _local_578 = ZEXT416((uint)this_00[3].lambda_max);
        auVar269 = ZEXT856(0);
        auVar225 = ZEXT856(auStack_590._16_8_);
        SVar339 = DenselySampledSpectrum::Sample(this_00 + 2,local_7f8);
        auVar261._0_8_ = SVar339.values.values._8_8_;
        auVar261._8_56_ = auVar225;
        auVar209._0_8_ = SVar339.values.values._0_8_;
        auVar209._8_56_ = auVar269;
        auVar316._0_4_ = (int)(float)local_3a8._0_4_;
        auVar316._4_4_ = (int)(float)local_3a8._4_4_;
        auVar316._8_4_ = (int)fStack_3a0;
        auVar316._12_4_ = (int)fStack_39c;
        auVar326._8_4_ = 0xffffff81;
        auVar326._0_8_ = 0xffffff81ffffff81;
        auVar326._12_4_ = 0xffffff81;
        auVar179 = vmovlhps_avx(auVar209._0_16_,auVar261._0_16_);
        local_518._72_8_ = &this_00[0x66666666666].values.ptr;
        local_518._84_4_ = (uint)((ulong)&this_00[3].values >> 0x20) | 0x10000;
        auVar157 = vpsrld_avx(stack0xfffffffffffffa78,0x17);
        auVar290._4_4_ = local_568._0_4_;
        auVar290._0_4_ = local_568._0_4_;
        auVar290._8_4_ = local_568._0_4_;
        auVar290._12_4_ = local_568._0_4_;
        auVar154 = vshufpd_avx(auStack_6f0._8_16_,auStack_6f0._8_16_,1);
        local_518._104_4_ = local_558.values[0];
        local_518._108_4_ = local_558.values[1];
        local_518._112_4_ = local_558.values[2];
        local_518._116_4_ = local_558.values[3];
        local_518._56_4_ = 0.0;
        auVar151 = vpaddd_avx(auVar326,auVar316);
        auVar156 = vdivps_avx(stack0xfffffffffffff858,auVar290);
        local_518._36_4_ = local_808._0_4_ / (float)local_568._0_4_;
        auVar153 = local_668._0_16_;
        auVar285 = vshufpd_avx(auVar153,auVar153,1);
        auVar151 = vpaddd_avx(auVar151,auVar157);
        auVar50._8_4_ = 0x807fffff;
        auVar50._0_8_ = 0x807fffff807fffff;
        auVar50._12_4_ = 0x807fffff;
        auVar157 = vpandd_avx512vl(stack0xfffffffffffffa78,auVar50);
        auVar51._8_4_ = 0x7f;
        auVar51._0_8_ = 0x7f0000007f;
        auVar51._12_4_ = 0x7f;
        uVar127 = vpcmpgtd_avx512vl(auVar151,auVar51);
        uVar127 = uVar127 & 0xf;
        auVar332._0_4_ = (float)local_578._0_4_ * auVar179._0_4_;
        auVar332._4_4_ = (float)local_578._0_4_ * auVar179._4_4_;
        auVar332._8_4_ = (float)local_578._0_4_ * auVar179._8_4_;
        auVar332._12_4_ = (float)local_578._0_4_ * auVar179._12_4_;
        uVar131 = vpcmpgtd_avx512vl(auVar151,auVar326);
        uVar131 = uVar131 & 0xf;
        auVar179 = vpslld_avx(auVar151,0x17);
        auVar52._8_4_ = 0x3f800000;
        auVar52._0_8_ = 0x3f8000003f800000;
        auVar52._12_4_ = 0x3f800000;
        auVar179 = vpaddd_avx512vl(auVar179,auVar52);
        local_78 = ZEXT1632(auVar332);
        auVar151 = vpord_avx512vl(auVar179,auVar157);
        auVar104._4_4_ = uStack_6f4;
        auVar104._0_4_ = local_6f8;
        auVar104._8_8_ = auStack_6f0._0_8_;
        auVar179 = vmovshdup_avx(auVar156);
        auVar157 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        bVar148 = (bool)((byte)uVar127 & 1);
        auStack_480[0]._0_4_ =
             (float)((uint)bVar148 * auVar157._0_4_ |
                    (uint)!bVar148 * (uint)((byte)uVar131 & 1) * auVar151._0_4_);
        bVar148 = (bool)((byte)(uVar127 >> 1) & 1);
        auStack_480[0]._4_4_ =
             (float)((uint)bVar148 * auVar157._4_4_ |
                    (uint)!bVar148 * (uint)((byte)(uVar131 >> 1) & 1) * auVar151._4_4_);
        bVar148 = (bool)((byte)(uVar127 >> 2) & 1);
        auStack_480[1]._0_4_ =
             (float)((uint)bVar148 * auVar157._8_4_ |
                    (uint)!bVar148 * (uint)((byte)(uVar131 >> 2) & 1) * auVar151._8_4_);
        bVar148 = SUB81(uVar127 >> 3,0);
        auStack_480[1]._4_4_ =
             (float)((uint)bVar148 * auVar157._12_4_ |
                    (uint)!bVar148 * (uint)(byte)(uVar131 >> 3) * auVar151._12_4_);
        in_ZmmResult._0_4_ = (float)auStack_480[0];
        in_ZmmResult._4_4_ = auStack_480[0]._4_4_;
        in_ZmmResult._8_4_ = (float)auStack_480[1];
        in_ZmmResult._12_4_ = auStack_480[1]._4_4_;
        fVar169 = (float)local_518._36_4_ * (float)local_7d8._0_4_ + (float)local_738._0_4_;
        auVar291._0_8_ = auVar156._0_8_ ^ 0x8000000080000000;
        auVar291._8_4_ = auVar156._8_4_ ^ 0x80000000;
        auVar291._12_4_ = auVar156._12_4_ ^ 0x80000000;
        local_518._36_4_ = -(float)local_518._36_4_;
        fVar270 = local_6f8 + auVar156._0_4_ * (float)local_7d8._0_4_;
        auVar151 = vmovshdup_avx(auVar104);
        fVar293 = auVar151._0_4_ + auVar179._0_4_ * (float)local_7d8._0_4_;
        auVar188._4_4_ = fVar270;
        auVar188._0_4_ = fVar270;
        auVar188._8_4_ = fVar270;
        auVar188._12_4_ = fVar270;
        auVar242._4_4_ = fVar293;
        auVar242._0_4_ = fVar293;
        auVar242._8_4_ = fVar293;
        auVar242._12_4_ = fVar293;
        auVar156 = vmovlhps_avx(auVar188,auVar242);
        auVar243._4_4_ = fVar169;
        auVar243._0_4_ = fVar169;
        auVar243._8_4_ = fVar169;
        auVar243._12_4_ = fVar169;
        local_518._40_4_ = 0.0;
        local_518._44_4_ = 0.0;
        local_518._48_4_ = 0.0;
        local_518._52_4_ = 0.0;
        local_518._0_4_ = auVar156._0_4_;
        local_518._4_4_ = auVar156._4_4_;
        local_518._8_4_ = auVar156._8_4_;
        local_518._12_4_ = auVar156._12_4_;
        auVar156 = vunpcklpd_avx(auStack_6f0._8_16_,auVar154);
        uVar222 = vmovlps_avx(auVar243);
        local_518._16_4_ = (undefined4)uVar222;
        local_518._20_4_ = (undefined4)((ulong)uVar222 >> 0x20);
        local_518._24_4_ = vextractps_avx(_local_808,1);
        uVar222 = vmovlps_avx(auVar291);
        local_518._28_4_ = (undefined4)uVar222;
        local_518._32_4_ = (undefined4)((ulong)uVar222 >> 0x20);
        local_518._64_4_ = 0.0;
        local_518._68_4_ = 0.0;
        local_518._80_4_ = SUB84(&this_00[3].values,0);
        local_518._88_4_ = auVar156._0_4_;
        local_518._92_4_ = auVar156._4_4_;
        local_518._96_4_ = auVar156._8_4_;
        local_518._100_4_ = auVar156._12_4_;
        auVar201._16_16_ = auVar332;
        auVar201._0_16_ = auVar153;
        auVar250._16_16_ = auVar285;
        auVar250._0_16_ = auVar153;
        auVar250 = vperm2f128_avx(auVar250,local_78,0x21);
        auVar250 = vshufpd_avx(auVar201,auVar250,8);
        local_518._120_8_ = auVar250._0_8_;
        local_498._0_4_ = auVar250._8_4_;
        local_498._4_4_ = auVar250._12_4_;
        uStack_490 = auVar250._16_4_;
        _uStack_48c = auVar250._20_12_;
        in_ZMM7 = ZEXT1664(auVar151);
        in_ZMM11 = ZEXT1664(auVar153);
        in_ZMM12 = ZEXT1664(auStack_6f0._8_16_);
        in_ZMM13 = ZEXT1664((undefined1  [16])local_558.values);
        local_b8 = (float  [4])auStack_480._0_16_;
        Li::anon_class_120_15_cd2b6fed::operator()(&local_638,(MediumSample *)local_518);
        auVar189._4_4_ = uStack_784;
        auVar189._0_4_ = local_788;
        auVar189._8_4_ = uStack_780;
        auVar189._12_4_ = uStack_77c;
        auVar157 = auVar189;
      }
    }
    else {
      auVar174._4_4_ = uVar126;
      auVar174._0_4_ = uVar126;
      auVar174._8_4_ = uVar126;
      auVar174._12_4_ = uVar126;
      auVar40._8_4_ = 0x80000000;
      auVar40._0_8_ = 0x8000000080000000;
      auVar40._12_4_ = 0x80000000;
      auVar156 = vxorps_avx512vl(auVar174,auVar40);
      auVar272._8_4_ = 0x3da00ac9;
      auVar272._0_8_ = 0x3da00ac93da00ac9;
      auVar272._12_4_ = 0x3da00ac9;
      auVar284._8_4_ = 0xffffff81;
      auVar284._0_8_ = 0xffffff81ffffff81;
      auVar284._12_4_ = 0xffffff81;
      local_48._0_4_ = fVar135 * auVar156._0_4_;
      local_48._4_4_ = fVar281 * auVar156._4_4_;
      local_48._8_4_ = fVar294 * auVar156._8_4_;
      local_48._12_4_ = fVar300 * auVar156._12_4_;
      auVar41._8_4_ = 0x3fb8aa3b;
      auVar41._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar41._12_4_ = 0x3fb8aa3b;
      auVar179 = vmulps_avx512vl(local_48,auVar41);
      auVar156 = vroundps_avx(auVar179,9);
      auVar179 = vsubps_avx(auVar179,auVar156);
      auVar42._8_4_ = 0x3e679a0b;
      auVar42._0_8_ = 0x3e679a0b3e679a0b;
      auVar42._12_4_ = 0x3e679a0b;
      auVar151 = vfmadd213ps_avx512vl(auVar272,auVar179,auVar42);
      auVar229._0_4_ = (int)auVar156._0_4_;
      auVar229._4_4_ = (int)auVar156._4_4_;
      auVar229._8_4_ = (int)auVar156._8_4_;
      auVar229._12_4_ = (int)auVar156._12_4_;
      auVar156 = vpaddd_avx(auVar229,auVar284);
      auVar43._8_4_ = 0x3f321004;
      auVar43._0_8_ = 0x3f3210043f321004;
      auVar43._12_4_ = 0x3f321004;
      auVar151 = vfmadd213ps_avx512vl(auVar151,auVar179,auVar43);
      auVar93._4_4_ = uStack_784;
      auVar93._0_4_ = local_788;
      auVar93._8_4_ = uStack_780;
      auVar93._12_4_ = uStack_77c;
      auVar179 = vfmadd213ps_fma(auVar151,auVar179,auVar93);
      auVar151 = vpsrld_avx(auVar179,0x17);
      auVar156 = vpaddd_avx(auVar156,auVar151);
      auVar44._8_4_ = 0x7f;
      auVar44._0_8_ = 0x7f0000007f;
      auVar44._12_4_ = 0x7f;
      uVar127 = vpcmpgtd_avx512vl(auVar156,auVar44);
      uVar127 = uVar127 & 0xf;
      auVar45._8_4_ = 0x807fffff;
      auVar45._0_8_ = 0x807fffff807fffff;
      auVar45._12_4_ = 0x807fffff;
      auVar179 = vpandd_avx512vl(auVar179,auVar45);
      uVar131 = vpcmpgtd_avx512vl(auVar156,auVar284);
      uVar131 = uVar131 & 0xf;
      auVar156 = vpslld_avx(auVar156,0x17);
      auVar46._8_4_ = 0x3f800000;
      auVar46._0_8_ = 0x3f8000003f800000;
      auVar46._12_4_ = 0x3f800000;
      auVar156 = vpaddd_avx512vl(auVar156,auVar46);
      auVar156 = vpord_avx512vl(auVar156,auVar179);
      auVar179 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      bVar148 = (bool)((byte)uVar127 & 1);
      auVar157._0_4_ =
           (float)((uint)bVar148 * auVar179._0_4_ |
                  (uint)!bVar148 * (uint)((byte)uVar131 & 1) * auVar156._0_4_);
      bVar148 = (bool)((byte)(uVar127 >> 1) & 1);
      auVar157._4_4_ =
           (float)((uint)bVar148 * auVar179._4_4_ |
                  (uint)!bVar148 * (uint)((byte)(uVar131 >> 1) & 1) * auVar156._4_4_);
      bVar148 = (bool)((byte)(uVar127 >> 2) & 1);
      auVar157._8_4_ =
           (float)((uint)bVar148 * auVar179._8_4_ |
                  (uint)!bVar148 * (uint)((byte)(uVar131 >> 2) & 1) * auVar156._8_4_);
      bVar148 = SUB81(uVar127 >> 3,0);
      auVar157._12_4_ =
           (float)((uint)bVar148 * auVar179._12_4_ |
                  (uint)!bVar148 * (uint)(byte)(uVar131 >> 3) * auVar156._12_4_);
      in_ZmmResult._0_16_ = auVar157;
      auVar189 = vshufpd_avx(auVar157,auVar157,1);
      local_58 = auVar157;
    }
    goto LAB_003ea8c6;
  }
  goto LAB_003ea936;
LAB_003ea4f0:
  auVar157._4_4_ = (float)uStack_784;
  auVar157._0_4_ = local_788;
  auVar157._8_4_ = (float)uStack_780;
  auVar157._12_4_ = (float)uStack_77c;
  ray = local_740;
LAB_003ea501:
  auVar189 = vshufpd_avx(auVar157,auVar157,1);
LAB_003ea8c6:
  uVar126 = 1;
  lambda = local_7f8;
  if ((local_80a != false) || (uVar126 = 0, local_809 != false)) goto LAB_003ec130;
  auVar156 = vunpcklpd_avx(auVar157,auVar189);
  fVar169 = auVar156._0_4_;
  local_768.values.values[0] = fVar169 * local_768.values.values[0];
  fVar270 = auVar156._4_4_;
  local_768.values.values[1] = fVar270 * local_768.values.values[1];
  fVar293 = auVar156._8_4_;
  local_768.values.values[2] = fVar293 * local_768.values.values[2];
  fVar138 = auVar156._12_4_;
  local_768.values.values[3] = fVar138 * local_768.values.values[3];
  local_798.values.values[0] = fVar169 * local_798.values.values[0];
  local_798.values.values[1] = fVar270 * local_798.values.values[1];
  local_798.values.values[2] = fVar293 * local_798.values.values[2];
  local_798.values.values[3] = fVar138 * local_798.values.values[3];
  local_6d8.values.values[1] = fVar270 * local_6d8.values.values[1];
  local_6d8.values.values[0] = fVar169 * local_6d8.values.values[0];
  local_6d8.values.values[3] = fVar138 * local_6d8.values.values[3];
  local_6d8.values.values[2] = fVar293 * local_6d8.values.values[2];
  pSVar144 = local_770;
  bVar128 = (byte)local_c8;
LAB_003ea936:
  if ((bVar128 & 1) == 0) {
    uVar126 = 3;
    pLVar14 = *(pointer *)(local_7c0._16_8_ + 0x30);
    for (pLVar145 = (((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                     (local_7c0._16_8_ + 0x28))->
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>).
                    _M_impl.super__Vector_impl_data._M_start; ray = local_740, pLVar145 != pLVar14;
        pLVar145 = pLVar145 + 1) {
      uVar127 = (pLVar145->
                super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                ).bits;
      auVar156 = ZEXT816(0) << 0x40;
      auVar179 = ZEXT816(0) << 0x40;
      uVar130 = (uint)(ushort)(uVar127 >> 0x30);
      if (6 < uVar130) {
        uVar130 = uVar130 - 6;
        auVar156 = in_ZMM7._0_16_;
        auVar179 = in_ZMM11._0_16_;
        auVar151 = in_ZMM12._0_16_;
        auVar154 = in_ZMM13._0_16_;
        if (uVar130 < 2) {
          auVar269 = ZEXT856(0);
          auVar225 = ZEXT856(0);
          in_ZMM7 = ZEXT1664(auVar156);
          in_ZMM11 = ZEXT1664(auVar179);
          in_ZMM12 = ZEXT1664(auVar151);
          in_ZMM13 = ZEXT1664(auVar154);
          SVar339 = UniformInfiniteLight::Le
                              ((UniformInfiniteLight *)(uVar127 & 0xffffffffffff),
                               &local_740->super_Ray,lambda);
          auVar263._0_8_ = SVar339.values.values._8_8_;
          auVar263._8_56_ = auVar225;
          auVar179 = auVar263._0_16_;
          auVar210._0_8_ = SVar339.values.values._0_8_;
          auVar210._8_56_ = auVar269;
          auVar156 = auVar210._0_16_;
          lambda = local_7f8;
        }
        else if (uVar130 == 2) {
          auVar269 = ZEXT856(0);
          auVar225 = ZEXT856(0);
          in_ZMM7 = ZEXT1664(auVar156);
          in_ZMM11 = ZEXT1664(auVar179);
          in_ZMM12 = ZEXT1664(auVar151);
          in_ZMM13 = ZEXT1664(auVar154);
          SVar339 = ImageInfiniteLight::Le
                              ((ImageInfiniteLight *)(uVar127 & 0xffffffffffff),
                               &local_740->super_Ray,lambda);
          auVar264._0_8_ = SVar339.values.values._8_8_;
          auVar264._8_56_ = auVar225;
          auVar179 = auVar264._0_16_;
          auVar211._0_8_ = SVar339.values.values._0_8_;
          auVar211._8_56_ = auVar269;
          auVar156 = auVar211._0_16_;
          lambda = local_7f8;
        }
        else {
          auVar269 = ZEXT856(0);
          auVar225 = ZEXT856(0);
          in_ZMM7 = ZEXT1664(auVar156);
          in_ZMM11 = ZEXT1664(auVar179);
          in_ZMM12 = ZEXT1664(auVar151);
          in_ZMM13 = ZEXT1664(auVar154);
          SVar339 = PortalImageInfiniteLight::Le
                              ((PortalImageInfiniteLight *)(uVar127 & 0xffffffffffff),
                               &local_740->super_Ray,lambda);
          auVar265._0_8_ = SVar339.values.values._8_8_;
          auVar265._8_56_ = auVar225;
          auVar179 = auVar265._0_16_;
          auVar212._0_8_ = SVar339.values.values._0_8_;
          auVar212._8_56_ = auVar269;
          auVar156 = auVar212._0_16_;
          lambda = local_7f8;
        }
      }
      auVar164._16_48_ = in_ZmmResult._16_48_;
      auVar179 = vmovlhps_avx(auVar156,auVar179);
      local_6c8._0_4_ = auVar179._0_4_;
      local_6c8._4_4_ = auVar179._4_4_;
      local_6c8._8_4_ = auVar179._8_4_;
      local_6c8._12_4_ = auVar179._12_4_;
      if ((auVar156._0_4_ != 0.0) || (NAN(auVar156._0_4_))) {
LAB_003eaa9c:
        if ((local_7dc == 0) || (local_80c == true)) {
          lVar140 = 1;
          auVar192._0_4_ = (float)local_6c8._0_4_ * local_768.values.values[0];
          auVar192._4_4_ = (float)local_6c8._4_4_ * local_768.values.values[1];
          auVar192._8_4_ = (float)local_6c8._8_4_ * local_768.values.values[2];
          auVar192._12_4_ = (float)local_6c8._12_4_ * local_768.values.values[3];
          aVar226 = (anon_struct_4_0_00000001_for___align)local_798.values.values[0];
          do {
            aVar226 = (anon_struct_4_0_00000001_for___align)
                      ((float)aVar226 + local_798.values.values[lVar140]);
            lVar140 = lVar140 + 1;
          } while (lVar140 != 4);
        }
        else {
          uVar15 = (pLVar145->
                   super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                   ).bits;
          uVar127 = (((LightSamplerHandle *)(local_7c0._16_8_ + 0x58))->
                    super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                    ).bits;
          pEVar137 = (ExhaustiveLightSampler *)(uVar127 & 0xffffffffffff);
          auVar156 = in_ZMM7._0_16_;
          auVar179 = in_ZMM11._0_16_;
          auVar151 = in_ZMM12._0_16_;
          auVar154 = in_ZMM13._0_16_;
          local_518._0_4_ = (undefined4)uVar15;
          local_518._4_4_ = (undefined4)(uVar15 >> 0x20);
          if (uVar127 < 0x3000000000000) {
            if ((uVar127 & 0x3000000000000) == 0x2000000000000) {
              in_ZMM7 = ZEXT1664(auVar156);
              in_ZMM11 = ZEXT1664(auVar179);
              in_ZMM12 = ZEXT1664(auVar151);
              in_ZMM13 = ZEXT1664(auVar154);
              local_808._0_4_ =
                   PowerLightSampler::PDF
                             ((PowerLightSampler *)pEVar137,(LightSampleContext *)local_5b8,
                              (LightHandle *)local_518);
              local_808._4_4_ = extraout_XMM0_Db;
              uStack_800._0_4_ = (float)extraout_XMM0_Dc;
              uStack_800._4_4_ = (float)extraout_XMM0_Dd;
            }
            else {
              sVar16 = (pEVar137->lights).nStored;
              auVar156 = vcvtusi2ss_avx512f(in_XMM15,sVar16);
              fVar169 = 1.0 / auVar156._0_4_;
              auVar164._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar164._0_4_ = fVar169;
              auVar163._4_60_ = auVar164._4_60_;
              auVar163._0_4_ = (uint)(sVar16 != 0) * (int)fVar169;
              _local_808 = auVar163._0_16_;
            }
          }
          else if ((uVar127 & 0xfffe000000000000) == 0x2000000000000) {
            in_ZMM7 = ZEXT1664(auVar156);
            in_ZMM11 = ZEXT1664(auVar179);
            in_ZMM12 = ZEXT1664(auVar151);
            in_ZMM13 = ZEXT1664(auVar154);
            local_808._0_4_ =
                 BVHLightSampler::PDF
                           ((BVHLightSampler *)pEVar137,(LightSampleContext *)local_5b8,
                            (LightHandle *)local_518);
            local_808._4_4_ = extraout_XMM0_Db_00;
            uStack_800._0_4_ = (float)extraout_XMM0_Dc_00;
            uStack_800._4_4_ = (float)extraout_XMM0_Dd_00;
          }
          else {
            in_ZMM7 = ZEXT1664(auVar156);
            in_ZMM11 = ZEXT1664(auVar179);
            in_ZMM12 = ZEXT1664(auVar151);
            in_ZMM13 = ZEXT1664(auVar154);
            local_808._0_4_ =
                 ExhaustiveLightSampler::PDF
                           (pEVar137,(LightSampleContext *)local_5b8,(LightHandle *)local_518);
            local_808._4_4_ = extraout_XMM0_Db_01;
            uStack_800._0_4_ = (float)extraout_XMM0_Dc_01;
            uStack_800._4_4_ = (float)extraout_XMM0_Dd_01;
          }
          local_518._32_4_ = IStack_598.low;
          local_518._36_4_ = IStack_598.high;
          local_518._40_4_ = (undefined4)auStack_590._0_8_;
          local_518._44_4_ = SUB84(auStack_590._0_8_,4);
          local_518._0_4_ = (undefined4)local_5b8._0_8_;
          local_518._4_4_ = SUB84(local_5b8._0_8_,4);
          local_518._8_4_ = (undefined4)local_5b8._8_8_;
          local_518._12_4_ = SUB84(local_5b8._8_8_,4);
          local_518._16_4_ = (undefined4)local_5b8._16_8_;
          local_518._20_4_ = SUB84(local_5b8._16_8_,4);
          local_518._24_4_ = (undefined4)local_5b8._24_8_;
          local_518._28_4_ = SUB84(local_5b8._24_8_,4);
          pVVar1 = &(local_740->super_Ray).d;
          auVar122._60_4_ = 0;
          auVar122._0_60_ = stack0xfffffffffffffccc;
          _local_338 = auVar122 << 0x20;
          local_638.T_hat = (SampledSpectrum *)local_518;
          local_638.terminated = (bool *)local_408;
          local_638.uniPathPDF = (SampledSpectrum *)local_338;
          local_408._0_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).x;
          local_408._4_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).y;
          local_408._8_4_ = (local_740->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
          uVar127 = (pLVar145->
                    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                    ).bits;
          uVar130 = (uint)(ushort)(uVar127 >> 0x30);
          auVar156 = in_ZMM7._0_16_;
          auVar179 = in_ZMM11._0_16_;
          auVar151 = in_ZMM12._0_16_;
          auVar154 = in_ZMM13._0_16_;
          if (uVar127 < 0x5000000000000) {
            fVar169 = 0.0;
            if (0x2ffffffffffff < uVar127) {
              if ((uVar130 & 6) == 2) {
                auVar109._8_8_ = local_5b8._24_8_;
                auVar109._0_8_ = local_5b8._16_8_;
                auVar109._16_4_ = IStack_598.low;
                auVar109._20_4_ = IStack_598.high;
                auVar109._24_8_ = auStack_590._0_8_;
                in_ZMM7 = ZEXT1664(auVar156);
                in_ZMM11 = ZEXT1664(auVar179);
                in_ZMM12 = ZEXT1664(auVar151);
                in_ZMM13 = ZEXT1664(auVar154);
                LVar89.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                low = (Float)local_5b8._8_4_;
                LVar89.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                high = (Float)local_5b8._12_4_;
                LVar89.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                low = (Float)local_5b8._0_4_;
                LVar89.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                high = (Float)local_5b8._4_4_;
                LVar89.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
                low = (Float)local_5b8._16_4_;
                LVar89.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
                high = (Float)local_5b8._20_4_;
                LVar89.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)local_5b8._24_4_;
                LVar89.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_5b8._28_4_;
                auVar338 = SUB1612(auVar109._16_16_,4);
                LVar89.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)SUB164(auVar109._16_16_,0);
                LVar89.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar338._0_4_;
                LVar89.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar338._4_4_;
                LVar89.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar338._8_4_;
                fVar169 = ProjectionLight::PDF_Li
                                    ((ProjectionLight *)(uVar127 & 0xffffffffffff),LVar89,
                                     (Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,WithMIS);
              }
              else {
                auVar110._8_8_ = local_5b8._24_8_;
                auVar110._0_8_ = local_5b8._16_8_;
                auVar110._16_4_ = IStack_598.low;
                auVar110._20_4_ = IStack_598.high;
                auVar110._24_8_ = auStack_590._0_8_;
                in_ZMM7 = ZEXT1664(auVar156);
                in_ZMM11 = ZEXT1664(auVar179);
                in_ZMM12 = ZEXT1664(auVar151);
                in_ZMM13 = ZEXT1664(auVar154);
                LVar90.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                low = (Float)local_5b8._8_4_;
                LVar90.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                high = (Float)local_5b8._12_4_;
                LVar90.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                low = (Float)local_5b8._0_4_;
                LVar90.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                high = (Float)local_5b8._4_4_;
                LVar90.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
                low = (Float)local_5b8._16_4_;
                LVar90.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
                high = (Float)local_5b8._20_4_;
                LVar90.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)local_5b8._24_4_;
                LVar90.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_5b8._28_4_;
                auVar338 = SUB1612(auVar110._16_16_,4);
                LVar90.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)SUB164(auVar110._16_16_,0);
                LVar90.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar338._0_4_;
                LVar90.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar338._4_4_;
                LVar90.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar338._8_4_;
                fVar169 = GoniometricLight::PDF_Li
                                    ((GoniometricLight *)(uVar127 & 0xffffffffffff),LVar90,
                                     (Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,WithMIS);
              }
            }
          }
          else {
            in_ZMM7 = ZEXT1664(auVar156);
            in_ZMM11 = ZEXT1664(auVar179);
            in_ZMM12 = ZEXT1664(auVar151);
            in_ZMM13 = ZEXT1664(auVar154);
            local_268._0_8_ = uVar127;
            fVar169 = DispatchSplit<5>::operator()
                                ((DispatchSplit<5> *)local_2e0,local_268,uVar130 - 4);
          }
          fVar169 = fVar169 * (float)local_808._0_4_;
          lVar140 = 1;
          local_6d8.values.values[0] = fVar169 * local_6d8.values.values[0];
          local_6d8.values.values[1] = fVar169 * local_6d8.values.values[1];
          local_6d8.values.values[2] = fVar169 * local_6d8.values.values[2];
          local_6d8.values.values[3] = fVar169 * local_6d8.values.values[3];
          auVar192._0_4_ = (float)local_6c8._0_4_ * local_768.values.values[0];
          auVar192._4_4_ = (float)local_6c8._4_4_ * local_768.values.values[1];
          auVar192._8_4_ = (float)local_6c8._8_4_ * local_768.values.values[2];
          auVar192._12_4_ = (float)local_6c8._12_4_ * local_768.values.values[3];
          aVar226 = (anon_struct_4_0_00000001_for___align)
                    (local_6d8.values.values[0] + local_798.values.values[0]);
          local_518._0_4_ = aVar226;
          local_518._4_4_ = local_6d8.values.values[1] + local_798.values.values[1];
          local_518._8_4_ = local_6d8.values.values[2] + local_798.values.values[2];
          local_518._12_4_ = local_6d8.values.values[3] + local_798.values.values[3];
          do {
            aVar226 = (anon_struct_4_0_00000001_for___align)
                      ((float)aVar226 + *(float *)(local_518 + lVar140 * 4));
            lVar140 = lVar140 + 1;
            lambda = local_7f8;
          } while (lVar140 != 4);
        }
        fVar169 = (float)aVar226 * 0.25;
        auVar247._0_4_ = fVar169 * (lambda->pdf).values[0];
        auVar247._4_4_ = fVar169 * (lambda->pdf).values[1];
        auVar247._8_4_ = fVar169 * (lambda->pdf).values[2];
        auVar247._12_4_ = fVar169 * (lambda->pdf).values[3];
        uVar127 = vcmpps_avx512vl(auVar247,_DAT_0054e010,4);
        auVar156 = vdivps_avx512vl(auVar192,auVar247);
        fVar169 = (float)((uint)((byte)uVar127 & 1) * auVar156._0_4_);
        fVar138 = (float)((uint)((byte)(uVar127 >> 1) & 1) * auVar156._4_4_);
        in_ZmmResult._4_4_ = fVar138;
        in_ZmmResult._0_4_ = fVar169;
        fVar293 = (float)((uint)((byte)(uVar127 >> 2) & 1) * auVar156._8_4_);
        in_ZmmResult._8_4_ = fVar293;
        fVar270 = (float)((uint)((byte)(uVar127 >> 3) & 1) * auVar156._12_4_);
        in_ZmmResult._12_4_ = fVar270;
        in_ZmmResult._16_48_ = auVar164._16_48_;
        local_728.values.values[1] = fVar138 + local_728.values.values[1];
        local_728.values.values[0] = fVar169 + local_728.values.values[0];
        local_728.values.values[2] = fVar293 + local_728.values.values[2];
        local_728.values.values[3] = fVar270 + local_728.values.values[3];
      }
      else {
        uVar127 = 0xffffffffffffffff;
        do {
          if (uVar127 == 2) goto LAB_003eaded;
          lVar140 = uVar127 * 4;
          uVar127 = uVar127 + 1;
        } while ((*(float *)(local_6c8 + lVar140 + 8) == 0.0) &&
                (!NAN(*(float *)(local_6c8 + lVar140 + 8))));
        if (uVar127 < 3) goto LAB_003eaa9c;
      }
LAB_003eaded:
    }
    goto LAB_003ec130;
  }
  auVar245._0_4_ = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar245._4_4_ = 0x80000000;
  auVar245._8_4_ = 0x80000000;
  auVar245._12_4_ = 0x80000000;
  uVar127._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
  uVar127._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar190._0_8_ = uVar127 ^ 0x8000000080000000;
  auVar190._8_4_ = 0x80000000;
  auVar190._12_4_ = 0x80000000;
  auVar179 = in_ZMM7._0_16_;
  auVar151 = in_ZMM11._0_16_;
  auVar154 = in_ZMM12._0_16_;
  auVar285 = in_ZMM13._0_16_;
  w.super_Tuple3<pbrt::Vector3,_float>.z = auVar245._0_4_;
  w.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar190._0_8_;
  w.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(auVar190._0_8_ >> 0x20);
  auVar225 = ZEXT856(auVar245._8_8_);
  auVar269 = ZEXT856(auVar190._8_8_);
  SVar339 = SurfaceInteraction::Le((SurfaceInteraction *)&local_1c8.__align,w,lambda);
  auVar333 = local_1c8._192_64_;
  auVar166._16_48_ = in_ZmmResult._16_48_;
  auVar262._0_8_ = SVar339.values.values._8_8_;
  auVar262._8_56_ = auVar225;
  auVar213._0_8_ = SVar339.values.values._0_8_;
  auVar213._8_56_ = auVar269;
  auVar156 = vmovlhps_avx(auVar213._0_16_,auVar262._0_16_);
  uVar127 = auVar156._8_8_;
  local_6c8._0_4_ = auVar156._0_4_;
  local_6c8._4_4_ = auVar156._4_4_;
  local_6c8._8_4_ = auVar156._8_4_;
  local_6c8._12_4_ = auVar156._12_4_;
  if ((SVar339.values.values[0] != 0.0) || (NAN(SVar339.values.values[0]))) {
LAB_003ea98d:
    if ((local_7dc == 0) || (local_80c == true)) {
      lVar140 = 1;
      auVar191._0_4_ = (float)local_6c8._0_4_ * local_768.values.values[0];
      auVar191._4_4_ = (float)local_6c8._4_4_ * local_768.values.values[1];
      auVar191._8_4_ = (float)local_6c8._8_4_ * local_768.values.values[2];
      auVar191._12_4_ = (float)local_6c8._12_4_ * local_768.values.values[3];
      fVar169 = local_798.values.values[0];
      do {
        fVar169 = fVar169 + local_798.values.values[lVar140];
        lVar140 = lVar140 + 1;
      } while (lVar140 != 4);
      fVar169 = fVar169 * 0.25;
      auVar246._0_4_ = fVar169 * (local_7f8->pdf).values[0];
      auVar246._4_4_ = fVar169 * (local_7f8->pdf).values[1];
      auVar246._8_4_ = fVar169 * (local_7f8->pdf).values[2];
      auVar246._12_4_ = fVar169 * (local_7f8->pdf).values[3];
    }
    else {
      uVar222 = local_1c8._200_8_;
      uVar127 = (((LightSamplerHandle *)(local_7c0._16_8_ + 0x58))->
                super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                ).bits;
      pEVar137 = (ExhaustiveLightSampler *)(uVar127 & 0xffffffffffff);
      local_518._0_4_ = local_1c8._200_4_;
      local_518._4_4_ = local_1c8._204_4_;
      if (uVar127 < 0x3000000000000) {
        if ((uVar127 & 0x3000000000000) == 0x2000000000000) {
          local_808._0_4_ =
               PowerLightSampler::PDF
                         ((PowerLightSampler *)pEVar137,(LightSampleContext *)local_5b8,
                          (LightHandle *)local_518);
          local_808._4_4_ = extraout_XMM0_Db_02;
          uStack_800._0_4_ = (float)extraout_XMM0_Dc_02;
          uStack_800._4_4_ = (float)extraout_XMM0_Dd_02;
        }
        else {
          sVar16 = (pEVar137->lights).nStored;
          auVar156 = vcvtusi2ss_avx512f(in_XMM15,sVar16);
          fVar169 = 1.0 / auVar156._0_4_;
          auVar166._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar166._0_4_ = fVar169;
          auVar165._4_60_ = auVar166._4_60_;
          auVar165._0_4_ = (uint)(sVar16 != 0) * (int)fVar169;
          _local_808 = auVar165._0_16_;
        }
      }
      else if ((uVar127 & 0xfffe000000000000) == 0x2000000000000) {
        local_808._0_4_ =
             BVHLightSampler::PDF
                       ((BVHLightSampler *)pEVar137,(LightSampleContext *)local_5b8,
                        (LightHandle *)local_518);
        local_808._4_4_ = extraout_XMM0_Db_03;
        uStack_800._0_4_ = (float)extraout_XMM0_Dc_03;
        uStack_800._4_4_ = (float)extraout_XMM0_Dd_03;
      }
      else {
        local_808._0_4_ =
             ExhaustiveLightSampler::PDF
                       (pEVar137,(LightSampleContext *)local_5b8,(LightHandle *)local_518);
        local_808._4_4_ = extraout_XMM0_Db_04;
        uStack_800._0_4_ = (float)extraout_XMM0_Dc_04;
        uStack_800._4_4_ = (float)extraout_XMM0_Dd_04;
      }
      local_518._32_4_ = IStack_598.low;
      local_518._36_4_ = IStack_598.high;
      local_518._40_4_ = (undefined4)auStack_590._0_8_;
      local_518._44_4_ = SUB84(auStack_590._0_8_,4);
      local_518._0_4_ = (undefined4)local_5b8._0_8_;
      local_518._4_4_ = SUB84(local_5b8._0_8_,4);
      local_518._8_4_ = (undefined4)local_5b8._8_8_;
      local_518._12_4_ = SUB84(local_5b8._8_8_,4);
      local_518._16_4_ = (undefined4)local_5b8._16_8_;
      local_518._20_4_ = SUB84(local_5b8._16_8_,4);
      local_518._24_4_ = (undefined4)local_5b8._24_8_;
      local_518._28_4_ = SUB84(local_5b8._24_8_,4);
      pVVar1 = &(ray->super_Ray).d;
      local_638.T_hat = (SampledSpectrum *)local_518;
      auVar123._60_4_ = 0;
      auVar123._0_60_ = stack0xfffffffffffffccc;
      _local_338 = auVar123 << 0x20;
      local_638.terminated = (bool *)local_408;
      local_638.uniPathPDF = (SampledSpectrum *)local_338;
      local_408._0_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).x;
      local_408._4_4_ = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).y;
      local_408._8_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
      if ((ulong)uVar222 < 0x5000000000000) {
        fVar169 = 0.0;
        if (0x2ffffffffffff < (ulong)uVar222) {
          if ((auVar333._14_2_ & 6) == 2) {
            auVar111._8_8_ = local_5b8._24_8_;
            auVar111._0_8_ = local_5b8._16_8_;
            auVar111._16_4_ = IStack_598.low;
            auVar111._20_4_ = IStack_598.high;
            auVar111._24_8_ = auStack_590._0_8_;
            LVar91.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low
                 = (Float)local_5b8._8_4_;
            LVar91.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high
                 = (Float)local_5b8._12_4_;
            LVar91.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low
                 = (Float)local_5b8._0_4_;
            LVar91.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
                 = (Float)local_5b8._4_4_;
            LVar91.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
                 = (Float)local_5b8._16_4_;
            LVar91.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high
                 = (Float)local_5b8._20_4_;
            LVar91.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)local_5b8._24_4_;
            LVar91.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_5b8._28_4_;
            auVar338 = SUB1612(auVar111._16_16_,4);
            LVar91.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)SUB164(auVar111._16_16_,0);
            LVar91.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar338._0_4_;
            LVar91.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar338._4_4_;
            LVar91.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar338._8_4_;
            fVar169 = ProjectionLight::PDF_Li
                                ((ProjectionLight *)(uVar222 & 0xffffffffffff),LVar91,
                                 (Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,WithMIS);
          }
          else {
            auVar112._8_8_ = local_5b8._24_8_;
            auVar112._0_8_ = local_5b8._16_8_;
            auVar112._16_4_ = IStack_598.low;
            auVar112._20_4_ = IStack_598.high;
            auVar112._24_8_ = auStack_590._0_8_;
            LVar92.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low
                 = (Float)local_5b8._8_4_;
            LVar92.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high
                 = (Float)local_5b8._12_4_;
            LVar92.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low
                 = (Float)local_5b8._0_4_;
            LVar92.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
                 = (Float)local_5b8._4_4_;
            LVar92.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
                 = (Float)local_5b8._16_4_;
            LVar92.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high
                 = (Float)local_5b8._20_4_;
            LVar92.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)local_5b8._24_4_;
            LVar92.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_5b8._28_4_;
            auVar338 = SUB1612(auVar112._16_16_,4);
            LVar92.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)SUB164(auVar112._16_16_,0);
            LVar92.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar338._0_4_;
            LVar92.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar338._4_4_;
            LVar92.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar338._8_4_;
            fVar169 = GoniometricLight::PDF_Li
                                ((GoniometricLight *)(uVar222 & 0xffffffffffff),LVar92,
                                 (Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,WithMIS);
          }
        }
      }
      else {
        local_268._0_8_ = uVar222;
        fVar169 = DispatchSplit<5>::operator()
                            ((DispatchSplit<5> *)local_2e0,local_268,auVar333._14_2_ - 4);
      }
      fVar169 = fVar169 * (float)local_808._0_4_;
      lVar140 = 1;
      local_6d8.values.values[0] = fVar169 * local_6d8.values.values[0];
      local_6d8.values.values[1] = fVar169 * local_6d8.values.values[1];
      local_6d8.values.values[2] = fVar169 * local_6d8.values.values[2];
      local_6d8.values.values[3] = fVar169 * local_6d8.values.values[3];
      auVar191._0_4_ = (float)local_6c8._0_4_ * local_768.values.values[0];
      auVar191._4_4_ = (float)local_6c8._4_4_ * local_768.values.values[1];
      auVar191._8_4_ = (float)local_6c8._8_4_ * local_768.values.values[2];
      auVar191._12_4_ = (float)local_6c8._12_4_ * local_768.values.values[3];
      aVar226 = (anon_struct_4_0_00000001_for___align)
                (local_6d8.values.values[0] + local_798.values.values[0]);
      local_518._0_4_ = aVar226;
      local_518._4_4_ = local_6d8.values.values[1] + local_798.values.values[1];
      local_518._8_4_ = local_6d8.values.values[2] + local_798.values.values[2];
      local_518._12_4_ = local_6d8.values.values[3] + local_798.values.values[3];
      do {
        aVar226 = (anon_struct_4_0_00000001_for___align)
                  ((float)aVar226 + *(float *)(local_518 + lVar140 * 4));
        lVar140 = lVar140 + 1;
      } while (lVar140 != 4);
      fVar169 = (float)aVar226 * 0.25;
      auVar246._0_4_ = fVar169 * (local_7f8->pdf).values[0];
      auVar246._4_4_ = fVar169 * (local_7f8->pdf).values[1];
      auVar246._8_4_ = fVar169 * (local_7f8->pdf).values[2];
      auVar246._12_4_ = fVar169 * (local_7f8->pdf).values[3];
    }
    uVar127 = auVar246._8_8_;
    uVar131 = vcmpps_avx512vl(auVar246,_DAT_0054e010,4);
    auVar156 = vdivps_avx512vl(auVar191,auVar246);
    fVar270 = (float)((uint)((byte)uVar131 & 1) * auVar156._0_4_);
    fVar138 = (float)((uint)((byte)(uVar131 >> 1) & 1) * auVar156._4_4_);
    in_ZmmResult._4_4_ = fVar138;
    in_ZmmResult._0_4_ = fVar270;
    fVar293 = (float)((uint)((byte)(uVar131 >> 2) & 1) * auVar156._8_4_);
    in_ZmmResult._8_4_ = fVar293;
    fVar169 = (float)((uint)((byte)(uVar131 >> 3) & 1) * auVar156._12_4_);
    in_ZmmResult._12_4_ = fVar169;
    in_ZmmResult._16_48_ = auVar166._16_48_;
    local_728.values.values[0] = fVar270 + local_728.values.values[0];
    local_728.values.values[1] = fVar138 + local_728.values.values[1];
    local_728.values.values[2] = fVar293 + local_728.values.values[2];
    local_728.values.values[3] = fVar169 + local_728.values.values[3];
    uVar224 = local_728.values.values._8_8_;
  }
  else {
    uVar131 = 0xffffffffffffffff;
    do {
      uVar224 = auVar213._8_8_;
      if (uVar131 == 2) goto LAB_003eb12f;
      fVar169 = *(float *)(local_6c8 + uVar131 * 4 + 8);
      auVar213 = ZEXT464((uint)fVar169);
      uVar224 = 0;
      uVar131 = uVar131 + 1;
    } while ((fVar169 == 0.0) && (!NAN(fVar169)));
    if (uVar131 < 3) goto LAB_003ea98d;
  }
LAB_003eb12f:
  local_1d0.bits =
       (((CameraHandle *)(local_7c0._16_8_ + 0x40))->
       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
       ).bits;
  local_1d8.bits =
       (pSVar144->
       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  in_ZMM7 = ZEXT1664(auVar179);
  in_ZMM11 = ZEXT1664(auVar151);
  in_ZMM12 = ZEXT1664(auVar154);
  in_ZMM13 = ZEXT1664(auVar285);
  SurfaceInteraction::GetBSDF
            ((BSDF *)local_2e0,(SurfaceInteraction *)&local_1c8.__align,ray,local_7f8,
             (CameraHandle *)&local_1d0,local_388,(SamplerHandle *)&local_1d8);
  if (((ulong)local_2e0 & 0xffffffffffff) == 0) {
    if ((byte)local_c8 == '\0') {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
    }
    uVar126 = 0;
    SurfaceInteraction::SkipIntersection
              ((SurfaceInteraction *)&local_1c8.__align,ray,(Float)local_1c8._248_4_);
    lambda = local_7f8;
    goto LAB_003ec130;
  }
  iVar149 = local_7dc;
  if (local_7dc == 0 && local_270 != (VisibleSurface *)0x0) {
    uVar131 = 0;
    _local_808 = ZEXT816(0);
    do {
      fVar169 = 1.0;
      uVar131 = uVar131 + 1;
      lVar140 = 0;
      uVar127 = uVar131;
      do {
        fVar169 = local_36c * fVar169;
        lVar140 = (lVar140 - uVar127 / 2) * 2 + uVar127;
        bVar148 = 1 < uVar127;
        uVar127 = uVar127 / 2;
      } while (bVar148);
      auVar156 = vcvtusi2ss_avx512f(in_ZMM13._0_16_,lVar140);
      lVar140 = 0;
      fVar270 = 1.0;
      uVar127 = uVar131;
      do {
        fVar270 = local_370 * fVar270;
        lVar140 = (lVar140 - uVar127 / 3) * 3 + uVar127;
        bVar148 = 2 < uVar127;
        uVar127 = uVar127 / 3;
      } while (bVar148);
      auVar179 = vcvtusi2ss_avx512f(in_ZMM12._0_16_,lVar140);
      lVar140 = 0;
      fVar293 = 1.0;
      uVar127 = uVar131;
      do {
        fVar293 = local_374 * fVar293;
        lVar140 = (lVar140 - uVar127 / 5) * 5 + uVar127;
        bVar148 = 4 < uVar127;
        uVar127 = uVar127 / 5;
      } while (bVar148);
      if ((byte)local_c8 == '\0') {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
      }
      auVar151 = vcvtusi2ss_avx512f(in_ZMM7._0_16_,lVar140);
      auVar154 = SUB6416(ZEXT464(0x3f7fffff),0);
      auVar179 = vminss_avx(auVar154,ZEXT416((uint)(fVar270 * auVar179._0_4_)));
      auVar151 = vminss_avx(auVar154,ZEXT416((uint)(fVar293 * auVar151._0_4_)));
      auVar179 = vinsertps_avx(auVar179,auVar151,0x10);
      auVar156 = vminss_avx(auVar154,ZEXT416((uint)(fVar169 * auVar156._0_4_)));
      uVar127 = 0;
      BSDF::Sample_f((optional<pbrt::BSDFSample> *)local_518,(BSDF *)local_2e0,
                     (Vector3f)local_1c8._28_12_,auVar156._0_4_,(Point2f)auVar179._0_8_,Radiance,All
                    );
      if ((bool)local_518[0x2c] == true) {
        if ((byte)local_c8 == '\0') {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
        }
        auVar156 = vfmadd132ss_fma(ZEXT416((uint)local_1c8._132_4_),
                                   ZEXT416((uint)((float)local_1c8._136_4_ * (float)local_518._24_4_
                                                 )),ZEXT416((uint)local_518._20_4_));
        auVar179 = vfmsub213ss_fma(ZEXT416((uint)local_518._24_4_),ZEXT416((uint)local_1c8._136_4_),
                                   ZEXT416((uint)((float)local_1c8._136_4_ * (float)local_518._24_4_
                                                 )));
        auVar156 = vfmadd231ss_fma(ZEXT416((uint)(auVar156._0_4_ + auVar179._0_4_)),
                                   ZEXT416((uint)local_1c8._128_4_),ZEXT416((uint)local_518._16_4_))
        ;
        uVar170 = auVar156._0_4_;
        auVar193._4_4_ = uVar170;
        auVar193._0_4_ = uVar170;
        auVar193._8_4_ = uVar170;
        auVar193._12_4_ = uVar170;
        auVar29._8_4_ = 0x7fffffff;
        auVar29._0_8_ = 0x7fffffff7fffffff;
        auVar29._12_4_ = 0x7fffffff;
        auVar156 = vandps_avx512vl(auVar193,auVar29);
        auVar194._0_4_ = auVar156._0_4_ * (float)local_518._0_4_;
        auVar194._4_4_ = auVar156._4_4_ * (float)local_518._4_4_;
        auVar194._8_4_ = auVar156._8_4_ * (float)local_518._8_4_;
        auVar194._12_4_ = auVar156._12_4_ * (float)local_518._12_4_;
        auVar30._4_4_ = local_518._28_4_;
        auVar30._0_4_ = local_518._28_4_;
        auVar30._8_4_ = local_518._28_4_;
        auVar30._12_4_ = local_518._28_4_;
        auVar156 = vdivps_avx512vl(auVar194,auVar30);
        local_808._0_4_ = auVar156._0_4_ + (float)local_808._0_4_;
        local_808._4_4_ = auVar156._4_4_ + (float)local_808._4_4_;
        uStack_800._0_4_ = auVar156._8_4_ + (float)uStack_800;
        uStack_800._4_4_ = auVar156._12_4_ + uStack_800._4_4_;
        uVar127 = local_808._8_8_;
      }
    } while (uVar131 != 0x10);
    auVar31._8_4_ = 0x3d800000;
    auVar31._0_8_ = 0x3d8000003d800000;
    auVar31._12_4_ = 0x3d800000;
    auVar156 = vmulps_avx512vl(_local_808,auVar31);
    local_638.T_hat = auVar156._0_8_;
    local_638.terminated = auVar156._8_8_;
    if ((byte)local_c8 == '\0') {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
    }
    VisibleSurface::VisibleSurface
              ((VisibleSurface *)local_518,(SurfaceInteraction *)&local_1c8.__align,
               (CameraTransform *)
               ((((CameraHandle *)(local_7c0._16_8_ + 0x40))->
                super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                ).bits & 0xffffffffffff),(SampledSpectrum *)&local_638,local_7f8);
    (local_270->albedo).values.values[3] = (float)local_518._64_4_;
    auVar120._4_4_ = local_518._4_4_;
    auVar120._0_4_ = local_518._0_4_;
    auVar120._8_4_ = local_518._8_4_;
    auVar120._12_4_ = local_518._12_4_;
    uVar114 = local_518._16_4_;
    auVar113 = auVar120;
    auVar340._16_4_ = uVar114;
    auVar340._0_16_ = auVar113;
    uVar115 = local_518._20_4_;
    auVar340._20_4_ = uVar115;
    uVar116 = local_518._24_4_;
    auVar340._24_4_ = uVar116;
    uVar117 = local_518._28_4_;
    in_ZmmResult._28_4_ = uVar117;
    in_ZmmResult._0_28_ = auVar340;
    uVar118 = local_518._32_4_;
    in_ZmmResult._32_4_ = uVar118;
    uVar119 = local_518._36_4_;
    in_ZmmResult._36_4_ = uVar119;
    in_ZmmResult._40_4_ = local_518._40_4_;
    in_ZmmResult._44_4_ = local_518._44_4_;
    in_ZmmResult._48_4_ = local_518._48_4_;
    in_ZmmResult._52_4_ = local_518._52_4_;
    in_ZmmResult._56_4_ = local_518._56_4_;
    in_ZmmResult._60_4_ = local_518._60_4_;
    uVar224 = auVar120._8_8_;
    local_270->set = (bool)(char)local_518._0_4_;
    *(int3 *)&local_270->field_0x1 = SUB43(local_518._0_4_,1);
    local_270->p = (Point3f)auVar120._4_12_;
    local_270->n = (Normal3f)auVar340._16_12_;
    local_270->ns = (Normal3f)in_ZmmResult._28_12_;
    local_270->time = (Float)local_518._40_4_;
    local_270->dzdx = (Float)local_518._44_4_;
    local_270->dzdy = (Float)local_518._48_4_;
    (local_270->albedo).values.values[0] = (float)local_518._52_4_;
    (local_270->albedo).values.values[1] = (float)local_518._56_4_;
    (local_270->albedo).values.values[2] = (float)local_518._60_4_;
    iVar149 = local_7dc;
  }
  auVar154 = in_ZMM13._0_16_;
  auVar151 = in_ZMM12._0_16_;
  auVar179 = in_ZMM11._0_16_;
  auVar156 = in_ZMM7._0_16_;
  uVar126 = 1;
  local_7dc = iVar149 + 1;
  lambda = local_7f8;
  if (*(int *)(local_7c0._16_8_ + 0x50) <= iVar149) goto LAB_003ec130;
  *(long *)(in_FS_OFFSET + -0x270) = *(long *)(in_FS_OFFSET + -0x270) + 1;
  if ((*(bool *)(local_7c0._16_8_ + 0x60) == true) && (local_80b == true)) {
    *(long *)(in_FS_OFFSET + -0x2a0) = *(long *)(in_FS_OFFSET + -0x2a0) + 1;
    BSDF::Regularize((BSDF *)local_2e0);
  }
  auVar269 = ZEXT856(uVar224);
  auVar225 = ZEXT856(uVar127);
  in_ZMM7 = ZEXT1664(auVar156);
  in_ZMM11 = ZEXT1664(auVar179);
  in_ZMM12 = ZEXT1664(auVar151);
  in_ZMM13 = ZEXT1664(auVar154);
  bVar148 = BSDF::IsNonSpecular((BSDF *)local_2e0);
  pSVar144 = local_770;
  pSVar124 = local_7f8;
  if (bVar148) {
    local_1e0.
    super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
    .bits = (TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
             )(local_770->
              super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
              ).bits;
    SVar339 = SampleLd((VolPathIntegrator *)local_7c0._16_8_,(Interaction *)&local_1c8.__align,
                       (BSDF *)local_2e0,local_7f8,&local_1e0,&local_768,&local_798);
    auVar266._0_8_ = SVar339.values.values._8_8_;
    auVar266._8_56_ = auVar225;
    auVar214._0_8_ = SVar339.values.values._0_8_;
    auVar214._8_56_ = auVar269;
    auVar156 = *(undefined1 (*) [16])(pSVar124->pdf).values;
    auVar179 = vmovlhps_avx(auVar214._0_16_,auVar266._0_16_);
    uVar127 = vcmpps_avx512vl(auVar156,_DAT_0054e010,4);
    auVar156 = vdivps_avx512vl(auVar179,auVar156);
    fVar138 = (float)((uint)((byte)uVar127 & 1) * auVar156._0_4_);
    fVar293 = (float)((uint)((byte)(uVar127 >> 1) & 1) * auVar156._4_4_);
    in_ZmmResult._4_4_ = fVar293;
    in_ZmmResult._0_4_ = fVar138;
    fVar270 = (float)((uint)((byte)(uVar127 >> 2) & 1) * auVar156._8_4_);
    in_ZmmResult._8_4_ = fVar270;
    fVar169 = (float)((uint)((byte)(uVar127 >> 3) & 1) * auVar156._12_4_);
    in_ZmmResult._12_4_ = fVar169;
    local_728.values.values[1] = fVar293 + local_728.values.values[1];
    local_728.values.values[0] = fVar138 + local_728.values.values[0];
    local_728.values.values[2] = fVar270 + local_728.values.values[2];
    local_728.values.values[3] = fVar169 + local_728.values.values[3];
  }
  auVar333 = local_1c8._0_64_;
  local_518._16_4_ = local_1c8._16_4_;
  local_518._20_4_ = local_1c8._20_4_;
  local_518._44_4_ = *(undefined4 *)(local_1f8 + 8);
  local_518._8_4_ = local_1c8._8_4_;
  local_518._12_4_ = local_1c8._12_4_;
  local_518._32_4_ = local_1c8._48_4_;
  local_518._24_4_ = local_1c8._40_4_;
  local_518._28_4_ = local_1c8._44_4_;
  local_518._36_4_ = (undefined4)*(undefined8 *)local_1f8;
  local_518._40_4_ = (undefined4)((ulong)*(undefined8 *)local_1f8 >> 0x20);
  local_5b8._0_8_ = local_1c8.__align;
  local_5b8._8_4_ = local_1c8._8_4_;
  local_5b8._12_4_ = local_1c8._12_4_;
  IStack_598.high = (Float)local_518._36_4_;
  IStack_598.low = (Float)local_1c8._48_4_;
  local_5b8._16_4_ = local_1c8._16_4_;
  local_5b8._20_4_ = local_1c8._20_4_;
  local_5b8._24_4_ = local_1c8._40_4_;
  local_5b8._28_4_ = local_1c8._44_4_;
  auStack_590._4_4_ = local_518._44_4_;
  auStack_590._0_4_ = local_518._40_4_;
  uVar7 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
  uVar11 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
  local_808._4_4_ = uVar11;
  local_808._0_4_ = uVar7;
  uVar127 = (pSVar144->
            super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
            ).bits;
  uStack_800 = 0;
  local_518._0_4_ = (undefined4)uVar127;
  local_518._4_4_ = (undefined4)(uVar127 >> 0x20);
  _local_668 = ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
  local_1c8._0_64_ = auVar333;
  FVar168 = DispatchSplit<9>::operator()((DispatchSplit<9> *)&local_638,local_518,uVar127 >> 0x30);
  local_7c0._24_4_ = FVar168;
  uVar127 = (pSVar144->
            super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
            ).bits;
  uVar88 = (ushort)(uVar127 >> 0x30);
  uVar126 = (uint)uVar88;
  if (uVar127 < 0x5000000000000) {
    if (uVar127 < 0x3000000000000) {
      if (uVar126 == 2) {
        TVar171 = (Tuple2<pbrt::Point2,_float>)
                  StratifiedSampler::Get2D((StratifiedSampler *)(uVar127 & 0xffffffffffff));
      }
      else {
        TVar171 = (Tuple2<pbrt::Point2,_float>)
                  RandomSampler::Get2D((RandomSampler *)(uVar127 & 0xffffffffffff));
      }
    }
    else {
      pHVar146 = (HaltonSampler *)(uVar127 & 0xffffffffffff);
      if ((uVar126 & 6) == 2) {
        iVar149 = pHVar146->dimension;
        if (0x3e6 < pHVar146->dimension) {
          iVar149 = 2;
        }
        pHVar146->dimension = iVar149 + 2;
        local_7d8._0_4_ = HaltonSampler::SampleDimension(pHVar146,iVar149);
        local_7d8._4_4_ = extraout_XMM0_Db_05;
        local_7d8._8_4_ = extraout_XMM0_Dc_05;
        local_7d8._12_4_ = extraout_XMM0_Dd_05;
        auVar215._0_4_ = HaltonSampler::SampleDimension(pHVar146,iVar149 + 1);
        auVar215._4_60_ = extraout_var_01;
        auVar156 = auVar215._0_16_;
LAB_003ebb2d:
        auVar156 = vinsertps_avx(local_7d8,auVar156,0x10);
        TVar171 = auVar156._0_8_;
      }
      else {
        TVar171 = (Tuple2<pbrt::Point2,_float>)
                  PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar146);
      }
    }
  }
  else {
    uVar130 = uVar88 - 4;
    if (uVar130 < 3) {
      if (uVar130 == 2) {
        TVar171 = (Tuple2<pbrt::Point2,_float>)
                  ZSobolSampler::Get2D((ZSobolSampler *)(uVar127 & 0xffffffffffff));
      }
      else {
        TVar171 = (Tuple2<pbrt::Point2,_float>)
                  SobolSampler::Get2D((SobolSampler *)(uVar127 & 0xffffffffffff));
      }
    }
    else if (uVar126 - 6 < 2) {
      TVar171 = (Tuple2<pbrt::Point2,_float>)
                PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar127 & 0xffffffffffff));
    }
    else {
      pDVar147 = (DebugMLTSampler *)(uVar127 & 0xffffffffffff);
      if (uVar126 - 6 != 2) {
        local_7d8._0_4_ = DebugMLTSampler::Get1D(pDVar147);
        local_7d8._4_4_ = extraout_XMM0_Db_06;
        local_7d8._8_4_ = extraout_XMM0_Dc_06;
        local_7d8._12_4_ = extraout_XMM0_Dd_06;
        auVar216._0_4_ = DebugMLTSampler::Get1D(pDVar147);
        auVar216._4_60_ = extraout_var_02;
        auVar156 = auVar216._0_16_;
        goto LAB_003ebb2d;
      }
      TVar171 = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)pDVar147);
    }
  }
  auVar250 = _local_668;
  auVar195._0_8_ = local_808 ^ 0x8000000080000000;
  auVar195._8_4_ = local_808._8_4_ ^ 0x80000000;
  auVar195._12_4_ = local_808._12_4_ ^ 0x80000000;
  woRender.super_Tuple3<pbrt::Vector3,_float>.z = -local_668._0_4_;
  uVar127 = local_668;
  fStack_660 = (float)(local_668._8_4_ ^ 0x80000000);
  local_668 = (undefined1  [8])(uVar127 ^ 0x8000000080000000);
  fStack_65c = (float)(auVar250._12_4_ ^ 0x80000000);
  auStack_658 = auVar250._16_16_;
  woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar195._0_8_;
  woRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(auVar195._0_8_ >> 0x20);
  _local_808 = auVar195;
  BSDF::Sample_f((optional<pbrt::BSDFSample> *)&local_548,(BSDF *)local_2e0,woRender,
                 (Float)local_7c0._24_4_,(Point2f)TVar171,Radiance,All);
  SVar339.values.values = local_798.values.values;
  auVar156 = _local_808;
  auVar285 = in_ZMM13._0_16_;
  auVar154 = in_ZMM12._0_16_;
  auVar151 = in_ZMM11._0_16_;
  auVar179 = in_ZMM7._0_16_;
  uVar126 = 3;
  lambda = local_7f8;
  if (local_51c == false) goto LAB_003ec130;
  auVar184 = ZEXT416((uint)local_548._24_4_);
  auVar157 = vfmadd132ss_fma(ZEXT416((uint)local_1c8._132_4_),
                             ZEXT416((uint)((float)local_1c8._136_4_ * (float)local_548._24_4_)),
                             ZEXT416((uint)local_548._20_4_));
  auVar153 = vfmsub213ss_fma(ZEXT416((uint)local_1c8._136_4_),ZEXT416((uint)local_548._24_4_),
                             ZEXT416((uint)((float)local_1c8._136_4_ * (float)local_548._24_4_)));
  auVar157 = vfmadd231ss_fma(ZEXT416((uint)(auVar157._0_4_ + auVar153._0_4_)),
                             ZEXT416((uint)local_1c8._128_4_),ZEXT416((uint)local_548._16_4_));
  uVar170 = auVar157._0_4_;
  auVar196._4_4_ = uVar170;
  auVar196._0_4_ = uVar170;
  auVar196._8_4_ = uVar170;
  auVar196._12_4_ = uVar170;
  auVar32._8_4_ = 0x7fffffff;
  auVar32._0_8_ = 0x7fffffff7fffffff;
  auVar32._12_4_ = 0x7fffffff;
  auVar157 = vandps_avx512vl(auVar196,auVar32);
  local_6d8.values.values[0] = local_798.values.values[0];
  local_6d8.values.values[1] = local_798.values.values[1];
  local_6d8.values.values[2] = local_798.values.values[2];
  local_6d8.values.values[3] = local_798.values.values[3];
  local_768.values.values[1] = auVar157._4_4_ * (float)local_548._4_4_ * local_768.values.values[1];
  local_768.values.values[0] =
       auVar157._0_4_ * (float)local_548.__align * local_768.values.values[0];
  local_768.values.values[2] = auVar157._8_4_ * (float)local_548._8_4_ * local_768.values.values[2];
  local_768.values.values[3] =
       auVar157._12_4_ * (float)local_548._12_4_ * local_768.values.values[3];
  uVar170 = local_548._28_4_;
  local_798.values.values = SVar339.values.values;
  if (local_548.__data[0x28] == '\x01') {
    wiRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_548._20_4_;
    wiRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_548._16_4_;
    woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_668._0_4_;
    woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_808._0_4_;
    woRender_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_808._4_4_;
    wiRender.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_548._24_4_;
    auVar184 = ZEXT416((uint)local_548._24_4_);
    _local_808 = auVar156;
    uVar170 = BSDF::PDF((BSDF *)local_2e0,woRender_00,wiRender,Radiance,All);
    if (local_51c == false) {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
    }
    fVar169 = (float)uVar170 / (float)local_548._28_4_;
    local_768.values.values[1] = fVar169 * local_768.values.values[1];
    local_768.values.values[0] = fVar169 * local_768.values.values[0];
    local_768.values.values[2] = fVar169 * local_768.values.values[2];
    local_768.values.values[3] = fVar169 * local_768.values.values[3];
  }
  local_798.values.values[1] = (float)uVar170 * local_798.values.values[1];
  local_798.values.values[0] = (float)uVar170 * local_798.values.values[0];
  local_798.values.values[2] = (float)uVar170 * local_798.values.values[2];
  local_798.values.values[3] = (float)uVar170 * local_798.values.values[3];
  Rescale(&local_768,&local_798,&local_6d8);
  if (local_51c == false) {
    LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
  }
  wi.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_548._20_4_;
  wi.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_548._16_4_;
  wi.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_548._24_4_;
  local_80b = (bool)(local_80b | (local_548._32_4_ & 0x10) == 0);
  bVar148 = (local_548._32_4_ & 2) == 0;
  local_80c = SUB41((local_548._32_4_ & 0x10) >> 4,0);
  local_808._0_4_ = local_548._36_4_;
  SurfaceInteraction::SpawnRay
            ((RayDifferential *)local_518,(SurfaceInteraction *)&local_1c8.__align,ray,
             (BSDF *)local_2e0,wi,local_548._32_4_,(Float)local_548._36_4_);
  (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_518._12_4_;
  (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_518._16_4_;
  *(ulong *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
       CONCAT44(local_518._24_4_,local_518._20_4_);
  (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)local_518._0_4_;
  (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y = (float)local_518._4_4_;
  *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
       CONCAT44(local_518._12_4_,local_518._8_4_);
  (ray->super_Ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = CONCAT44(local_518._36_4_,local_518._32_4_);
  *(ulong *)(local_278 + 0x14) = CONCAT44(local_518._64_4_,local_518._60_4_);
  (((Vector3f *)(local_278 + 0x1c))->super_Tuple3<pbrt::Vector3,_float>).x = (float)local_518._68_4_
  ;
  (((Vector3f *)(local_278 + 0x1c))->super_Tuple3<pbrt::Vector3,_float>).y = (float)local_518._72_4_
  ;
  *(ulong *)(local_278 + 0x24) = CONCAT44(local_518._80_4_,local_518._76_4_);
  *(ulong *)(local_278 + 0x2c) = CONCAT44(local_518._88_4_,local_518._84_4_);
  *(ulong *)local_278 = CONCAT44(local_518._44_4_,local_518._40_4_);
  *(ulong *)(local_278 + 8) = CONCAT44(local_518._52_4_,local_518._48_4_);
  (((Point3f *)(local_278 + 0x10))->super_Tuple3<pbrt::Point3,_float>).x = (float)local_518._56_4_;
  (((Point3f *)(local_278 + 0x10))->super_Tuple3<pbrt::Point3,_float>).y = (float)local_518._60_4_;
  *(ulong *)(local_278 + 0x18) = CONCAT44(local_518._68_4_,local_518._64_4_);
  local_1e8 = (undefined1  [8])
              (((CameraHandle *)(local_7c0._16_8_ + 0x40))->
              super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
              ).bits;
  auVar333 = ZEXT1664(auVar184);
  in_ZMM7 = ZEXT1664(auVar179);
  in_ZMM11 = ZEXT1664(auVar151);
  in_ZMM12 = ZEXT1664(auVar154);
  in_ZMM13 = ZEXT1664(auVar285);
  SurfaceInteraction::GetBSSRDF
            ((SurfaceInteraction *)local_7c0,(RayDifferential *)&local_1c8.__align,
             (SampledWavelengths *)ray,(CameraHandle *)local_7f8,(ScratchBuffer *)local_1e8);
  pSVar144 = local_770;
  fVar169 = local_208._0_4_ * (float)local_808._0_4_ * (float)local_808._0_4_;
  auVar167._16_48_ = in_ZmmResult._16_48_;
  auVar167._0_16_ = ZEXT416((uint)fVar169);
  in_ZmmResult._4_60_ = auVar167._4_60_;
  in_ZmmResult._0_4_ = (float)((uint)bVar148 * (int)local_208._0_4_ + (uint)!bVar148 * (int)fVar169)
  ;
  local_208 = in_ZmmResult._0_16_;
  if ((CONCAT44(local_7c0._4_4_,local_7c0._0_4_) & 0xffffffffffff) != 0) {
    if (local_51c == false) {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
    }
    if ((local_548._32_4_ & 2) != 0) {
      uVar127 = (local_770->
                super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                ).bits;
      local_518._0_4_ = (undefined4)uVar127;
      local_518._4_4_ = (undefined4)(uVar127 >> 0x20);
      FVar168 = DispatchSplit<9>::operator()
                          ((DispatchSplit<9> *)&local_638,local_518,uVar127 >> 0x30);
      local_808._0_4_ = FVar168;
      uVar127 = (pSVar144->
                super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                ).bits;
      uVar88 = (ushort)(uVar127 >> 0x30);
      uVar126 = (uint)uVar88;
      if (uVar127 < 0x5000000000000) {
        if (uVar127 < 0x3000000000000) {
          if (uVar126 == 2) {
            TVar171 = (Tuple2<pbrt::Point2,_float>)
                      StratifiedSampler::Get2D((StratifiedSampler *)(uVar127 & 0xffffffffffff));
          }
          else {
            TVar171 = (Tuple2<pbrt::Point2,_float>)
                      RandomSampler::Get2D((RandomSampler *)(uVar127 & 0xffffffffffff));
          }
        }
        else {
          pHVar146 = (HaltonSampler *)(uVar127 & 0xffffffffffff);
          if ((uVar126 & 6) == 2) {
            iVar149 = pHVar146->dimension;
            if (0x3e6 < pHVar146->dimension) {
              iVar149 = 2;
            }
            pHVar146->dimension = iVar149 + 2;
            FVar168 = HaltonSampler::SampleDimension(pHVar146,iVar149);
            auVar250 = _local_668;
            local_668._4_4_ = extraout_XMM0_Db_07;
            local_668._0_4_ = FVar168;
            fStack_660 = (float)extraout_XMM0_Dc_07;
            auStack_658 = auVar250._16_16_;
            fStack_65c = (float)extraout_XMM0_Dd_07;
            auVar217._0_4_ = HaltonSampler::SampleDimension(pHVar146,iVar149 + 1);
            auVar217._4_60_ = extraout_var_03;
            auVar156 = auVar217._0_16_;
LAB_003ec37d:
            auVar156 = vinsertps_avx(_local_668,auVar156,0x10);
            TVar171 = auVar156._0_8_;
          }
          else {
            TVar171 = (Tuple2<pbrt::Point2,_float>)
                      PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar146);
          }
        }
      }
      else {
        uVar130 = uVar88 - 4;
        if (uVar130 < 3) {
          if (uVar130 == 2) {
            TVar171 = (Tuple2<pbrt::Point2,_float>)
                      ZSobolSampler::Get2D((ZSobolSampler *)(uVar127 & 0xffffffffffff));
          }
          else {
            TVar171 = (Tuple2<pbrt::Point2,_float>)
                      SobolSampler::Get2D((SobolSampler *)(uVar127 & 0xffffffffffff));
          }
        }
        else if (uVar126 - 6 < 2) {
          TVar171 = (Tuple2<pbrt::Point2,_float>)
                    PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar127 & 0xffffffffffff));
        }
        else {
          pDVar147 = (DebugMLTSampler *)(uVar127 & 0xffffffffffff);
          if (uVar126 - 6 != 2) {
            FVar168 = DebugMLTSampler::Get1D(pDVar147);
            auVar250 = _local_668;
            local_668._4_4_ = extraout_XMM0_Db_08;
            local_668._0_4_ = FVar168;
            fStack_660 = (float)extraout_XMM0_Dc_08;
            auStack_658 = auVar250._16_16_;
            fStack_65c = (float)extraout_XMM0_Dd_08;
            auVar218._0_4_ = DebugMLTSampler::Get1D(pDVar147);
            auVar218._4_60_ = extraout_var_04;
            auVar156 = auVar218._0_16_;
            goto LAB_003ec37d;
          }
          TVar171 = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)pDVar147);
        }
      }
      TabulatedBSSRDF::SampleSp
                ((optional<pbrt::BSSRDFProbeSegment> *)local_718,
                 (TabulatedBSSRDF *)(CONCAT44(local_7c0._4_4_,local_7c0._0_4_) & 0xffffffffffff),
                 (Float)local_808._0_4_,(Point2f)TVar171);
      uVar126 = 3;
      if (local_700 != false) {
        uVar127 = (local_770->
                  super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                  ).bits;
        local_518._0_4_ = (undefined4)uVar127;
        local_518._4_4_ = (undefined4)(uVar127 >> 0x20);
        FVar168 = DispatchSplit<9>::operator()
                            ((DispatchSplit<9> *)&local_638,local_518,uVar127 >> 0x30);
        auVar335 = _local_338;
        in_ZmmResult = ZEXT1664(ZEXT816(0) << 0x40);
        local_638.rng = (RNG *)0x0;
        local_638.sampler = (SamplerHandle *)0x0;
        local_638.ray = (RayDifferential *)0x0;
        local_638.prevIntrContext = (LightSampleContext *)0x0;
        local_638.T_hat = (SampledSpectrum *)0x0;
        local_638.terminated = (bool *)0x0;
        local_638.uniPathPDF = (SampledSpectrum *)0x0;
        local_638.lightPathPDF = (SampledSpectrum *)0x0;
        local_638.depth = (int *)0x0;
        local_638.this = (VolPathIntegrator *)0x0;
        local_638.L = (SampledSpectrum *)0x0;
        local_638.lambda = (SampledWavelengths *)0x0;
        if (local_700 == false) {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
        }
        auVar197._4_4_ = local_718._4_4_;
        auVar197._0_4_ = local_718._0_4_;
        auVar197._8_8_ = 0;
        auVar280._4_4_ = local_718._8_4_;
        auVar280._0_4_ = local_718._8_4_;
        auVar280._8_4_ = local_718._8_4_;
        auVar280._12_4_ = local_718._8_4_;
        uVar127 = (ulong)((uint)FVar168 >> 0x1f ^ (uint)FVar168) * 0x7fb5d329728ea185;
        uVar127 = (uVar127 >> 0x1b ^ uVar127) * -0x7e25210b43d22bb3;
        _local_338 = vshufps_avx(auVar197,auVar197,0x50);
        IVar8 = (Interval)vmovlps_avx(auVar280);
        IStack_328.low = IVar8.low;
        IStack_328.high = IVar8.high;
        FStack_320 = (ray->super_Ray).time;
        uStack_2fc = auVar335._60_4_;
        auStack_31c = ZEXT1232(ZEXT812(0)) << 0x20;
        local_2f8 = ZEXT816(0) << 0x20;
        _local_808 = ZEXT816(0) << 0x20;
        uVar131 = uVar127 >> 0x21 ^ uVar127;
        lVar140 = uVar131 * 2 + 1;
        uVar127 = (uVar127 >> 0x1f ^ uVar131) * 0x7fb5d329728ea185;
        uVar127 = (uVar127 >> 0x1b ^ uVar127) * -0x7e25210b43d22bb3;
        uVar127 = (uVar127 >> 0x21 ^ uVar127) * 0x5851f42d4c957f2d + lVar140 * 0x5851f42d4c957f2e;
        do {
          auVar333 = ZEXT1664(auVar333._0_16_);
          in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
          in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
          in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
          in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
          Interaction::SpawnRayTo
                    ((Ray *)local_408,(Interaction *)local_338,(Point3f *)(local_718 + 0xc));
          if (((float)local_408._12_4_ == 0.0) && ((float)local_408._16_4_ == 0.0)) {
            if (((float)local_408._20_4_ == 0.0) && (!NAN((float)local_408._20_4_)))
            goto LAB_003ebf82;
          }
          *(long *)(in_FS_OFFSET + -0x2b0) = *(long *)(in_FS_OFFSET + -0x2b0) + 1;
          if (((local_380->
               super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
               ).bits & 0xffffffffffff) == 0) goto LAB_003ebf82;
          PrimitiveHandle::Intersect
                    ((optional<pbrt::ShapeIntersection> *)local_518,local_380,(Ray *)local_408,1.0);
          if ((local_418 & 1U) == 0) goto LAB_003ebf82;
          local_338._4_4_ = local_518._4_4_;
          local_338._0_4_ = local_518._0_4_;
          afStack_330[0] = (float)local_518._8_4_;
          unique0x1000799e = local_518._12_4_;
          IStack_328.low = (Float)local_518._16_4_;
          IStack_328.high = (Float)local_518._20_4_;
          FStack_320 = (Float)local_518._24_4_;
          unique0x100079ae = local_518._28_4_;
          unique0x100079b2 = local_518._32_4_;
          unique0x100079b6 = local_518._36_4_;
          unique0x100079ba = local_518._40_4_;
          unique0x100079be = local_518._44_4_;
          unique0x100079c2 = local_518._48_4_;
          unique0x100079c6 = local_518._52_4_;
          unique0x100079ca = local_518._56_4_;
          uStack_2fc = local_518._60_4_;
          local_2f8._4_4_ = local_518._68_4_;
          local_2f8._0_4_ = local_518._64_4_;
          local_2f8._8_8_ = local_518._72_8_;
          in_ZmmResult = _local_338;
          if (auStack_480[5] == local_1c8._192_8_) {
            local_6c8._16_4_ = local_518._16_4_;
            local_6c8._20_4_ = local_518._20_4_;
            local_6c8._0_4_ = local_518._0_4_;
            local_6c8._4_4_ = local_518._4_4_;
            local_6c8._8_4_ = local_518._8_4_;
            local_6c8._12_4_ = local_518._12_4_;
            FStack_6a8 = (Float)local_518._48_4_;
            local_6c8._24_8_ = CONCAT44(local_518._44_4_,local_518._40_4_);
            FStack_69c = *(Float *)(local_390 + 1);
            fVar169 = (float)local_808._0_4_ + 1.0;
            _local_808 = ZEXT416((uint)fVar169);
            fStack_6a4 = (float)*local_390;
            FStack_6a0 = (Float)((ulong)*local_390 >> 0x20);
            fStack_690 = (float)local_518._88_4_;
            pSStack_698 = (SampledSpectrum *)CONCAT44(local_518._84_4_,local_518._80_4_);
            fStack_684 = (float)local_518._100_4_;
            fStack_68c = (float)local_518._92_4_;
            fStack_688 = (float)local_518._96_4_;
            fStack_678 = *(float *)(local_280 + 1);
            pSStack_680 = (SamplerHandle *)*local_280;
            fStack_66c = *(float *)(local_288 + 1);
            fStack_674 = (float)*local_288;
            fStack_670 = (float)((ulong)*local_288 >> 0x20);
            uVar126 = (uint)(uVar127 >> 0x2d) ^ (uint)(uVar127 >> 0x1b);
            bVar128 = (byte)(uVar127 >> 0x3b);
            auVar156 = vcvtusi2ss_avx512f(auVar333._0_16_,
                                          uVar126 >> bVar128 | uVar126 << 0x20 - bVar128);
            auVar156 = vminss_avx(ZEXT416((uint)(auVar156._0_4_ * 2.3283064e-10)),
                                  ZEXT416(0x3f7fffff));
            if (auVar156._0_4_ < 1.0 / fVar169) {
              local_638.rng = (RNG *)CONCAT44(local_518._100_4_,local_518._96_4_);
              local_638.ray = (RayDifferential *)CONCAT44(fStack_674,fStack_678);
              local_638.prevIntrContext = (LightSampleContext *)CONCAT44(fStack_66c,fStack_670);
              local_638.T_hat = (SampledSpectrum *)CONCAT44(local_518._4_4_,local_518._0_4_);
              auVar105._8_4_ = local_518._8_4_;
              auVar105._0_8_ = local_638.T_hat;
              auVar105._12_4_ = local_518._12_4_;
              auVar106._16_4_ = local_518._16_4_;
              auVar106._0_16_ = auVar105;
              auVar106._20_4_ = local_518._20_4_;
              auVar107._24_8_ = local_6c8._24_8_;
              auVar107._0_24_ = auVar106;
              auVar107._32_4_ = local_518._48_4_;
              auVar107._36_4_ = fStack_6a4;
              auVar108._40_4_ = FStack_6a0;
              auVar108._0_40_ = auVar107;
              auVar108._44_4_ = FStack_69c;
              in_ZmmResult._48_8_ = pSStack_698;
              in_ZmmResult._0_48_ = auVar108;
              in_ZmmResult._56_4_ = local_518._88_4_;
              in_ZmmResult._60_4_ = local_518._92_4_;
              local_638.terminated = auVar105._8_8_;
              local_638.uniPathPDF = auVar106._16_8_;
              local_638.depth = auVar107._32_8_;
              local_638.this = auVar108._40_8_;
              local_638.lambda = in_ZmmResult._56_8_;
              local_638.lightPathPDF = (SampledSpectrum *)local_6c8._24_8_;
              local_638.L = pSStack_698;
              local_638.sampler = pSStack_680;
            }
            uVar127 = uVar127 * 0x5851f42d4c957f2d + lVar140;
          }
          if (local_700 == false) {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
          }
        } while( true );
      }
      goto LAB_003ebf9c;
    }
  }
LAB_003ebfa5:
  lambda = local_7f8;
  if ((local_768.values.values[0] == 0.0) && (!NAN(local_768.values.values[0]))) {
    uVar127 = 0xffffffffffffffff;
    do {
      uVar126 = 3;
      if (uVar127 == 2) goto LAB_003ec130;
      fVar169 = local_768.values.values[uVar127 + 2];
      uVar127 = uVar127 + 1;
    } while ((fVar169 == 0.0) && (!NAN(fVar169)));
    if (2 < uVar127) goto LAB_003ec130;
  }
  lVar140 = 1;
  auVar198._0_4_ = (float)local_208._0_4_ * local_768.values.values[0];
  auVar198._4_4_ = (float)local_208._0_4_ * local_768.values.values[1];
  auVar198._8_4_ = (float)local_208._0_4_ * local_768.values.values[2];
  auVar198._12_4_ = (float)local_208._0_4_ * local_768.values.values[3];
  fVar169 = local_798.values.values[0];
  do {
    fVar169 = fVar169 + local_798.values.values[lVar140];
    lVar140 = lVar140 + 1;
  } while (lVar140 != 4);
  fVar169 = fVar169 * 0.25;
  lVar140 = 1;
  auVar248._4_4_ = fVar169;
  auVar248._0_4_ = fVar169;
  auVar248._8_4_ = fVar169;
  auVar248._12_4_ = fVar169;
  auVar156 = vdivps_avx(auVar198,auVar248);
  local_518._0_4_ = auVar156._0_4_;
  local_518._4_4_ = auVar156._4_4_;
  local_518._8_4_ = auVar156._8_4_;
  local_518._12_4_ = auVar156._12_4_;
  auVar179 = auVar156;
  do {
    lVar2 = lVar140 * 4;
    lVar140 = lVar140 + 1;
    auVar179 = vmaxss_avx(ZEXT416(*(uint *)(local_518 + lVar2)),auVar179);
  } while (lVar140 != 4);
  uVar126 = 0;
  if ((auVar179._0_4_ < 1.0) && (1 < local_7dc)) {
    lVar140 = 1;
    _local_808 = auVar156;
    do {
      lVar2 = lVar140 * 4;
      lVar140 = lVar140 + 1;
      _local_808 = vmaxss_avx(ZEXT416(*(uint *)(local_518 + lVar2)),_local_808);
    } while (lVar140 != 4);
    local_638.T_hat =
         (SampledSpectrum *)
         (local_770->
         super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
         ).bits;
    in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
    in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
    in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
    in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
    FVar168 = DispatchSplit<9>::operator()
                        ((DispatchSplit<9> *)local_6c8,&local_638,(ulong)local_638.T_hat >> 0x30);
    uVar126 = 3;
    auVar156 = vmaxss_avx(ZEXT416((uint)(1.0 - (float)local_808._0_4_)),ZEXT416(0));
    lambda = local_7f8;
    if (auVar156._0_4_ <= FVar168) {
      uVar126 = 0;
      fVar169 = 1.0 - auVar156._0_4_;
      local_798.values.values[0] = fVar169 * local_798.values.values[0];
      local_798.values.values[1] = fVar169 * local_798.values.values[1];
      local_798.values.values[2] = fVar169 * local_798.values.values[2];
      local_798.values.values[3] = fVar169 * local_798.values.values[3];
      local_6d8.values.values[1] = fVar169 * local_6d8.values.values[1];
      local_6d8.values.values[0] = fVar169 * local_6d8.values.values[0];
      local_6d8.values.values[3] = fVar169 * local_6d8.values.values[3];
      local_6d8.values.values[2] = fVar169 * local_6d8.values.values[2];
    }
  }
LAB_003ec130:
  if ((uVar126 & 1) != 0) {
    return (array<float,_4>)(array<float,_4>)local_728;
  }
  goto LAB_003e77c8;
LAB_003ebf82:
  uVar126 = 3;
  if (0.0 < (float)local_808._0_4_) {
    in_ZmmResult._8_8_ = local_638.terminated;
    in_ZmmResult._0_8_ = local_638.T_hat;
    in_ZmmResult._16_8_ = local_638.uniPathPDF;
    in_ZmmResult._24_8_ = local_638.lightPathPDF;
    in_ZmmResult._32_8_ = local_638.depth;
    in_ZmmResult._40_8_ = local_638.this;
    in_ZmmResult._48_8_ = local_638.L;
    in_ZmmResult._56_8_ = local_638.lambda;
    uVar127 = CONCAT44(local_7c0._4_4_,local_7c0._0_4_);
    fStack_688 = SUB84(local_638.rng,0);
    fStack_684 = (float)((ulong)local_638.rng >> 0x20);
    pSStack_680 = local_638.sampler;
    fStack_678 = SUB84(local_638.ray,0);
    fStack_674 = (float)((ulong)local_638.ray >> 0x20);
    fStack_670 = SUB84(local_638.prevIntrContext,0);
    fStack_66c = (float)((ulong)local_638.prevIntrContext >> 0x20);
    local_6c8._0_4_ = SUB84(local_638.T_hat,0);
    local_6c8._4_4_ = (undefined4)((ulong)local_638.T_hat >> 0x20);
    local_6c8._8_4_ = SUB84(local_638.terminated,0);
    local_6c8._12_4_ = (undefined4)((ulong)local_638.terminated >> 0x20);
    local_6c8._16_4_ = SUB84(local_638.uniPathPDF,0);
    local_6c8._20_4_ = (undefined4)((ulong)local_638.uniPathPDF >> 0x20);
    local_6c8._24_8_ = local_638.lightPathPDF;
    FStack_6a8 = SUB84(local_638.depth,0);
    fStack_6a4 = (float)((ulong)local_638.depth >> 0x20);
    FStack_6a0 = SUB84(local_638.this,0);
    FStack_69c = (Float)((ulong)local_638.this >> 0x20);
    pSStack_698 = local_638.L;
    fStack_690 = SUB84(local_638.lambda,0);
    fStack_68c = (float)((ulong)local_638.lambda >> 0x20);
    in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
    in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
    in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
    in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
    bxdf = (NormalizedFresnelBxDF *)ScratchBuffer::Alloc(local_388,4,4);
    TabulatedBSSRDF::ProbeIntersectionToSample
              ((BSSRDFSample *)local_408,(TabulatedBSSRDF *)(uVar127 & 0xffffffffffff),
               (SubsurfaceInteraction *)local_6c8,bxdf);
    puVar125 = local_280;
    puVar143 = local_390;
    auVar154 = in_ZMM13._0_16_;
    auVar151 = in_ZMM12._0_16_;
    auVar179 = in_ZMM11._0_16_;
    auVar156 = in_ZMM7._0_16_;
    bVar148 = true;
    if (((float)local_408._0_4_ == 0.0) && (!NAN((float)local_408._0_4_))) {
      uVar127 = 0;
      while (uVar131 = uVar127, uVar131 != 3) {
        if ((*(float *)(local_408 + uVar131 * 4 + 4) != 0.0) ||
           (uVar127 = uVar131 + 1, NAN(*(float *)(local_408 + uVar131 * 4 + 4)))) break;
      }
      bVar148 = uVar131 < 3;
    }
    uVar126 = 3;
    if (bVar148) {
      if (((float)local_408._16_4_ != 0.0) || (NAN((float)local_408._16_4_))) {
        auVar199._4_4_ = local_408._16_4_;
        auVar199._0_4_ = local_408._16_4_;
        auVar199._8_4_ = local_408._16_4_;
        auVar199._12_4_ = local_408._16_4_;
        local_80b = true;
        auVar249._0_4_ = (float)local_808._0_4_ * (float)local_408._0_4_;
        auVar249._4_4_ = (float)local_808._0_4_ * (float)local_408._4_4_;
        auVar249._8_4_ = (float)local_808._0_4_ * (float)local_408._8_4_;
        auVar249._12_4_ = (float)local_808._0_4_ * (float)local_408._12_4_;
        auVar285 = vdivps_avx(auVar249,auVar199);
        local_768.values.values[1] = auVar285._4_4_ * local_768.values.values[1];
        local_768.values.values[0] = auVar285._0_4_ * local_768.values.values[0];
        local_768.values.values[2] = auVar285._8_4_ * local_768.values.values[2];
        local_768.values.values[3] = auVar285._12_4_ * local_768.values.values[3];
        local_498._0_4_ = 0.0;
        local_518._64_4_ = (undefined4)local_498;
        in_ZmmResult._16_48_ = (undefined1  [48])0x0;
        auStack_480[5] = 0;
        auStack_480[6] = 0;
        auStack_480[7] = 0;
        auStack_480[8] = 0;
        auStack_480[9] = 0;
        auStack_480[10] = 0;
        auStack_480[0xb] = 0;
        local_498._4_4_ = 0.0;
        local_518._68_4_ = local_498._4_4_;
        uStack_490 = 0.0;
        local_518._72_4_ = uStack_490;
        _uStack_48c = (undefined1  [12])0x0;
        auStack_480._0_16_ = (undefined1  [16])0x0;
        auStack_480._16_16_ = (undefined1  [16])0x0;
        local_518._104_16_ = auStack_480._16_16_;
        auStack_480[4]._0_4_ = 0.0;
        auStack_480[4]._4_4_ = 0.0;
        local_518._120_8_ = auStack_480[4];
        local_518._76_4_ = 0.0;
        local_518._56_4_ = 0.0;
        local_518._24_4_ = 0.0;
        local_518._52_4_ = 0.0;
        local_518._16_4_ = local_6c8._16_4_;
        local_518._20_4_ = local_6c8._20_4_;
        local_518._0_4_ = local_6c8._0_4_;
        local_518._4_4_ = local_6c8._4_4_;
        local_518._8_4_ = local_6c8._8_4_;
        local_518._12_4_ = local_6c8._12_4_;
        local_518._40_4_ = (undefined4)local_6c8._24_8_;
        local_518._44_4_ = SUB84(local_6c8._24_8_,4);
        local_518._48_4_ = FStack_6a8;
        local_518._88_4_ = fStack_690;
        local_518._80_4_ = SUB84(pSStack_698,0);
        local_518._84_4_ = (undefined4)((ulong)pSStack_698 >> 0x20);
        local_518._100_4_ = fStack_684;
        local_518._92_4_ = fStack_68c;
        local_518._96_4_ = fStack_688;
        *local_390 = CONCAT44(FStack_6a0,fStack_6a4);
        *(Float *)(puVar143 + 1) = FStack_69c;
        puVar143 = local_288;
        *(float *)(puVar125 + 1) = fStack_678;
        *puVar125 = pSStack_680;
        *(float *)(puVar143 + 1) = fStack_66c;
        *puVar143 = CONCAT44(fStack_670,fStack_674);
        local_518._36_4_ = local_3b0;
        local_518._28_4_ = (undefined4)local_3b8;
        local_518._32_4_ = SUB84(local_3b8,4);
        if (*(bool *)(local_7c0._16_8_ + 0x60) == true) {
          *(long *)(in_FS_OFFSET + -0x2a0) = *(long *)(in_FS_OFFSET + -0x2a0) + 1;
          in_ZmmResult._16_48_ = (undefined1  [48])0x0;
          BSDF::Regularize((BSDF *)afStack_3f0);
        }
        else {
          *(long *)(in_FS_OFFSET + -0x298) = *(long *)(in_FS_OFFSET + -0x298) + 1;
        }
        pSVar144 = local_770;
        pSVar124 = local_7f8;
        local_5b8._4_4_ = local_518._4_4_;
        local_5b8._0_4_ = local_518._0_4_;
        local_268._16_4_ = local_518._16_4_;
        local_268._20_4_ = local_518._20_4_;
        local_268._8_4_ = local_518._8_4_;
        local_268._12_4_ = local_518._12_4_;
        local_268._24_4_ = local_518._40_4_;
        local_268._28_4_ = local_518._44_4_;
        fStack_23c = *(float *)(local_390 + 1);
        FStack_248 = (Float)local_518._48_4_;
        FStack_244 = (Float)*local_390;
        fStack_240 = (float)((ulong)*local_390 >> 0x20);
        local_5b8._12_4_ = local_518._12_4_;
        local_5b8._8_4_ = local_518._8_4_;
        IStack_598.high = FStack_244;
        IStack_598.low = (Float)local_518._48_4_;
        local_5b8._20_4_ = local_518._20_4_;
        local_5b8._16_4_ = local_518._16_4_;
        local_5b8._28_4_ = local_518._44_4_;
        local_5b8._24_4_ = local_518._40_4_;
        auStack_590._4_4_ = fStack_23c;
        auStack_590._0_4_ = fStack_240;
        local_1f0.
        super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
        .bits = (TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 )(local_770->
                  super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                  ).bits;
        auVar269 = ZEXT856((ulong)local_5b8._8_8_);
        auVar225 = ZEXT856((ulong)IStack_598);
        in_ZMM7 = ZEXT1664(auVar156);
        in_ZMM11 = ZEXT1664(auVar179);
        in_ZMM12 = ZEXT1664(auVar151);
        in_ZMM13 = ZEXT1664(auVar154);
        local_268._0_8_ = local_5b8._0_8_;
        SVar339 = SampleLd((VolPathIntegrator *)local_7c0._16_8_,(Interaction *)local_518,
                           (BSDF *)afStack_3f0,local_7f8,&local_1f0,&local_768,&local_798);
        auVar267._0_8_ = SVar339.values.values._8_8_;
        auVar267._8_56_ = auVar225;
        auVar219._0_8_ = SVar339.values.values._0_8_;
        auVar219._8_56_ = auVar269;
        auVar156 = *(undefined1 (*) [16])(pSVar124->pdf).values;
        auVar179 = vmovlhps_avx(auVar219._0_16_,auVar267._0_16_);
        uVar127 = vcmpps_avx512vl(auVar156,_DAT_0054e010,4);
        auVar156 = vdivps_avx512vl(auVar179,auVar156);
        fVar169 = (float)((uint)((byte)uVar127 & 1) * auVar156._0_4_);
        fVar270 = (float)((uint)((byte)(uVar127 >> 1) & 1) * auVar156._4_4_);
        in_ZmmResult._4_4_ = fVar270;
        in_ZmmResult._0_4_ = fVar169;
        fVar293 = (float)((uint)((byte)(uVar127 >> 2) & 1) * auVar156._8_4_);
        in_ZmmResult._8_4_ = fVar293;
        fVar138 = (float)((uint)((byte)(uVar127 >> 3) & 1) * auVar156._12_4_);
        in_ZmmResult._12_4_ = fVar138;
        local_728.values.values[0] = fVar169 + local_728.values.values[0];
        local_728.values.values[1] = fVar270 + local_728.values.values[1];
        local_728.values.values[2] = fVar293 + local_728.values.values[2];
        local_728.values.values[3] = fVar138 + local_728.values.values[3];
        local_268._0_8_ =
             (pSVar144->
             super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
             ).bits;
        FVar168 = DispatchSplit<9>::operator()
                            ((DispatchSplit<9> *)local_368,local_268,(ulong)local_268._0_8_ >> 0x30)
        ;
        auVar250 = _local_668;
        local_808._0_4_ = FVar168;
        local_668._4_4_ = local_518._32_4_;
        local_668._0_4_ = local_518._28_4_;
        uVar127 = (pSVar144->
                  super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                  ).bits;
        auStack_658 = auVar250._16_16_;
        _fStack_660 = 0;
        local_7c0._24_4_ = local_518._36_4_;
        uVar88 = (ushort)(uVar127 >> 0x30);
        uVar126 = (uint)uVar88;
        if (uVar127 < 0x5000000000000) {
          if (uVar127 < 0x3000000000000) {
            if (uVar126 == 2) {
              TVar171 = (Tuple2<pbrt::Point2,_float>)
                        StratifiedSampler::Get2D((StratifiedSampler *)(uVar127 & 0xffffffffffff));
            }
            else {
              TVar171 = (Tuple2<pbrt::Point2,_float>)
                        RandomSampler::Get2D((RandomSampler *)(uVar127 & 0xffffffffffff));
            }
          }
          else {
            pHVar146 = (HaltonSampler *)(uVar127 & 0xffffffffffff);
            if ((uVar126 & 6) == 2) {
              iVar149 = pHVar146->dimension;
              if (0x3e6 < pHVar146->dimension) {
                iVar149 = 2;
              }
              pHVar146->dimension = iVar149 + 2;
              local_7d8._0_4_ = HaltonSampler::SampleDimension(pHVar146,iVar149);
              local_7d8._4_4_ = extraout_XMM0_Db_09;
              local_7d8._8_4_ = extraout_XMM0_Dc_09;
              local_7d8._12_4_ = extraout_XMM0_Dd_09;
              auVar220._0_4_ = HaltonSampler::SampleDimension(pHVar146,iVar149 + 1);
              auVar220._4_60_ = extraout_var_05;
              auVar156 = auVar220._0_16_;
LAB_003ec7cc:
              auVar156 = vinsertps_avx(local_7d8,auVar156,0x10);
              TVar171 = auVar156._0_8_;
            }
            else {
              TVar171 = (Tuple2<pbrt::Point2,_float>)
                        PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar146);
            }
          }
        }
        else {
          uVar130 = uVar88 - 4;
          if (uVar130 < 3) {
            if (uVar130 == 2) {
              TVar171 = (Tuple2<pbrt::Point2,_float>)
                        ZSobolSampler::Get2D((ZSobolSampler *)(uVar127 & 0xffffffffffff));
            }
            else {
              TVar171 = (Tuple2<pbrt::Point2,_float>)
                        SobolSampler::Get2D((SobolSampler *)(uVar127 & 0xffffffffffff));
            }
          }
          else if (uVar126 - 6 < 2) {
            TVar171 = (Tuple2<pbrt::Point2,_float>)
                      PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar127 & 0xffffffffffff));
          }
          else {
            pDVar147 = (DebugMLTSampler *)(uVar127 & 0xffffffffffff);
            if (uVar126 - 6 != 2) {
              local_7d8._0_4_ = DebugMLTSampler::Get1D(pDVar147);
              local_7d8._4_4_ = extraout_XMM0_Db_10;
              local_7d8._8_4_ = extraout_XMM0_Dc_10;
              local_7d8._12_4_ = extraout_XMM0_Dd_10;
              auVar221._0_4_ = DebugMLTSampler::Get1D(pDVar147);
              auVar221._4_60_ = extraout_var_06;
              auVar156 = auVar221._0_16_;
              goto LAB_003ec7cc;
            }
            TVar171 = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)pDVar147);
          }
        }
        auVar250 = _local_668;
        woRender_01.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_7c0._24_4_;
        woRender_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_668._0_4_;
        woRender_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_668._4_4_;
        _local_668 = auVar250;
        BSDF::Sample_f((optional<pbrt::BSDFSample> *)local_368,(BSDF *)afStack_3f0,woRender_01,
                       (Float)local_808._0_4_,(Point2f)TVar171,Radiance,All);
        SVar339.values.values = local_798.values.values;
        uVar126 = 3;
        if (local_33c != false) {
          local_80c = (bool)((byte)local_368[0x20] >> 4 & 1);
          auVar156 = vfmadd132ss_fma(ZEXT416((uint)local_498._4_4_),
                                     ZEXT416((uint)((float)uStack_490 * (float)local_368._24_4_)),
                                     ZEXT416((uint)local_368._20_4_));
          auVar179 = vfmsub213ss_fma(ZEXT416((uint)local_368._24_4_),ZEXT416((uint)uStack_490),
                                     ZEXT416((uint)((float)uStack_490 * (float)local_368._24_4_)));
          auVar156 = vfmadd231ss_fma(ZEXT416((uint)(auVar156._0_4_ + auVar179._0_4_)),
                                     ZEXT416((uint)(undefined4)local_498),
                                     ZEXT416((uint)local_368._16_4_));
          uVar170 = auVar156._0_4_;
          auVar200._4_4_ = uVar170;
          auVar200._0_4_ = uVar170;
          auVar200._8_4_ = uVar170;
          auVar200._12_4_ = uVar170;
          auVar33._8_4_ = 0x7fffffff;
          auVar33._0_8_ = 0x7fffffff7fffffff;
          auVar33._12_4_ = 0x7fffffff;
          in_ZmmResult._0_16_ = vandps_avx512vl(auVar200,auVar33);
          local_768.values.values[1] =
               in_ZmmResult._4_4_ * (float)local_368._4_4_ * local_768.values.values[1];
          local_768.values.values[0] =
               in_ZmmResult._0_4_ * (float)local_368._0_4_ * local_768.values.values[0];
          local_768.values.values[2] =
               in_ZmmResult._8_4_ * (float)local_368._8_4_ * local_768.values.values[2];
          local_768.values.values[3] =
               in_ZmmResult._12_4_ * (float)local_368._12_4_ * local_768.values.values[3];
          local_6d8.values.values[0] = local_798.values.values[0];
          local_6d8.values.values[1] = local_798.values.values[1];
          local_6d8.values.values[2] = local_798.values.values[2];
          local_6d8.values.values[3] = local_798.values.values[3];
          local_798.values.values[0] = SVar339.values.values[0];
          local_798.values.values[1] = SVar339.values.values[1];
          local_798.values.values[2] = SVar339.values.values[2];
          local_798.values.values[3] = SVar339.values.values[3];
          local_798.values.values[1] = (float)local_368._28_4_ * local_798.values.values[1];
          local_798.values.values[0] = (float)local_368._28_4_ * local_798.values.values[0];
          local_798.values.values[2] = (float)local_368._28_4_ * local_798.values.values[2];
          local_798.values.values[3] = (float)local_368._28_4_ * local_798.values.values[3];
          Interaction::SpawnRay
                    ((RayDifferential *)local_268,(Interaction *)local_518,
                     (Vector3f *)(local_368 + 0x10));
          uVar126 = 0;
          (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_268._12_4_;
          (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_268._16_4_;
          *(ulong *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
               CONCAT44(local_268._24_4_,local_268._20_4_);
          (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)local_268._0_4_;
          (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y = (float)local_268._4_4_;
          *(undefined8 *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z = local_268._8_8_;
          (ray->super_Ray).medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits = CONCAT44(FStack_244,FStack_248);
          auVar121._4_4_ = fStack_228;
          auVar121._8_4_ = fStack_224;
          auVar121._0_4_ = fStack_22c;
          auVar121._12_20_ = auStack_220;
          *(undefined1 (*) [32])(local_278 + 0x14) = auVar121;
          *(ulong *)local_278 = CONCAT44(fStack_23c,fStack_240);
          *(undefined8 *)(local_278 + 8) = uStack_238;
          (((Point3f *)(local_278 + 0x10))->super_Tuple3<pbrt::Point3,_float>).x = fStack_230;
          (((Point3f *)(local_278 + 0x10))->super_Tuple3<pbrt::Point3,_float>).y = fStack_22c;
          *(undefined8 *)(local_278 + 0x18) = _fStack_228;
        }
      }
    }
  }
LAB_003ebf9c:
  lambda = local_7f8;
  if (uVar126 != 0) goto LAB_003ec130;
  goto LAB_003ebfa5;
}

Assistant:

SampledSpectrum VolPathIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                      SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                      VisibleSurface *visibleSurf) const {
    // Declare state variables for volumetric path
    SampledSpectrum L(0.f), T_hat(1.f), uniPathPDF(1.f), lightPathPDF(1.f);
    bool specularBounce = false, anyNonSpecularBounces = false;
    int depth = 0;

    LightSampleContext prevIntrContext;

    Float etaScale = 1;

    while (true) {
        // Sample segment of volumetric scattering path
        PBRT_DBG("%s\n",
                 StringPrintf("Path tracer depth %d, current L = %s, T_hat = %s\n", depth,
                              L, T_hat)
                     .c_str());
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        if (ray.medium) {
            // Sample the participating medium
            bool scattered = false, terminated = false;
            Float tMax = si ? si->tHit : Infinity;
            uint64_t hash0 = Hash(sampler.Get1D());
            uint64_t hash1 = Hash(sampler.Get1D());
            RNG rng(hash0, hash1);
            SampledSpectrum Tmaj = ray.medium.SampleTmaj(
                ray, tMax, sampler.Get1D(), rng, lambda,
                [&](const MediumSample &mediumSample) {
                    // Handle medium scattering event for ray
                    if (!T_hat) {
                        terminated = true;
                        return false;
                    }
                    ++volumeInteractions;
                    const MediumInteraction &intr = mediumSample.intr;
                    const SampledSpectrum &sigma_a = intr.sigma_a,
                                          &sigma_s = intr.sigma_s;
                    const SampledSpectrum &Tmaj = mediumSample.Tmaj;
                    // Rescale path throughput and PDFs if necessary
                    Rescale(T_hat, uniPathPDF, lightPathPDF);

                    // Add emission from medium scattering event
                    if (depth < maxDepth && intr.Le) {
                        // Compute $\hat{P}$ at new path vertex
                        SampledSpectrum P_hat = T_hat * Tmaj * sigma_a * intr.Le;

                        // Compute PDF for absorption event at path vertex
                        SampledSpectrum emitPDF = uniPathPDF * intr.sigma_maj * Tmaj;

                        // Update _L_ for medium emission
                        L += SafeDiv(P_hat, emitPDF.Average() * lambda.PDF());
                    }

                    // Compute medium event probabilities for interaction
                    Float pAbsorb = intr.sigma_a[0] / intr.sigma_maj[0];
                    Float pScatter = intr.sigma_s[0] / intr.sigma_maj[0];
                    Float pNull = std::max<Float>(0, 1 - pAbsorb - pScatter);

                    CHECK_GE(1 - pAbsorb - pScatter, -1e-6);
                    // Sample medium scattering event type and update path
                    Float um = rng.Uniform<Float>();
                    int mode = SampleDiscrete({pAbsorb, pScatter, pNull}, um);
                    if (mode == 0) {
                        // Handle absorption along ray path
                        terminated = true;
                        return false;

                    } else if (mode == 1) {
                        // Handle scattering along ray path
                        if (depth++ >= maxDepth) {
                            terminated = true;
                            return false;
                        }
                        T_hat *= Tmaj * sigma_s;
                        uniPathPDF *= Tmaj * sigma_s;
                        // Sample direct lighting at volume scattering event
                        L += SafeDiv(
                            SampleLd(intr, nullptr, lambda, sampler, T_hat, uniPathPDF),
                            lambda.PDF());

                        // Sample new direction at real scattering event
                        Point2f u = sampler.Get2D();
                        pstd::optional<PhaseFunctionSample> ps =
                            intr.phase.Sample_p(-ray.d, u);
                        if (!ps || ps->pdf == 0) {
                            terminated = true;
                            return false;
                        }
                        // Update ray path state for indirect volume scattering
                        T_hat *= ps->p;
                        lightPathPDF = uniPathPDF;
                        uniPathPDF *= ps->pdf;
                        prevIntrContext = LightSampleContext(intr);
                        scattered = true;
                        ray = intr.SpawnRay(ps->wi);
                        specularBounce = false;
                        anyNonSpecularBounces = true;

                        return false;

                    } else {
                        // Handle null scattering along ray path
                        SampledSpectrum sigma_n = intr.sigma_n();
                        T_hat *= Tmaj * sigma_n;
                        uniPathPDF *= Tmaj * sigma_n;
                        lightPathPDF *= Tmaj * intr.sigma_maj;
                        Rescale(T_hat, uniPathPDF, lightPathPDF);
                        return true;
                    }
                });
            // Handle terminated, scattered, and unscattered rays after medium sampling
            if (terminated)
                return L;
            if (scattered)
                continue;
            T_hat *= Tmaj;
            uniPathPDF *= Tmaj;
            lightPathPDF *= Tmaj;
        }
        // Handle surviving unscattered rays
        // Add emitted light at volume path vertex or from the environment
        if (!si) {
            // Accumulate contributions from infinite light sources
            for (const auto &light : infiniteLights) {
                if (SampledSpectrum Le = light.Le(ray, lambda); Le) {
                    if (depth == 0 || specularBounce)
                        L += SafeDiv(T_hat * Le, uniPathPDF.Average() * lambda.PDF());
                    else {
                        // Add infinite light contribution using both PDFs with MIS
                        Float lightPDF = lightSampler.PDF(prevIntrContext, light) *
                                         light.PDF_Li(prevIntrContext, ray.d,
                                                      LightSamplingMode::WithMIS);
                        lightPathPDF *= lightPDF;
                        L += SafeDiv(T_hat * Le, (uniPathPDF + lightPathPDF).Average() *
                                                     lambda.PDF());
                    }
                }
            }

            break;
        }
        SurfaceInteraction &isect = si->intr;
        if (SampledSpectrum Le = isect.Le(-ray.d, lambda); Le) {
            // Add contribution of emission from intersected surface
            if (depth == 0 || specularBounce)
                L += SafeDiv(T_hat * Le, uniPathPDF.Average() * lambda.PDF());
            else {
                // Add surface light contribution using both PDFs with MIS
                LightHandle areaLight(isect.areaLight);
                Float lightPDF =
                    lightSampler.PDF(prevIntrContext, areaLight) *
                    areaLight.PDF_Li(prevIntrContext, ray.d, LightSamplingMode::WithMIS);
                lightPathPDF *= lightPDF;
                L += SafeDiv(T_hat * Le,
                             (uniPathPDF + lightPathPDF).Average() * lambda.PDF());
            }
        }

        // Get BSDF and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        // Initialize _visibleSurf_ at first intersection
        if (depth == 0 && visibleSurf != nullptr) {
            // Estimate BSDF's albedo
            constexpr int nRhoSamples = 16;
            SampledSpectrum rho(0.f);
            for (int i = 0; i < nRhoSamples; ++i) {
                // Generate sample for hemispherical-directional reflectance
                Float uc = RadicalInverse(0, i + 1);
                Point2f u(RadicalInverse(1, i + 1), RadicalInverse(2, i + 1));

                // Estimate one term of $\rho_\roman{hd}$
                pstd::optional<BSDFSample> bs = bsdf.Sample_f(si->intr.wo, uc, u);
                if (bs)
                    rho += bs->f * AbsDot(bs->wi, si->intr.shading.n) / bs->pdf;
            }
            SampledSpectrum albedo = rho / nRhoSamples;

            *visibleSurf =
                VisibleSurface(si->intr, camera.GetCameraTransform(), albedo, lambda);
        }

        // Terminate path if maximum depth reached
        if (depth++ >= maxDepth)
            return L;

        ++surfaceInteractions;
        // Possibly regularize the BSDF
        if (regularize && anyNonSpecularBounces) {
            ++regularizedBSDFs;
            bsdf.Regularize();
        }

        // Sample illumination from lights to find attenuated path contribution
        if (bsdf.IsNonSpecular()) {
            L += SafeDiv(SampleLd(isect, &bsdf, lambda, sampler, T_hat, uniPathPDF),
                         lambda.PDF());
            DCHECK(IsInf(L.y(lambda)) == false);
        }
        prevIntrContext = LightSampleContext(isect);

        // Sample BSDF to get new volumetric path direction
        Vector3f wo = -ray.d;
        Float u = sampler.Get1D();
        pstd::optional<BSDFSample> bs = bsdf.Sample_f(wo, u, sampler.Get2D());
        if (!bs)
            break;
        // Update _T_hat_ and PDFs for BSDF scattering
        T_hat *= bs->f * AbsDot(bs->wi, isect.shading.n);
        lightPathPDF = uniPathPDF;
        if (bs->pdfIsProportional) {
            Float pdf = bsdf.PDF(wo, bs->wi);
            T_hat *= pdf / bs->pdf;
            uniPathPDF *= pdf;
        } else
            uniPathPDF *= bs->pdf;
        Rescale(T_hat, uniPathPDF, lightPathPDF);

        PBRT_DBG("%s\n", StringPrintf("Sampled BSDF, f = %s, pdf = %f -> T_hat = %s",
                                      bs->f, bs->pdf, T_hat)
                             .c_str());
        DCHECK(IsInf(T_hat.y(lambda)) == false);
        specularBounce = bs->IsSpecular();
        anyNonSpecularBounces |= !bs->IsSpecular();
        if (bs->IsTransmission())
            etaScale *= Sqr(bs->eta);
        ray = isect.SpawnRay(ray, bsdf, bs->wi, bs->flags, bs->eta);

        // Account for attenuated subsurface scattering, if applicable
        BSSRDFHandle bssrdf = isect.GetBSSRDF(ray, lambda, camera, scratchBuffer);
        if (bssrdf && bs->IsTransmission()) {
            // Sample BSSRDF probe segment to find exit point
            Float uc = sampler.Get1D();
            Point2f up = sampler.Get2D();
            pstd::optional<BSSRDFProbeSegment> probeSeg = bssrdf.SampleSp(uc, up);
            if (!probeSeg)
                break;

            // Sample random intersection along BSSRDF probe segment
            uint64_t seed = MixBits(FloatToBits(sampler.Get1D()));
            WeightedReservoirSampler<SubsurfaceInteraction> interactionSampler(seed);
            // Intersect BSSRDF sampling ray against the scene geometry
            Interaction base(probeSeg->p0, ray.time, (MediumHandle) nullptr);
            while (true) {
                Ray r = base.SpawnRayTo(probeSeg->p1);
                if (r.d == Vector3f(0, 0, 0))
                    break;
                pstd::optional<ShapeIntersection> si = Intersect(r, 1);
                if (!si)
                    break;
                base = si->intr;
                if (si->intr.material == isect.material)
                    interactionSampler.Add(SubsurfaceInteraction(si->intr), 1.f);
            }

            if (!interactionSampler.HasSample())
                break;

            // Convert probe intersection to _BSSRDFSample_ and update _beta_
            SubsurfaceInteraction ssi = interactionSampler.GetSample();
            BSSRDFSample bssrdfSample =
                bssrdf.ProbeIntersectionToSample(ssi, scratchBuffer);
            if (!bssrdfSample.Sp || bssrdfSample.pdf == 0)
                break;
            T_hat *= bssrdfSample.Sp * interactionSampler.WeightSum() / bssrdfSample.pdf;
            SurfaceInteraction pi = ssi;
            BSDF &Sw = bssrdfSample.Sw;
            pi.wo = bssrdfSample.wo;

            // Possibly regularize subsurface BSDF and update _prevIntrContext_
            anyNonSpecularBounces = true;
            if (regularize) {
                ++regularizedBSDFs;
                Sw.Regularize();
            } else
                ++totalBSDFs;
            prevIntrContext = LightSampleContext(pi);

            // Account for attenuated direct subsurface scattering
            L += SafeDiv(SampleLd(pi, &Sw, lambda, sampler, T_hat, uniPathPDF),
                         lambda.PDF());

            // Sample ray for indirect subsurface scattering
            Float u = sampler.Get1D();
            pstd::optional<BSDFSample> bs = Sw.Sample_f(pi.wo, u, sampler.Get2D());
            if (!bs)
                break;
            T_hat *= bs->f * AbsDot(bs->wi, pi.shading.n);
            lightPathPDF = uniPathPDF;
            uniPathPDF *= bs->pdf;
            // Don't increment depth this time...
            DCHECK(!IsInf(T_hat.y(lambda)));
            specularBounce = bs->IsSpecular();
            ray = RayDifferential(pi.SpawnRay(bs->wi));
        }

        // Possibly terminate volumetric path with Russian roulette
        if (!T_hat)
            break;
        SampledSpectrum rrBeta = T_hat * etaScale / uniPathPDF.Average();
        PBRT_DBG("%s\n",
                 StringPrintf("etaScale %f -> rrBeta %s", etaScale, rrBeta).c_str());
        if (rrBeta.MaxComponentValue() < 1 && depth > 1) {
            Float q = std::max<Float>(0, 1 - rrBeta.MaxComponentValue());
            if (sampler.Get1D() < q)
                break;
            uniPathPDF *= 1 - q;
            lightPathPDF *= 1 - q;
        }
    }
    return L;
}